

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx::CurveNiIntersectorK<8,8>::
     occluded_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  Geometry *pGVar9;
  long lVar10;
  RTCRayQueryContext *pRVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  ulong uVar79;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  byte bVar82;
  uint uVar83;
  uint uVar84;
  undefined1 (*pauVar85) [32];
  ulong uVar86;
  uint uVar87;
  int iVar88;
  ulong uVar89;
  long lVar90;
  bool bVar91;
  bool bVar92;
  float fVar93;
  float fVar123;
  float fVar125;
  __m128 a;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar124;
  float fVar126;
  float fVar128;
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar127;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar98 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar104 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar132;
  float fVar160;
  float fVar161;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar162;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [28];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar165 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar185;
  float fVar213;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [28];
  float fVar211;
  float fVar212;
  float fVar214;
  float fVar215;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar216;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar217;
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar224 [28];
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar223 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar240;
  float fVar241;
  float fVar257;
  float fVar259;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar263;
  float fVar265;
  float fVar267;
  undefined1 auVar248 [32];
  float fVar261;
  undefined1 auVar249 [32];
  float fVar258;
  float fVar260;
  float fVar262;
  float fVar264;
  float fVar266;
  float fVar268;
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar272 [16];
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar288;
  float fVar291;
  float fVar297;
  float fVar300;
  float fVar303;
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  float fVar294;
  undefined1 auVar279 [32];
  float fVar289;
  float fVar292;
  float fVar295;
  float fVar298;
  float fVar301;
  float fVar304;
  undefined1 auVar280 [32];
  float fVar290;
  float fVar293;
  float fVar296;
  float fVar299;
  float fVar302;
  float fVar305;
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [64];
  float fVar306;
  float fVar317;
  float fVar318;
  float fVar320;
  float fVar322;
  float fVar324;
  float fVar326;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  float fVar319;
  float fVar321;
  float fVar323;
  float fVar325;
  float fVar327;
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  float fVar337;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar347;
  float fVar349;
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  float fVar346;
  float fVar348;
  float fVar350;
  undefined1 auVar341 [32];
  float fVar351;
  undefined1 auVar352 [16];
  float fVar358;
  float fVar359;
  float fVar361;
  float fVar362;
  float fVar363;
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  float fVar360;
  float fVar364;
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  float fVar365;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  float fVar377;
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [64];
  undefined1 auVar379 [16];
  float fVar378;
  float fVar381;
  float fVar382;
  float fVar383;
  float fVar384;
  float fVar385;
  float fVar386;
  float fVar387;
  float in_register_0000151c;
  undefined1 auVar380 [32];
  float fVar388;
  float fVar389;
  float fVar396;
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar400;
  float fVar401;
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar402 [16];
  float fVar408;
  float fVar409;
  float in_register_0000159c;
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  float in_register_000015dc;
  undefined1 auVar414 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_ca4;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  undefined1 local_b10 [8];
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  undefined1 local_af0 [8];
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined1 auStack_ad0 [16];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 (*local_9d0) [16];
  undefined1 (*local_9c8) [16];
  uint *local_9c0;
  ulong local_9b8;
  RTCFilterFunctionNArguments local_9b0;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  undefined1 local_930 [8];
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [16];
  Primitive *local_890;
  ulong local_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [16];
  undefined1 auStack_730 [16];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_630 [16];
  RTCHitN local_620 [16];
  undefined1 auStack_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [32];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  uint local_540;
  uint uStack_53c;
  uint uStack_538;
  uint uStack_534;
  uint uStack_530;
  uint uStack_52c;
  uint uStack_528;
  uint uStack_524;
  uint local_520;
  uint uStack_51c;
  uint uStack_518;
  uint uStack_514;
  uint uStack_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar8 = prim[1];
  uVar89 = (ulong)(byte)PVar8;
  lVar90 = uVar89 * 5;
  auVar134 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar134 = vinsertps_avx(auVar134,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar18 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar18 = vinsertps_avx(auVar18,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar185 = *(float *)(prim + uVar89 * 0x19 + 0x12);
  auVar134 = vsubps_avx(auVar134,*(undefined1 (*) [16])(prim + uVar89 * 0x19 + 6));
  auVar104._0_4_ = fVar185 * auVar134._0_4_;
  auVar104._4_4_ = fVar185 * auVar134._4_4_;
  auVar104._8_4_ = fVar185 * auVar134._8_4_;
  auVar104._12_4_ = fVar185 * auVar134._12_4_;
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 4 + 6)));
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 4 + 10)));
  auVar242._0_4_ = fVar185 * auVar18._0_4_;
  auVar242._4_4_ = fVar185 * auVar18._4_4_;
  auVar242._8_4_ = fVar185 * auVar18._8_4_;
  auVar242._12_4_ = fVar185 * auVar18._12_4_;
  auVar105._16_16_ = auVar27;
  auVar105._0_16_ = auVar134;
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar90 + 6)));
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar90 + 10)));
  auVar173._16_16_ = auVar18;
  auVar173._0_16_ = auVar134;
  auVar157 = vcvtdq2ps_avx(auVar173);
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 6 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 6 + 10)));
  auVar203._16_16_ = auVar18;
  auVar203._0_16_ = auVar134;
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0xb + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0xb + 10)));
  auVar13 = vcvtdq2ps_avx(auVar203);
  auVar204._16_16_ = auVar18;
  auVar204._0_16_ = auVar134;
  auVar14 = vcvtdq2ps_avx(auVar204);
  uVar86 = (ulong)((uint)(byte)PVar8 * 0xc);
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + 10)));
  auVar275._16_16_ = auVar18;
  auVar275._0_16_ = auVar134;
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + uVar89 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar275);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + uVar89 + 10)));
  auVar307._16_16_ = auVar18;
  auVar307._0_16_ = auVar134;
  lVar10 = uVar89 * 9;
  uVar86 = (ulong)(uint)((int)lVar10 * 2);
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + 6)));
  auVar395 = vcvtdq2ps_avx(auVar307);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + 10)));
  auVar308._16_16_ = auVar18;
  auVar308._0_16_ = auVar134;
  auVar332 = vcvtdq2ps_avx(auVar308);
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + uVar89 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + uVar89 + 10)));
  auVar338._16_16_ = auVar18;
  auVar338._0_16_ = auVar134;
  uVar86 = (ulong)(uint)((int)lVar90 << 2);
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 + 10)));
  auVar16 = vcvtdq2ps_avx(auVar338);
  auVar353._16_16_ = auVar18;
  auVar353._0_16_ = auVar134;
  auVar17 = vcvtdq2ps_avx(auVar353);
  auVar134 = vshufps_avx(auVar242,auVar242,0);
  auVar18 = vshufps_avx(auVar242,auVar242,0x55);
  auVar27 = vshufps_avx(auVar242,auVar242,0xaa);
  fVar185 = auVar27._0_4_;
  fVar211 = auVar27._4_4_;
  fVar212 = auVar27._8_4_;
  fVar213 = auVar27._12_4_;
  fVar214 = auVar18._0_4_;
  fVar215 = auVar18._4_4_;
  fVar216 = auVar18._8_4_;
  fVar217 = auVar18._12_4_;
  fVar230 = auVar134._0_4_;
  fVar231 = auVar134._4_4_;
  fVar232 = auVar134._8_4_;
  fVar234 = auVar134._12_4_;
  auVar380._0_4_ = fVar230 * auVar105._0_4_ + fVar214 * auVar157._0_4_ + fVar185 * auVar13._0_4_;
  auVar380._4_4_ = fVar231 * auVar105._4_4_ + fVar215 * auVar157._4_4_ + fVar211 * auVar13._4_4_;
  auVar380._8_4_ = fVar232 * auVar105._8_4_ + fVar216 * auVar157._8_4_ + fVar212 * auVar13._8_4_;
  auVar380._12_4_ = fVar234 * auVar105._12_4_ + fVar217 * auVar157._12_4_ + fVar213 * auVar13._12_4_
  ;
  auVar380._16_4_ = fVar230 * auVar105._16_4_ + fVar214 * auVar157._16_4_ + fVar185 * auVar13._16_4_
  ;
  auVar380._20_4_ = fVar231 * auVar105._20_4_ + fVar215 * auVar157._20_4_ + fVar211 * auVar13._20_4_
  ;
  auVar380._24_4_ = fVar232 * auVar105._24_4_ + fVar216 * auVar157._24_4_ + fVar212 * auVar13._24_4_
  ;
  auVar380._28_4_ = fVar217 + in_register_000015dc + in_register_0000151c;
  auVar366._0_4_ = fVar230 * auVar14._0_4_ + fVar214 * auVar15._0_4_ + auVar395._0_4_ * fVar185;
  auVar366._4_4_ = fVar231 * auVar14._4_4_ + fVar215 * auVar15._4_4_ + auVar395._4_4_ * fVar211;
  auVar366._8_4_ = fVar232 * auVar14._8_4_ + fVar216 * auVar15._8_4_ + auVar395._8_4_ * fVar212;
  auVar366._12_4_ = fVar234 * auVar14._12_4_ + fVar217 * auVar15._12_4_ + auVar395._12_4_ * fVar213;
  auVar366._16_4_ = fVar230 * auVar14._16_4_ + fVar214 * auVar15._16_4_ + auVar395._16_4_ * fVar185;
  auVar366._20_4_ = fVar231 * auVar14._20_4_ + fVar215 * auVar15._20_4_ + auVar395._20_4_ * fVar211;
  auVar366._24_4_ = fVar232 * auVar14._24_4_ + fVar216 * auVar15._24_4_ + auVar395._24_4_ * fVar212;
  auVar366._28_4_ = fVar217 + in_register_000015dc + in_register_0000159c;
  auVar248._0_4_ = fVar230 * auVar332._0_4_ + fVar214 * auVar16._0_4_ + auVar17._0_4_ * fVar185;
  auVar248._4_4_ = fVar231 * auVar332._4_4_ + fVar215 * auVar16._4_4_ + auVar17._4_4_ * fVar211;
  auVar248._8_4_ = fVar232 * auVar332._8_4_ + fVar216 * auVar16._8_4_ + auVar17._8_4_ * fVar212;
  auVar248._12_4_ = fVar234 * auVar332._12_4_ + fVar217 * auVar16._12_4_ + auVar17._12_4_ * fVar213;
  auVar248._16_4_ = fVar230 * auVar332._16_4_ + fVar214 * auVar16._16_4_ + auVar17._16_4_ * fVar185;
  auVar248._20_4_ = fVar231 * auVar332._20_4_ + fVar215 * auVar16._20_4_ + auVar17._20_4_ * fVar211;
  auVar248._24_4_ = fVar232 * auVar332._24_4_ + fVar216 * auVar16._24_4_ + auVar17._24_4_ * fVar212;
  auVar248._28_4_ = fVar234 + fVar217 + fVar213;
  auVar134 = vshufps_avx(auVar104,auVar104,0);
  auVar18 = vshufps_avx(auVar104,auVar104,0x55);
  auVar27 = vshufps_avx(auVar104,auVar104,0xaa);
  fVar211 = auVar27._0_4_;
  fVar212 = auVar27._4_4_;
  fVar213 = auVar27._8_4_;
  fVar214 = auVar27._12_4_;
  fVar231 = auVar18._0_4_;
  fVar232 = auVar18._4_4_;
  fVar234 = auVar18._8_4_;
  fVar236 = auVar18._12_4_;
  fVar215 = auVar134._0_4_;
  fVar216 = auVar134._4_4_;
  fVar217 = auVar134._8_4_;
  fVar230 = auVar134._12_4_;
  fVar185 = auVar105._28_4_;
  auVar276._0_4_ = fVar215 * auVar105._0_4_ + fVar231 * auVar157._0_4_ + fVar211 * auVar13._0_4_;
  auVar276._4_4_ = fVar216 * auVar105._4_4_ + fVar232 * auVar157._4_4_ + fVar212 * auVar13._4_4_;
  auVar276._8_4_ = fVar217 * auVar105._8_4_ + fVar234 * auVar157._8_4_ + fVar213 * auVar13._8_4_;
  auVar276._12_4_ = fVar230 * auVar105._12_4_ + fVar236 * auVar157._12_4_ + fVar214 * auVar13._12_4_
  ;
  auVar276._16_4_ = fVar215 * auVar105._16_4_ + fVar231 * auVar157._16_4_ + fVar211 * auVar13._16_4_
  ;
  auVar276._20_4_ = fVar216 * auVar105._20_4_ + fVar232 * auVar157._20_4_ + fVar212 * auVar13._20_4_
  ;
  auVar276._24_4_ = fVar217 * auVar105._24_4_ + fVar234 * auVar157._24_4_ + fVar213 * auVar13._24_4_
  ;
  auVar276._28_4_ = fVar185 + auVar157._28_4_ + auVar13._28_4_;
  auVar111._0_4_ = fVar215 * auVar14._0_4_ + auVar395._0_4_ * fVar211 + fVar231 * auVar15._0_4_;
  auVar111._4_4_ = fVar216 * auVar14._4_4_ + auVar395._4_4_ * fVar212 + fVar232 * auVar15._4_4_;
  auVar111._8_4_ = fVar217 * auVar14._8_4_ + auVar395._8_4_ * fVar213 + fVar234 * auVar15._8_4_;
  auVar111._12_4_ = fVar230 * auVar14._12_4_ + auVar395._12_4_ * fVar214 + fVar236 * auVar15._12_4_;
  auVar111._16_4_ = fVar215 * auVar14._16_4_ + auVar395._16_4_ * fVar211 + fVar231 * auVar15._16_4_;
  auVar111._20_4_ = fVar216 * auVar14._20_4_ + auVar395._20_4_ * fVar212 + fVar232 * auVar15._20_4_;
  auVar111._24_4_ = fVar217 * auVar14._24_4_ + auVar395._24_4_ * fVar213 + fVar234 * auVar15._24_4_;
  auVar111._28_4_ = fVar185 + auVar395._28_4_ + auVar13._28_4_;
  auVar309._8_4_ = 0x7fffffff;
  auVar309._0_8_ = 0x7fffffff7fffffff;
  auVar309._12_4_ = 0x7fffffff;
  auVar309._16_4_ = 0x7fffffff;
  auVar309._20_4_ = 0x7fffffff;
  auVar309._24_4_ = 0x7fffffff;
  auVar309._28_4_ = 0x7fffffff;
  auVar339._8_4_ = 0x219392ef;
  auVar339._0_8_ = 0x219392ef219392ef;
  auVar339._12_4_ = 0x219392ef;
  auVar339._16_4_ = 0x219392ef;
  auVar339._20_4_ = 0x219392ef;
  auVar339._24_4_ = 0x219392ef;
  auVar339._28_4_ = 0x219392ef;
  auVar105 = vandps_avx(auVar380,auVar309);
  auVar105 = vcmpps_avx(auVar105,auVar339,1);
  auVar157 = vblendvps_avx(auVar380,auVar339,auVar105);
  auVar105 = vandps_avx(auVar366,auVar309);
  auVar105 = vcmpps_avx(auVar105,auVar339,1);
  auVar13 = vblendvps_avx(auVar366,auVar339,auVar105);
  auVar105 = vandps_avx(auVar248,auVar309);
  auVar105 = vcmpps_avx(auVar105,auVar339,1);
  auVar105 = vblendvps_avx(auVar248,auVar339,auVar105);
  auVar174._0_4_ = fVar231 * auVar16._0_4_ + auVar17._0_4_ * fVar211 + fVar215 * auVar332._0_4_;
  auVar174._4_4_ = fVar232 * auVar16._4_4_ + auVar17._4_4_ * fVar212 + fVar216 * auVar332._4_4_;
  auVar174._8_4_ = fVar234 * auVar16._8_4_ + auVar17._8_4_ * fVar213 + fVar217 * auVar332._8_4_;
  auVar174._12_4_ = fVar236 * auVar16._12_4_ + auVar17._12_4_ * fVar214 + fVar230 * auVar332._12_4_;
  auVar174._16_4_ = fVar231 * auVar16._16_4_ + auVar17._16_4_ * fVar211 + fVar215 * auVar332._16_4_;
  auVar174._20_4_ = fVar232 * auVar16._20_4_ + auVar17._20_4_ * fVar212 + fVar216 * auVar332._20_4_;
  auVar174._24_4_ = fVar234 * auVar16._24_4_ + auVar17._24_4_ * fVar213 + fVar217 * auVar332._24_4_;
  auVar174._28_4_ = auVar15._28_4_ + fVar214 + fVar185;
  auVar14 = vrcpps_avx(auVar157);
  fVar185 = auVar14._0_4_;
  fVar211 = auVar14._4_4_;
  auVar15._4_4_ = auVar157._4_4_ * fVar211;
  auVar15._0_4_ = auVar157._0_4_ * fVar185;
  fVar212 = auVar14._8_4_;
  auVar15._8_4_ = auVar157._8_4_ * fVar212;
  fVar213 = auVar14._12_4_;
  auVar15._12_4_ = auVar157._12_4_ * fVar213;
  fVar214 = auVar14._16_4_;
  auVar15._16_4_ = auVar157._16_4_ * fVar214;
  fVar215 = auVar14._20_4_;
  auVar15._20_4_ = auVar157._20_4_ * fVar215;
  fVar216 = auVar14._24_4_;
  auVar15._24_4_ = auVar157._24_4_ * fVar216;
  auVar15._28_4_ = auVar157._28_4_;
  auVar330._8_4_ = 0x3f800000;
  auVar330._0_8_ = 0x3f8000003f800000;
  auVar330._12_4_ = 0x3f800000;
  auVar330._16_4_ = 0x3f800000;
  auVar330._20_4_ = 0x3f800000;
  auVar330._24_4_ = 0x3f800000;
  auVar330._28_4_ = 0x3f800000;
  auVar15 = vsubps_avx(auVar330,auVar15);
  auVar157 = vrcpps_avx(auVar13);
  fVar185 = fVar185 + fVar185 * auVar15._0_4_;
  fVar211 = fVar211 + fVar211 * auVar15._4_4_;
  fVar212 = fVar212 + fVar212 * auVar15._8_4_;
  fVar213 = fVar213 + fVar213 * auVar15._12_4_;
  fVar214 = fVar214 + fVar214 * auVar15._16_4_;
  fVar215 = fVar215 + fVar215 * auVar15._20_4_;
  fVar216 = fVar216 + fVar216 * auVar15._24_4_;
  fVar240 = auVar157._0_4_;
  fVar257 = auVar157._4_4_;
  auVar395._4_4_ = fVar257 * auVar13._4_4_;
  auVar395._0_4_ = fVar240 * auVar13._0_4_;
  fVar259 = auVar157._8_4_;
  auVar395._8_4_ = fVar259 * auVar13._8_4_;
  fVar261 = auVar157._12_4_;
  auVar395._12_4_ = fVar261 * auVar13._12_4_;
  fVar263 = auVar157._16_4_;
  auVar395._16_4_ = fVar263 * auVar13._16_4_;
  fVar265 = auVar157._20_4_;
  auVar395._20_4_ = fVar265 * auVar13._20_4_;
  fVar267 = auVar157._24_4_;
  auVar395._24_4_ = fVar267 * auVar13._24_4_;
  auVar395._28_4_ = auVar14._28_4_;
  auVar157 = vsubps_avx(auVar330,auVar395);
  fVar240 = fVar240 + fVar240 * auVar157._0_4_;
  fVar257 = fVar257 + fVar257 * auVar157._4_4_;
  fVar259 = fVar259 + fVar259 * auVar157._8_4_;
  fVar261 = fVar261 + fVar261 * auVar157._12_4_;
  fVar263 = fVar263 + fVar263 * auVar157._16_4_;
  fVar265 = fVar265 + fVar265 * auVar157._20_4_;
  fVar267 = fVar267 + fVar267 * auVar157._24_4_;
  auVar157 = vrcpps_avx(auVar105);
  fVar217 = auVar157._0_4_;
  fVar230 = auVar157._4_4_;
  auVar332._4_4_ = fVar230 * auVar105._4_4_;
  auVar332._0_4_ = fVar217 * auVar105._0_4_;
  fVar231 = auVar157._8_4_;
  auVar332._8_4_ = fVar231 * auVar105._8_4_;
  fVar232 = auVar157._12_4_;
  auVar332._12_4_ = fVar232 * auVar105._12_4_;
  fVar234 = auVar157._16_4_;
  auVar332._16_4_ = fVar234 * auVar105._16_4_;
  fVar236 = auVar157._20_4_;
  auVar332._20_4_ = fVar236 * auVar105._20_4_;
  fVar238 = auVar157._24_4_;
  auVar332._24_4_ = fVar238 * auVar105._24_4_;
  auVar332._28_4_ = auVar13._28_4_;
  auVar105 = vsubps_avx(auVar330,auVar332);
  fVar217 = fVar217 + fVar217 * auVar105._0_4_;
  fVar230 = fVar230 + fVar230 * auVar105._4_4_;
  fVar231 = fVar231 + fVar231 * auVar105._8_4_;
  fVar232 = fVar232 + fVar232 * auVar105._12_4_;
  fVar234 = fVar234 + fVar234 * auVar105._16_4_;
  fVar236 = fVar236 + fVar236 * auVar105._20_4_;
  fVar238 = fVar238 + fVar238 * auVar105._24_4_;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = *(ulong *)(prim + uVar89 * 7 + 6);
  auVar134 = vpmovsxwd_avx(auVar134);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar89 * 7 + 0xe);
  auVar18 = vpmovsxwd_avx(auVar18);
  auVar106._16_16_ = auVar18;
  auVar106._0_16_ = auVar134;
  auVar105 = vcvtdq2ps_avx(auVar106);
  auVar105 = vsubps_avx(auVar105,auVar276);
  auVar94._0_4_ = fVar185 * auVar105._0_4_;
  auVar94._4_4_ = fVar211 * auVar105._4_4_;
  auVar94._8_4_ = fVar212 * auVar105._8_4_;
  auVar94._12_4_ = fVar213 * auVar105._12_4_;
  auVar13._16_4_ = fVar214 * auVar105._16_4_;
  auVar13._0_16_ = auVar94;
  auVar13._20_4_ = fVar215 * auVar105._20_4_;
  auVar13._24_4_ = fVar216 * auVar105._24_4_;
  auVar13._28_4_ = auVar105._28_4_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + lVar10 + 6);
  auVar134 = vpmovsxwd_avx(auVar27);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + lVar10 + 0xe);
  auVar18 = vpmovsxwd_avx(auVar4);
  auVar310._16_16_ = auVar18;
  auVar310._0_16_ = auVar134;
  auVar105 = vcvtdq2ps_avx(auVar310);
  auVar105 = vsubps_avx(auVar105,auVar276);
  auVar186._0_4_ = fVar185 * auVar105._0_4_;
  auVar186._4_4_ = fVar211 * auVar105._4_4_;
  auVar186._8_4_ = fVar212 * auVar105._8_4_;
  auVar186._12_4_ = fVar213 * auVar105._12_4_;
  auVar16._16_4_ = fVar214 * auVar105._16_4_;
  auVar16._0_16_ = auVar186;
  auVar16._20_4_ = fVar215 * auVar105._20_4_;
  auVar16._24_4_ = fVar216 * auVar105._24_4_;
  auVar16._28_4_ = auVar14._28_4_ + auVar15._28_4_;
  lVar90 = (ulong)(byte)PVar8 * 0x10;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + lVar90 + 6);
  auVar134 = vpmovsxwd_avx(auVar5);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + lVar90 + 0xe);
  auVar18 = vpmovsxwd_avx(auVar97);
  lVar90 = lVar90 + uVar89 * -2;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = *(ulong *)(prim + lVar90 + 6);
  auVar27 = vpmovsxwd_avx(auVar169);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + lVar90 + 0xe);
  auVar4 = vpmovsxwd_avx(auVar102);
  auVar277._16_16_ = auVar4;
  auVar277._0_16_ = auVar27;
  auVar105 = vcvtdq2ps_avx(auVar277);
  auVar105 = vsubps_avx(auVar105,auVar111);
  auVar272._0_4_ = fVar240 * auVar105._0_4_;
  auVar272._4_4_ = fVar257 * auVar105._4_4_;
  auVar272._8_4_ = fVar259 * auVar105._8_4_;
  auVar272._12_4_ = fVar261 * auVar105._12_4_;
  auVar14._16_4_ = fVar263 * auVar105._16_4_;
  auVar14._0_16_ = auVar272;
  auVar14._20_4_ = fVar265 * auVar105._20_4_;
  auVar14._24_4_ = fVar267 * auVar105._24_4_;
  auVar14._28_4_ = auVar105._28_4_;
  auVar311._16_16_ = auVar18;
  auVar311._0_16_ = auVar134;
  auVar105 = vcvtdq2ps_avx(auVar311);
  auVar105 = vsubps_avx(auVar105,auVar111);
  auVar133._0_4_ = fVar240 * auVar105._0_4_;
  auVar133._4_4_ = fVar257 * auVar105._4_4_;
  auVar133._8_4_ = fVar259 * auVar105._8_4_;
  auVar133._12_4_ = fVar261 * auVar105._12_4_;
  auVar17._16_4_ = fVar263 * auVar105._16_4_;
  auVar17._0_16_ = auVar133;
  auVar17._20_4_ = fVar265 * auVar105._20_4_;
  auVar17._24_4_ = fVar267 * auVar105._24_4_;
  auVar17._28_4_ = auVar105._28_4_;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = *(ulong *)(prim + uVar86 + uVar89 + 6);
  auVar134 = vpmovsxwd_avx(auVar166);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar86 + uVar89 + 0xe);
  auVar18 = vpmovsxwd_avx(auVar197);
  auVar249._16_16_ = auVar18;
  auVar249._0_16_ = auVar134;
  auVar105 = vcvtdq2ps_avx(auVar249);
  auVar105 = vsubps_avx(auVar105,auVar174);
  auVar243._0_4_ = fVar217 * auVar105._0_4_;
  auVar243._4_4_ = fVar230 * auVar105._4_4_;
  auVar243._8_4_ = fVar231 * auVar105._8_4_;
  auVar243._12_4_ = fVar232 * auVar105._12_4_;
  auVar28._16_4_ = fVar234 * auVar105._16_4_;
  auVar28._0_16_ = auVar243;
  auVar28._20_4_ = fVar236 * auVar105._20_4_;
  auVar28._24_4_ = fVar238 * auVar105._24_4_;
  auVar28._28_4_ = auVar105._28_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar89 * 0x17 + 6);
  auVar134 = vpmovsxwd_avx(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar89 * 0x17 + 0xe);
  auVar18 = vpmovsxwd_avx(auVar7);
  auVar312._16_16_ = auVar18;
  auVar312._0_16_ = auVar134;
  auVar105 = vcvtdq2ps_avx(auVar312);
  auVar105 = vsubps_avx(auVar105,auVar174);
  auVar163._0_4_ = fVar217 * auVar105._0_4_;
  auVar163._4_4_ = fVar230 * auVar105._4_4_;
  auVar163._8_4_ = fVar231 * auVar105._8_4_;
  auVar163._12_4_ = fVar232 * auVar105._12_4_;
  auVar29._16_4_ = fVar234 * auVar105._16_4_;
  auVar29._0_16_ = auVar163;
  auVar29._20_4_ = fVar236 * auVar105._20_4_;
  auVar29._24_4_ = fVar238 * auVar105._24_4_;
  auVar29._28_4_ = auVar105._28_4_;
  auVar134 = vpminsd_avx(auVar13._16_16_,auVar16._16_16_);
  auVar18 = vpminsd_avx(auVar94,auVar186);
  auVar331._16_16_ = auVar134;
  auVar331._0_16_ = auVar18;
  auVar134 = vpminsd_avx(auVar14._16_16_,auVar17._16_16_);
  auVar18 = vpminsd_avx(auVar272,auVar133);
  auVar367._16_16_ = auVar134;
  auVar367._0_16_ = auVar18;
  auVar105 = vmaxps_avx(auVar331,auVar367);
  auVar134 = vpminsd_avx(auVar28._16_16_,auVar29._16_16_);
  auVar18 = vpminsd_avx(auVar243,auVar163);
  auVar390._16_16_ = auVar134;
  auVar390._0_16_ = auVar18;
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar403._4_4_ = uVar2;
  auVar403._0_4_ = uVar2;
  auVar403._8_4_ = uVar2;
  auVar403._12_4_ = uVar2;
  auVar403._16_4_ = uVar2;
  auVar403._20_4_ = uVar2;
  auVar403._24_4_ = uVar2;
  auVar403._28_4_ = uVar2;
  auVar157 = vmaxps_avx(auVar390,auVar403);
  auVar105 = vmaxps_avx(auVar105,auVar157);
  local_340._4_4_ = auVar105._4_4_ * 0.99999964;
  local_340._0_4_ = auVar105._0_4_ * 0.99999964;
  local_340._8_4_ = auVar105._8_4_ * 0.99999964;
  local_340._12_4_ = auVar105._12_4_ * 0.99999964;
  local_340._16_4_ = auVar105._16_4_ * 0.99999964;
  local_340._20_4_ = auVar105._20_4_ * 0.99999964;
  local_340._24_4_ = auVar105._24_4_ * 0.99999964;
  local_340._28_4_ = auVar105._28_4_;
  auVar134 = vpmaxsd_avx(auVar13._16_16_,auVar16._16_16_);
  auVar18 = vpmaxsd_avx(auVar94,auVar186);
  auVar107._16_16_ = auVar134;
  auVar107._0_16_ = auVar18;
  auVar134 = vpmaxsd_avx(auVar14._16_16_,auVar17._16_16_);
  auVar18 = vpmaxsd_avx(auVar272,auVar133);
  auVar145._16_16_ = auVar134;
  auVar145._0_16_ = auVar18;
  auVar105 = vminps_avx(auVar107,auVar145);
  auVar134 = vpmaxsd_avx(auVar28._16_16_,auVar29._16_16_);
  auVar18 = vpmaxsd_avx(auVar243,auVar163);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar205._4_4_ = uVar2;
  auVar205._0_4_ = uVar2;
  auVar205._8_4_ = uVar2;
  auVar205._12_4_ = uVar2;
  auVar205._16_4_ = uVar2;
  auVar205._20_4_ = uVar2;
  auVar205._24_4_ = uVar2;
  auVar205._28_4_ = uVar2;
  auVar146._16_16_ = auVar134;
  auVar146._0_16_ = auVar18;
  auVar157 = vminps_avx(auVar146,auVar205);
  auVar105 = vminps_avx(auVar105,auVar157);
  auVar157._4_4_ = auVar105._4_4_ * 1.0000004;
  auVar157._0_4_ = auVar105._0_4_ * 1.0000004;
  auVar157._8_4_ = auVar105._8_4_ * 1.0000004;
  auVar157._12_4_ = auVar105._12_4_ * 1.0000004;
  auVar157._16_4_ = auVar105._16_4_ * 1.0000004;
  auVar157._20_4_ = auVar105._20_4_ * 1.0000004;
  auVar157._24_4_ = auVar105._24_4_ * 1.0000004;
  auVar157._28_4_ = auVar105._28_4_;
  auVar105 = vcmpps_avx(local_340,auVar157,2);
  auVar134 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar147._16_16_ = auVar134;
  auVar147._0_16_ = auVar134;
  auVar157 = vcvtdq2ps_avx(auVar147);
  auVar157 = vcmpps_avx(_DAT_01faff40,auVar157,1);
  auVar105 = vandps_avx(auVar105,auVar157);
  uVar83 = vmovmskps_avx(auVar105);
  if (uVar83 == 0) {
    return false;
  }
  auVar108._16_16_ = mm_lookupmask_ps._240_16_;
  auVar108._0_16_ = mm_lookupmask_ps._240_16_;
  uVar83 = uVar83 & 0xff;
  local_460 = vblendps_avx(auVar108,ZEXT832(0) << 0x20,0x80);
  uVar84 = 1 << ((byte)k & 0x1f);
  local_9c0 = &local_540;
  local_9c8 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar84 & 0xf) << 4));
  local_9d0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar84 >> 4) * 0x10);
  local_890 = prim;
LAB_0104e37c:
  local_888 = (ulong)uVar83;
  lVar90 = 0;
  if (local_888 != 0) {
    for (; (uVar83 >> lVar90 & 1) == 0; lVar90 = lVar90 + 1) {
    }
  }
  local_9b8 = (ulong)*(uint *)(local_890 + 2);
  pGVar9 = (context->scene->geometries).items[local_9b8].ptr;
  lVar10 = *(long *)&pGVar9[1].time_range.upper;
  uVar89 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)*(uint *)(local_890 + lVar90 * 4 + 6) *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar134 = *(undefined1 (*) [16])(lVar10 + (long)pGVar9[1].intersectionFilterN * uVar89);
  auVar18 = *(undefined1 (*) [16])(lVar10 + (long)pGVar9[1].intersectionFilterN * (uVar89 + 1));
  auVar27 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar4 = vinsertps_avx(auVar27,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar185 = *(float *)(ray + k * 4 + 0x80);
  auVar352._4_4_ = fVar185;
  auVar352._0_4_ = fVar185;
  auVar352._8_4_ = fVar185;
  auVar352._12_4_ = fVar185;
  fStack_a30 = fVar185;
  _local_a40 = auVar352;
  fStack_a2c = fVar185;
  fStack_a28 = fVar185;
  fStack_a24 = fVar185;
  fVar211 = *(float *)(ray + k * 4 + 0xa0);
  auVar379._4_4_ = fVar211;
  auVar379._0_4_ = fVar211;
  auVar379._8_4_ = fVar211;
  auVar379._12_4_ = fVar211;
  fStack_7f0 = fVar211;
  _local_800 = auVar379;
  fStack_7ec = fVar211;
  fStack_7e8 = fVar211;
  fStack_7e4 = fVar211;
  auVar27 = vunpcklps_avx(auVar352,auVar379);
  fVar212 = *(float *)(ray + k * 4 + 0xc0);
  auVar402._4_4_ = fVar212;
  auVar402._0_4_ = fVar212;
  auVar402._8_4_ = fVar212;
  auVar402._12_4_ = fVar212;
  fStack_8f0 = fVar212;
  _local_900 = auVar402;
  fStack_8ec = fVar212;
  fStack_8e8 = fVar212;
  fStack_8e4 = fVar212;
  _local_930 = vinsertps_avx(auVar27,auVar402,0x28);
  pfVar1 = (float *)(pGVar9[2].intersectionFilterN + uVar89 * (long)pGVar9[2].pointQueryFunc);
  auVar218._0_4_ = auVar134._0_4_ + *pfVar1 * 0.33333334;
  auVar218._4_4_ = auVar134._4_4_ + pfVar1[1] * 0.33333334;
  auVar218._8_4_ = auVar134._8_4_ + pfVar1[2] * 0.33333334;
  auVar218._12_4_ = auVar134._12_4_ + pfVar1[3] * 0.33333334;
  pfVar1 = (float *)(pGVar9[2].intersectionFilterN + (long)pGVar9[2].pointQueryFunc * (uVar89 + 1));
  auVar95._0_4_ = *pfVar1 * 0.33333334;
  auVar95._4_4_ = pfVar1[1] * 0.33333334;
  auVar95._8_4_ = pfVar1[2] * 0.33333334;
  auVar95._12_4_ = pfVar1[3] * 0.33333334;
  auVar97 = vsubps_avx(auVar18,auVar95);
  auVar96._0_4_ = (auVar18._0_4_ + auVar134._0_4_ + auVar218._0_4_ + auVar97._0_4_) * 0.25;
  auVar96._4_4_ = (auVar18._4_4_ + auVar134._4_4_ + auVar218._4_4_ + auVar97._4_4_) * 0.25;
  auVar96._8_4_ = (auVar18._8_4_ + auVar134._8_4_ + auVar218._8_4_ + auVar97._8_4_) * 0.25;
  auVar96._12_4_ = (auVar18._12_4_ + auVar134._12_4_ + auVar218._12_4_ + auVar97._12_4_) * 0.25;
  auVar27 = vsubps_avx(auVar96,auVar4);
  auVar27 = vdpps_avx(auVar27,_local_930,0x7f);
  local_940 = vdpps_avx(_local_930,_local_930,0x7f);
  auVar5 = vrcpss_avx(local_940,local_940);
  fVar213 = auVar27._0_4_ * auVar5._0_4_ * (2.0 - local_940._0_4_ * auVar5._0_4_);
  auVar5 = vshufps_avx(ZEXT416((uint)fVar213),ZEXT416((uint)fVar213),0);
  auVar187._0_4_ = auVar4._0_4_ + local_930._0_4_ * auVar5._0_4_;
  auVar187._4_4_ = auVar4._4_4_ + local_930._4_4_ * auVar5._4_4_;
  auVar187._8_4_ = auVar4._8_4_ + local_930._8_4_ * auVar5._8_4_;
  auVar187._12_4_ = auVar4._12_4_ + local_930._12_4_ * auVar5._12_4_;
  auVar27 = vblendps_avx(auVar187,_DAT_01f7aa10,8);
  _local_af0 = vsubps_avx(auVar134,auVar27);
  _local_b00 = vsubps_avx(auVar97,auVar27);
  _local_b10 = vsubps_avx(auVar218,auVar27);
  _local_b20 = vsubps_avx(auVar18,auVar27);
  auVar18 = vshufps_avx(_local_af0,_local_af0,0);
  auVar134 = vshufps_avx(_local_af0,_local_af0,0x55);
  register0x00001250 = auVar134;
  _local_1e0 = auVar134;
  auVar134 = vshufps_avx(_local_af0,_local_af0,0xaa);
  local_a00._16_16_ = auVar134;
  local_a00._0_16_ = auVar134;
  auVar370 = ZEXT3264(local_a00);
  auVar27 = vshufps_avx(_local_af0,_local_af0,0xff);
  auVar134 = vshufps_avx(_local_b10,_local_b10,0);
  auVar278._16_16_ = auVar134;
  auVar278._0_16_ = auVar134;
  auVar4 = vshufps_avx(_local_b10,_local_b10,0x55);
  auVar134 = vshufps_avx(_local_b10,_local_b10,0xaa);
  local_a20._16_16_ = auVar134;
  local_a20._0_16_ = auVar134;
  auVar414 = ZEXT3264(local_a20);
  auVar134 = vshufps_avx(_local_b10,_local_b10,0xff);
  local_a80._16_16_ = auVar134;
  local_a80._0_16_ = auVar134;
  auVar134 = vshufps_avx(_local_b00,_local_b00,0);
  local_2c0._16_16_ = auVar134;
  local_2c0._0_16_ = auVar134;
  auVar134 = vshufps_avx(_local_b00,_local_b00,0x55);
  local_2e0._16_16_ = auVar134;
  local_2e0._0_16_ = auVar134;
  auVar134 = vshufps_avx(_local_b00,_local_b00,0xaa);
  local_300._16_16_ = auVar134;
  local_300._0_16_ = auVar134;
  auVar134 = vshufps_avx(_local_b00,_local_b00,0xff);
  auVar287 = ZEXT3264(local_a80);
  register0x00001290 = auVar134;
  _local_200 = auVar134;
  auVar134 = vshufps_avx(_local_b20,_local_b20,0);
  register0x00001290 = auVar134;
  _local_220 = auVar134;
  auVar134 = vshufps_avx(_local_b20,_local_b20,0x55);
  register0x00001290 = auVar134;
  _local_240 = auVar134;
  auVar134 = vshufps_avx(_local_b20,_local_b20,0xaa);
  register0x00001290 = auVar134;
  _local_260 = auVar134;
  auVar134 = vshufps_avx(_local_b20,_local_b20,0xff);
  register0x00001290 = auVar134;
  _local_280 = auVar134;
  auVar134 = ZEXT416((uint)(fVar185 * fVar185 + fVar211 * fVar211 + fVar212 * fVar212));
  auVar134 = vshufps_avx(auVar134,auVar134,0);
  local_2a0._16_16_ = auVar134;
  local_2a0._0_16_ = auVar134;
  fVar185 = *(float *)(ray + k * 4 + 0x60);
  local_8a0 = ZEXT416((uint)fVar213);
  auVar134 = vshufps_avx(ZEXT416((uint)(fVar185 - fVar213)),ZEXT416((uint)(fVar185 - fVar213)),0);
  local_320._16_16_ = auVar134;
  local_320._0_16_ = auVar134;
  auVar134 = vpshufd_avx(ZEXT416(*(uint *)(local_890 + 2)),0);
  local_4c0._16_16_ = auVar134;
  local_4c0._0_16_ = auVar134;
  auVar134 = vpshufd_avx(ZEXT416(*(uint *)(local_890 + lVar90 * 4 + 6)),0);
  local_4e0._16_16_ = auVar134;
  local_4e0._0_16_ = auVar134;
  local_ca0 = auVar5._0_8_;
  uStack_c98 = auVar5._8_8_;
  local_8e0 = local_ca0;
  uStack_8d8 = uStack_c98;
  uStack_8d0 = local_ca0;
  uStack_8c8 = uStack_c98;
  uVar89 = 0;
  bVar91 = false;
  local_ca4 = 1;
  auVar109._8_4_ = 0x7fffffff;
  auVar109._0_8_ = 0x7fffffff7fffffff;
  auVar109._12_4_ = 0x7fffffff;
  auVar109._16_4_ = 0x7fffffff;
  auVar109._20_4_ = 0x7fffffff;
  auVar109._24_4_ = 0x7fffffff;
  auVar109._28_4_ = 0x7fffffff;
  local_4a0 = vandps_avx(local_2a0,auVar109);
  auVar134 = vsqrtss_avx(local_940,local_940);
  auVar5 = vsqrtss_avx(local_940,local_940);
  local_630 = ZEXT816(0x3f80000000000000);
  local_480 = auVar278;
  do {
    auVar206._8_4_ = 0x3f800000;
    auVar206._0_8_ = 0x3f8000003f800000;
    auVar206._12_4_ = 0x3f800000;
    auVar206._16_4_ = 0x3f800000;
    auVar206._20_4_ = 0x3f800000;
    iVar88 = (int)uVar89;
    auVar206._24_4_ = 0x3f800000;
    auVar206._28_4_ = 0x3f800000;
    auVar97 = vmovshdup_avx(local_630);
    auVar102 = vsubps_avx(auVar97,local_630);
    auVar97 = vshufps_avx(local_630,local_630,0);
    local_7a0._16_16_ = auVar97;
    local_7a0._0_16_ = auVar97;
    auVar169 = vshufps_avx(auVar102,auVar102,0);
    local_7c0._16_16_ = auVar169;
    local_7c0._0_16_ = auVar169;
    fVar132 = auVar169._0_4_;
    fVar160 = auVar169._4_4_;
    fVar161 = auVar169._8_4_;
    fVar162 = auVar169._12_4_;
    fVar93 = auVar97._0_4_;
    auVar148._0_4_ = fVar93 + fVar132 * 0.0;
    fVar123 = auVar97._4_4_;
    auVar148._4_4_ = fVar123 + fVar160 * 0.14285715;
    fVar125 = auVar97._8_4_;
    auVar148._8_4_ = fVar125 + fVar161 * 0.2857143;
    fVar127 = auVar97._12_4_;
    auVar148._12_4_ = fVar127 + fVar162 * 0.42857146;
    auVar148._16_4_ = fVar93 + fVar132 * 0.5714286;
    auVar148._20_4_ = fVar123 + fVar160 * 0.71428573;
    auVar148._24_4_ = fVar125 + fVar161 * 0.8571429;
    auVar148._28_4_ = fVar127 + fVar162;
    auVar105 = vsubps_avx(auVar206,auVar148);
    fVar231 = auVar4._0_4_;
    fVar408 = auVar4._4_4_;
    fVar409 = auVar4._8_4_;
    fVar230 = auVar278._28_4_;
    fVar211 = auVar105._0_4_;
    fVar212 = auVar105._4_4_;
    fVar213 = auVar105._8_4_;
    fVar214 = auVar105._12_4_;
    fVar215 = auVar105._16_4_;
    fVar216 = auVar105._20_4_;
    fVar217 = auVar105._24_4_;
    fVar383 = auVar27._12_4_;
    fVar261 = auVar287._28_4_ + fVar230 + auVar18._12_4_ + 1.0 + 1.0;
    fVar269 = local_2c0._0_4_ * auVar148._0_4_ + auVar278._0_4_ * fVar211;
    fVar288 = local_2c0._4_4_ * auVar148._4_4_ + auVar278._4_4_ * fVar212;
    fVar291 = local_2c0._8_4_ * auVar148._8_4_ + auVar278._8_4_ * fVar213;
    fVar294 = local_2c0._12_4_ * auVar148._12_4_ + auVar278._12_4_ * fVar214;
    fVar297 = local_2c0._16_4_ * auVar148._16_4_ + auVar278._16_4_ * fVar215;
    fVar300 = local_2c0._20_4_ * auVar148._20_4_ + auVar278._20_4_ * fVar216;
    fVar303 = local_2c0._24_4_ * auVar148._24_4_ + auVar278._24_4_ * fVar217;
    fVar232 = local_2e0._0_4_ * auVar148._0_4_ + fVar231 * fVar211;
    fVar234 = local_2e0._4_4_ * auVar148._4_4_ + fVar408 * fVar212;
    fVar236 = local_2e0._8_4_ * auVar148._8_4_ + fVar409 * fVar213;
    fVar238 = local_2e0._12_4_ * auVar148._12_4_ + auVar4._12_4_ * fVar214;
    fVar240 = local_2e0._16_4_ * auVar148._16_4_ + fVar231 * fVar215;
    fVar257 = local_2e0._20_4_ * auVar148._20_4_ + fVar408 * fVar216;
    fVar259 = local_2e0._24_4_ * auVar148._24_4_ + fVar409 * fVar217;
    fVar263 = local_300._0_4_ * auVar148._0_4_ + auVar414._0_4_ * fVar211;
    fVar265 = local_300._4_4_ * auVar148._4_4_ + auVar414._4_4_ * fVar212;
    fVar267 = local_300._8_4_ * auVar148._8_4_ + auVar414._8_4_ * fVar213;
    fVar233 = local_300._12_4_ * auVar148._12_4_ + auVar414._12_4_ * fVar214;
    fVar235 = local_300._16_4_ * auVar148._16_4_ + auVar414._16_4_ * fVar215;
    fVar237 = local_300._20_4_ * auVar148._20_4_ + auVar414._20_4_ * fVar216;
    fVar239 = local_300._24_4_ * auVar148._24_4_ + auVar414._24_4_ * fVar217;
    fVar241 = (float)local_200._0_4_ * auVar148._0_4_ + auVar287._0_4_ * fVar211;
    fVar258 = (float)local_200._4_4_ * auVar148._4_4_ + auVar287._4_4_ * fVar212;
    fVar260 = fStack_1f8 * auVar148._8_4_ + auVar287._8_4_ * fVar213;
    fVar262 = fStack_1f4 * auVar148._12_4_ + auVar287._12_4_ * fVar214;
    fVar264 = fStack_1f0 * auVar148._16_4_ + auVar287._16_4_ * fVar215;
    fVar266 = fStack_1ec * auVar148._20_4_ + auVar287._20_4_ * fVar216;
    fVar268 = fStack_1e8 * auVar148._24_4_ + auVar287._24_4_ * fVar217;
    fVar377 = auVar370._28_4_;
    fVar388 = fVar383 + fVar377;
    auVar340._0_4_ =
         fVar211 * (auVar278._0_4_ * auVar148._0_4_ + auVar18._0_4_ * fVar211) +
         auVar148._0_4_ * fVar269;
    auVar340._4_4_ =
         fVar212 * (auVar278._4_4_ * auVar148._4_4_ + auVar18._4_4_ * fVar212) +
         auVar148._4_4_ * fVar288;
    auVar340._8_4_ =
         fVar213 * (auVar278._8_4_ * auVar148._8_4_ + auVar18._8_4_ * fVar213) +
         auVar148._8_4_ * fVar291;
    auVar340._12_4_ =
         fVar214 * (auVar278._12_4_ * auVar148._12_4_ + auVar18._12_4_ * fVar214) +
         auVar148._12_4_ * fVar294;
    auVar340._16_4_ =
         fVar215 * (auVar278._16_4_ * auVar148._16_4_ + auVar18._0_4_ * fVar215) +
         auVar148._16_4_ * fVar297;
    auVar340._20_4_ =
         fVar216 * (auVar278._20_4_ * auVar148._20_4_ + auVar18._4_4_ * fVar216) +
         auVar148._20_4_ * fVar300;
    auVar340._24_4_ =
         fVar217 * (auVar278._24_4_ * auVar148._24_4_ + auVar18._8_4_ * fVar217) +
         auVar148._24_4_ * fVar303;
    auVar340._28_4_ = local_2e0._28_4_ + fVar377;
    auVar354._0_4_ =
         fVar211 * (fVar231 * auVar148._0_4_ + fVar211 * (float)local_1e0._0_4_) +
         auVar148._0_4_ * fVar232;
    auVar354._4_4_ =
         fVar212 * (fVar408 * auVar148._4_4_ + fVar212 * (float)local_1e0._4_4_) +
         auVar148._4_4_ * fVar234;
    auVar354._8_4_ =
         fVar213 * (fVar409 * auVar148._8_4_ + fVar213 * fStack_1d8) + auVar148._8_4_ * fVar236;
    auVar354._12_4_ =
         fVar214 * (auVar4._12_4_ * auVar148._12_4_ + fVar214 * fStack_1d4) +
         auVar148._12_4_ * fVar238;
    auVar354._16_4_ =
         fVar215 * (fVar231 * auVar148._16_4_ + fVar215 * fStack_1d0) + auVar148._16_4_ * fVar240;
    auVar354._20_4_ =
         fVar216 * (fVar408 * auVar148._20_4_ + fVar216 * fStack_1cc) + auVar148._20_4_ * fVar257;
    auVar354._24_4_ =
         fVar217 * (fVar409 * auVar148._24_4_ + fVar217 * fStack_1c8) + auVar148._24_4_ * fVar259;
    auVar354._28_4_ = local_2c0._28_4_ + fVar377;
    fVar231 = local_300._28_4_;
    auVar368._0_4_ =
         fVar211 * (auVar414._0_4_ * auVar148._0_4_ + auVar370._0_4_ * fVar211) +
         auVar148._0_4_ * fVar263;
    auVar368._4_4_ =
         fVar212 * (auVar414._4_4_ * auVar148._4_4_ + auVar370._4_4_ * fVar212) +
         auVar148._4_4_ * fVar265;
    auVar368._8_4_ =
         fVar213 * (auVar414._8_4_ * auVar148._8_4_ + auVar370._8_4_ * fVar213) +
         auVar148._8_4_ * fVar267;
    auVar368._12_4_ =
         fVar214 * (auVar414._12_4_ * auVar148._12_4_ + auVar370._12_4_ * fVar214) +
         auVar148._12_4_ * fVar233;
    auVar368._16_4_ =
         fVar215 * (auVar414._16_4_ * auVar148._16_4_ + auVar370._16_4_ * fVar215) +
         auVar148._16_4_ * fVar235;
    auVar368._20_4_ =
         fVar216 * (auVar414._20_4_ * auVar148._20_4_ + auVar370._20_4_ * fVar216) +
         auVar148._20_4_ * fVar237;
    auVar368._24_4_ =
         fVar217 * (auVar414._24_4_ * auVar148._24_4_ + auVar370._24_4_ * fVar217) +
         auVar148._24_4_ * fVar239;
    auVar368._28_4_ = fVar231 + fVar377;
    auVar313._0_4_ =
         auVar148._0_4_ * fVar241 +
         fVar211 * (auVar287._0_4_ * auVar148._0_4_ + auVar27._0_4_ * fVar211);
    auVar313._4_4_ =
         auVar148._4_4_ * fVar258 +
         fVar212 * (auVar287._4_4_ * auVar148._4_4_ + auVar27._4_4_ * fVar212);
    auVar313._8_4_ =
         auVar148._8_4_ * fVar260 +
         fVar213 * (auVar287._8_4_ * auVar148._8_4_ + auVar27._8_4_ * fVar213);
    auVar313._12_4_ =
         auVar148._12_4_ * fVar262 +
         fVar214 * (auVar287._12_4_ * auVar148._12_4_ + fVar383 * fVar214);
    auVar313._16_4_ =
         auVar148._16_4_ * fVar264 +
         fVar215 * (auVar287._16_4_ * auVar148._16_4_ + auVar27._0_4_ * fVar215);
    auVar313._20_4_ =
         auVar148._20_4_ * fVar266 +
         fVar216 * (auVar287._20_4_ * auVar148._20_4_ + auVar27._4_4_ * fVar216);
    auVar313._24_4_ =
         auVar148._24_4_ * fVar268 +
         fVar217 * (auVar287._24_4_ * auVar148._24_4_ + auVar27._8_4_ * fVar217);
    auVar313._28_4_ = fVar231 + fStack_1e4;
    auVar279._0_4_ =
         (auVar148._0_4_ * (float)local_220._0_4_ + local_2c0._0_4_ * fVar211) * auVar148._0_4_ +
         fVar211 * fVar269;
    auVar279._4_4_ =
         (auVar148._4_4_ * (float)local_220._4_4_ + local_2c0._4_4_ * fVar212) * auVar148._4_4_ +
         fVar212 * fVar288;
    auVar279._8_4_ =
         (auVar148._8_4_ * fStack_218 + local_2c0._8_4_ * fVar213) * auVar148._8_4_ +
         fVar213 * fVar291;
    auVar279._12_4_ =
         (auVar148._12_4_ * fStack_214 + local_2c0._12_4_ * fVar214) * auVar148._12_4_ +
         fVar214 * fVar294;
    auVar279._16_4_ =
         (auVar148._16_4_ * fStack_210 + local_2c0._16_4_ * fVar215) * auVar148._16_4_ +
         fVar215 * fVar297;
    auVar279._20_4_ =
         (auVar148._20_4_ * fStack_20c + local_2c0._20_4_ * fVar216) * auVar148._20_4_ +
         fVar216 * fVar300;
    auVar279._24_4_ =
         (auVar148._24_4_ * fStack_208 + local_2c0._24_4_ * fVar217) * auVar148._24_4_ +
         fVar217 * fVar303;
    auVar279._28_4_ = fVar231 + fVar261 + auVar287._28_4_;
    auVar207._0_4_ =
         (auVar148._0_4_ * (float)local_240._0_4_ + local_2e0._0_4_ * fVar211) * auVar148._0_4_ +
         fVar211 * fVar232;
    auVar207._4_4_ =
         (auVar148._4_4_ * (float)local_240._4_4_ + local_2e0._4_4_ * fVar212) * auVar148._4_4_ +
         fVar212 * fVar234;
    auVar207._8_4_ =
         (auVar148._8_4_ * fStack_238 + local_2e0._8_4_ * fVar213) * auVar148._8_4_ +
         fVar213 * fVar236;
    auVar207._12_4_ =
         (auVar148._12_4_ * fStack_234 + local_2e0._12_4_ * fVar214) * auVar148._12_4_ +
         fVar214 * fVar238;
    auVar207._16_4_ =
         (auVar148._16_4_ * fStack_230 + local_2e0._16_4_ * fVar215) * auVar148._16_4_ +
         fVar215 * fVar240;
    auVar207._20_4_ =
         (auVar148._20_4_ * fStack_22c + local_2e0._20_4_ * fVar216) * auVar148._20_4_ +
         fVar216 * fVar257;
    auVar207._24_4_ =
         (auVar148._24_4_ * fStack_228 + local_2e0._24_4_ * fVar217) * auVar148._24_4_ +
         fVar217 * fVar259;
    auVar207._28_4_ = fVar231 + fVar261 + 1.0;
    auVar225._0_4_ =
         (auVar148._0_4_ * (float)local_260._0_4_ + local_300._0_4_ * fVar211) * auVar148._0_4_ +
         fVar211 * fVar263;
    auVar225._4_4_ =
         (auVar148._4_4_ * (float)local_260._4_4_ + local_300._4_4_ * fVar212) * auVar148._4_4_ +
         fVar212 * fVar265;
    auVar225._8_4_ =
         (auVar148._8_4_ * fStack_258 + local_300._8_4_ * fVar213) * auVar148._8_4_ +
         fVar213 * fVar267;
    auVar225._12_4_ =
         (auVar148._12_4_ * fStack_254 + local_300._12_4_ * fVar214) * auVar148._12_4_ +
         fVar214 * fVar233;
    auVar225._16_4_ =
         (auVar148._16_4_ * fStack_250 + local_300._16_4_ * fVar215) * auVar148._16_4_ +
         fVar215 * fVar235;
    auVar225._20_4_ =
         (auVar148._20_4_ * fStack_24c + local_300._20_4_ * fVar216) * auVar148._20_4_ +
         fVar216 * fVar237;
    auVar225._24_4_ =
         (auVar148._24_4_ * fStack_248 + local_300._24_4_ * fVar217) * auVar148._24_4_ +
         fVar217 * fVar239;
    auVar225._28_4_ = fVar388 + fVar230 + 1.0;
    auVar250._0_4_ =
         (auVar148._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar211) *
         auVar148._0_4_ + fVar211 * fVar241;
    auVar250._4_4_ =
         (auVar148._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar212) *
         auVar148._4_4_ + fVar212 * fVar258;
    auVar250._8_4_ =
         (auVar148._8_4_ * fStack_278 + fStack_1f8 * fVar213) * auVar148._8_4_ + fVar213 * fVar260;
    auVar250._12_4_ =
         (auVar148._12_4_ * fStack_274 + fStack_1f4 * fVar214) * auVar148._12_4_ + fVar214 * fVar262
    ;
    auVar250._16_4_ =
         (auVar148._16_4_ * fStack_270 + fStack_1f0 * fVar215) * auVar148._16_4_ + fVar215 * fVar264
    ;
    auVar250._20_4_ =
         (auVar148._20_4_ * fStack_26c + fStack_1ec * fVar216) * auVar148._20_4_ + fVar216 * fVar266
    ;
    auVar250._24_4_ =
         (auVar148._24_4_ * fStack_268 + fStack_1e8 * fVar217) * auVar148._24_4_ + fVar217 * fVar268
    ;
    auVar250._28_4_ = fVar377 + fVar230 + fVar377 + fVar230;
    auVar391._0_4_ = auVar340._0_4_ * fVar211 + auVar148._0_4_ * auVar279._0_4_;
    auVar391._4_4_ = auVar340._4_4_ * fVar212 + auVar148._4_4_ * auVar279._4_4_;
    auVar391._8_4_ = auVar340._8_4_ * fVar213 + auVar148._8_4_ * auVar279._8_4_;
    auVar391._12_4_ = auVar340._12_4_ * fVar214 + auVar148._12_4_ * auVar279._12_4_;
    auVar391._16_4_ = auVar340._16_4_ * fVar215 + auVar148._16_4_ * auVar279._16_4_;
    auVar391._20_4_ = auVar340._20_4_ * fVar216 + auVar148._20_4_ * auVar279._20_4_;
    auVar391._24_4_ = auVar340._24_4_ * fVar217 + auVar148._24_4_ * auVar279._24_4_;
    auVar391._28_4_ = fVar377 + fVar230 + fVar231;
    auVar404._0_4_ = auVar354._0_4_ * fVar211 + auVar148._0_4_ * auVar207._0_4_;
    auVar404._4_4_ = auVar354._4_4_ * fVar212 + auVar148._4_4_ * auVar207._4_4_;
    auVar404._8_4_ = auVar354._8_4_ * fVar213 + auVar148._8_4_ * auVar207._8_4_;
    auVar404._12_4_ = auVar354._12_4_ * fVar214 + auVar148._12_4_ * auVar207._12_4_;
    auVar404._16_4_ = auVar354._16_4_ * fVar215 + auVar148._16_4_ * auVar207._16_4_;
    auVar404._20_4_ = auVar354._20_4_ * fVar216 + auVar148._20_4_ * auVar207._20_4_;
    auVar404._24_4_ = auVar354._24_4_ * fVar217 + auVar148._24_4_ * auVar207._24_4_;
    auVar404._28_4_ = fVar231 + fVar388;
    auVar410._0_4_ = auVar368._0_4_ * fVar211 + auVar148._0_4_ * auVar225._0_4_;
    auVar410._4_4_ = auVar368._4_4_ * fVar212 + auVar148._4_4_ * auVar225._4_4_;
    auVar410._8_4_ = auVar368._8_4_ * fVar213 + auVar148._8_4_ * auVar225._8_4_;
    auVar410._12_4_ = auVar368._12_4_ * fVar214 + auVar148._12_4_ * auVar225._12_4_;
    auVar410._16_4_ = auVar368._16_4_ * fVar215 + auVar148._16_4_ * auVar225._16_4_;
    auVar410._20_4_ = auVar368._20_4_ * fVar216 + auVar148._20_4_ * auVar225._20_4_;
    auVar410._24_4_ = auVar368._24_4_ * fVar217 + auVar148._24_4_ * auVar225._24_4_;
    auVar410._28_4_ = fVar388 + fVar231;
    local_aa0._0_4_ = auVar102._0_4_;
    local_7e0._0_4_ = fVar211 * auVar313._0_4_ + auVar148._0_4_ * auVar250._0_4_;
    local_7e0._4_4_ = fVar212 * auVar313._4_4_ + auVar148._4_4_ * auVar250._4_4_;
    local_7e0._8_4_ = fVar213 * auVar313._8_4_ + auVar148._8_4_ * auVar250._8_4_;
    local_7e0._12_4_ = fVar214 * auVar313._12_4_ + auVar148._12_4_ * auVar250._12_4_;
    local_7e0._16_4_ = fVar215 * auVar313._16_4_ + auVar148._16_4_ * auVar250._16_4_;
    local_7e0._20_4_ = fVar216 * auVar313._20_4_ + auVar148._20_4_ * auVar250._20_4_;
    local_7e0._24_4_ = fVar217 * auVar313._24_4_ + auVar148._24_4_ * auVar250._24_4_;
    local_7e0._28_4_ = auVar105._28_4_ + auVar148._28_4_;
    auVar105 = vsubps_avx(auVar279,auVar340);
    auVar157 = vsubps_avx(auVar207,auVar354);
    auVar13 = vsubps_avx(auVar225,auVar368);
    auVar14 = vsubps_avx(auVar250,auVar313);
    auVar97 = vshufps_avx(ZEXT416((uint)((float)local_aa0._0_4_ * 0.04761905)),
                          ZEXT416((uint)((float)local_aa0._0_4_ * 0.04761905)),0);
    fVar216 = auVar97._0_4_;
    fVar270 = fVar216 * auVar105._0_4_ * 3.0;
    fVar230 = auVar97._4_4_;
    fVar289 = fVar230 * auVar105._4_4_ * 3.0;
    local_ae0._4_4_ = fVar289;
    local_ae0._0_4_ = fVar270;
    fVar240 = auVar97._8_4_;
    fVar292 = fVar240 * auVar105._8_4_ * 3.0;
    fStack_ad8 = fVar292;
    fVar267 = auVar97._12_4_;
    fVar295 = fVar267 * auVar105._12_4_ * 3.0;
    fStack_ad4 = fVar295;
    fVar298 = fVar216 * auVar105._16_4_ * 3.0;
    unique0x1000a99c = fVar298;
    fVar301 = fVar230 * auVar105._20_4_ * 3.0;
    unique0x1000a9a0 = fVar301;
    fVar304 = fVar240 * auVar105._24_4_ * 3.0;
    unique0x1000a9a4 = fVar304;
    unique0x1000a9a8 = auVar279._28_4_;
    fVar306 = fVar216 * auVar157._0_4_ * 3.0;
    fVar317 = fVar230 * auVar157._4_4_ * 3.0;
    auVar30._4_4_ = fVar317;
    auVar30._0_4_ = fVar306;
    fVar318 = fVar240 * auVar157._8_4_ * 3.0;
    auVar30._8_4_ = fVar318;
    fVar320 = fVar267 * auVar157._12_4_ * 3.0;
    auVar30._12_4_ = fVar320;
    fVar322 = fVar216 * auVar157._16_4_ * 3.0;
    auVar30._16_4_ = fVar322;
    fVar324 = fVar230 * auVar157._20_4_ * 3.0;
    auVar30._20_4_ = fVar324;
    fVar326 = fVar240 * auVar157._24_4_ * 3.0;
    auVar30._24_4_ = fVar326;
    auVar30._28_4_ = auVar313._28_4_;
    fVar378 = fVar216 * auVar13._0_4_ * 3.0;
    fVar381 = fVar230 * auVar13._4_4_ * 3.0;
    auVar31._4_4_ = fVar381;
    auVar31._0_4_ = fVar378;
    fVar382 = fVar240 * auVar13._8_4_ * 3.0;
    auVar31._8_4_ = fVar382;
    fVar384 = fVar267 * auVar13._12_4_ * 3.0;
    auVar31._12_4_ = fVar384;
    fVar385 = fVar216 * auVar13._16_4_ * 3.0;
    auVar31._16_4_ = fVar385;
    fVar386 = fVar230 * auVar13._20_4_ * 3.0;
    auVar31._20_4_ = fVar386;
    fVar387 = fVar240 * auVar13._24_4_ * 3.0;
    auVar31._24_4_ = fVar387;
    auVar31._28_4_ = fVar388;
    fVar217 = fVar216 * auVar14._0_4_ * 3.0;
    fVar238 = fVar230 * auVar14._4_4_ * 3.0;
    auVar32._4_4_ = fVar238;
    auVar32._0_4_ = fVar217;
    fVar257 = fVar240 * auVar14._8_4_ * 3.0;
    auVar32._8_4_ = fVar257;
    fVar233 = fVar267 * auVar14._12_4_ * 3.0;
    auVar32._12_4_ = fVar233;
    fVar216 = fVar216 * auVar14._16_4_ * 3.0;
    auVar32._16_4_ = fVar216;
    fVar230 = fVar230 * auVar14._20_4_ * 3.0;
    auVar32._20_4_ = fVar230;
    fVar240 = fVar240 * auVar14._24_4_ * 3.0;
    auVar32._24_4_ = fVar240;
    auVar32._28_4_ = fVar267;
    auVar105 = vperm2f128_avx(auVar404,auVar404,1);
    auVar105 = vshufps_avx(auVar105,auVar404,0x30);
    local_aa0 = vshufps_avx(auVar404,auVar105,0x29);
    auVar105 = vperm2f128_avx(auVar410,auVar410,1);
    auVar105 = vshufps_avx(auVar105,auVar410,0x30);
    local_ac0 = vshufps_avx(auVar410,auVar105,0x29);
    auVar157 = vsubps_avx(local_7e0,auVar32);
    auVar105 = vperm2f128_avx(auVar157,auVar157,1);
    auVar105 = vshufps_avx(auVar105,auVar157,0x30);
    auVar14 = vshufps_avx(auVar157,auVar105,0x29);
    auVar13 = vsubps_avx(local_aa0,auVar404);
    auVar15 = vsubps_avx(local_ac0,auVar410);
    fVar212 = auVar13._0_4_;
    fVar231 = auVar13._4_4_;
    auVar33._4_4_ = fVar381 * fVar231;
    auVar33._0_4_ = fVar378 * fVar212;
    fVar259 = auVar13._8_4_;
    auVar33._8_4_ = fVar382 * fVar259;
    fVar237 = auVar13._12_4_;
    auVar33._12_4_ = fVar384 * fVar237;
    fVar266 = auVar13._16_4_;
    auVar33._16_4_ = fVar385 * fVar266;
    fVar300 = auVar13._20_4_;
    auVar33._20_4_ = fVar386 * fVar300;
    fVar20 = auVar13._24_4_;
    auVar33._24_4_ = fVar387 * fVar20;
    auVar33._28_4_ = auVar157._28_4_;
    fVar365 = auVar15._0_4_;
    fVar371 = auVar15._4_4_;
    auVar34._4_4_ = fVar371 * fVar317;
    auVar34._0_4_ = fVar365 * fVar306;
    fVar372 = auVar15._8_4_;
    auVar34._8_4_ = fVar372 * fVar318;
    fVar373 = auVar15._12_4_;
    auVar34._12_4_ = fVar373 * fVar320;
    fVar374 = auVar15._16_4_;
    auVar34._16_4_ = fVar374 * fVar322;
    fVar375 = auVar15._20_4_;
    auVar34._20_4_ = fVar375 * fVar324;
    fVar376 = auVar15._24_4_;
    auVar34._24_4_ = fVar376 * fVar326;
    auVar34._28_4_ = auVar105._28_4_;
    auVar395 = vsubps_avx(auVar34,auVar33);
    auVar105 = vperm2f128_avx(auVar391,auVar391,1);
    auVar105 = vshufps_avx(auVar105,auVar391,0x30);
    auVar15 = vshufps_avx(auVar391,auVar105,0x29);
    auVar16 = vsubps_avx(auVar15,auVar391);
    auVar35._4_4_ = fVar371 * fVar289;
    auVar35._0_4_ = fVar365 * fVar270;
    auVar35._8_4_ = fVar372 * fVar292;
    auVar35._12_4_ = fVar373 * fVar295;
    auVar35._16_4_ = fVar374 * fVar298;
    auVar35._20_4_ = fVar375 * fVar301;
    auVar35._24_4_ = fVar376 * fVar304;
    auVar35._28_4_ = auVar15._28_4_;
    fVar213 = auVar16._0_4_;
    fVar232 = auVar16._4_4_;
    auVar36._4_4_ = fVar381 * fVar232;
    auVar36._0_4_ = fVar378 * fVar213;
    fVar261 = auVar16._8_4_;
    auVar36._8_4_ = fVar382 * fVar261;
    fVar239 = auVar16._12_4_;
    auVar36._12_4_ = fVar384 * fVar239;
    fVar268 = auVar16._16_4_;
    auVar36._16_4_ = fVar385 * fVar268;
    fVar303 = auVar16._20_4_;
    auVar36._20_4_ = fVar386 * fVar303;
    fVar21 = auVar16._24_4_;
    auVar36._24_4_ = fVar387 * fVar21;
    auVar36._28_4_ = local_ac0._28_4_;
    auVar332 = vsubps_avx(auVar36,auVar35);
    auVar37._4_4_ = fVar232 * fVar317;
    auVar37._0_4_ = fVar213 * fVar306;
    auVar37._8_4_ = fVar261 * fVar318;
    auVar37._12_4_ = fVar239 * fVar320;
    auVar37._16_4_ = fVar268 * fVar322;
    auVar37._20_4_ = fVar303 * fVar324;
    auVar37._24_4_ = fVar21 * fVar326;
    auVar37._28_4_ = local_ac0._28_4_;
    auVar38._4_4_ = fVar289 * fVar231;
    auVar38._0_4_ = fVar270 * fVar212;
    auVar38._8_4_ = fVar292 * fVar259;
    auVar38._12_4_ = fVar295 * fVar237;
    auVar38._16_4_ = fVar298 * fVar266;
    auVar38._20_4_ = fVar301 * fVar300;
    auVar38._24_4_ = fVar304 * fVar20;
    auVar38._28_4_ = auVar354._28_4_;
    auVar17 = vsubps_avx(auVar38,auVar37);
    fVar211 = auVar17._28_4_;
    auVar175._0_4_ = fVar213 * fVar213 + fVar212 * fVar212 + fVar365 * fVar365;
    auVar175._4_4_ = fVar232 * fVar232 + fVar231 * fVar231 + fVar371 * fVar371;
    auVar175._8_4_ = fVar261 * fVar261 + fVar259 * fVar259 + fVar372 * fVar372;
    auVar175._12_4_ = fVar239 * fVar239 + fVar237 * fVar237 + fVar373 * fVar373;
    auVar175._16_4_ = fVar268 * fVar268 + fVar266 * fVar266 + fVar374 * fVar374;
    auVar175._20_4_ = fVar303 * fVar303 + fVar300 * fVar300 + fVar375 * fVar375;
    auVar175._24_4_ = fVar21 * fVar21 + fVar20 * fVar20 + fVar376 * fVar376;
    auVar175._28_4_ = fVar211 + fVar211 + auVar395._28_4_;
    auVar105 = vrcpps_avx(auVar175);
    fVar235 = auVar105._0_4_;
    fVar260 = auVar105._4_4_;
    auVar39._4_4_ = fVar260 * auVar175._4_4_;
    auVar39._0_4_ = fVar235 * auVar175._0_4_;
    fVar262 = auVar105._8_4_;
    auVar39._8_4_ = fVar262 * auVar175._8_4_;
    fVar264 = auVar105._12_4_;
    auVar39._12_4_ = fVar264 * auVar175._12_4_;
    fVar291 = auVar105._16_4_;
    auVar39._16_4_ = fVar291 * auVar175._16_4_;
    fVar294 = auVar105._20_4_;
    auVar39._20_4_ = fVar294 * auVar175._20_4_;
    fVar297 = auVar105._24_4_;
    auVar39._24_4_ = fVar297 * auVar175._24_4_;
    auVar39._28_4_ = auVar354._28_4_;
    auVar392._8_4_ = 0x3f800000;
    auVar392._0_8_ = 0x3f8000003f800000;
    auVar392._12_4_ = 0x3f800000;
    auVar392._16_4_ = 0x3f800000;
    auVar392._20_4_ = 0x3f800000;
    auVar392._24_4_ = 0x3f800000;
    auVar392._28_4_ = 0x3f800000;
    auVar28 = vsubps_avx(auVar392,auVar39);
    fVar235 = auVar28._0_4_ * fVar235 + fVar235;
    fVar260 = auVar28._4_4_ * fVar260 + fVar260;
    fVar262 = auVar28._8_4_ * fVar262 + fVar262;
    fVar264 = auVar28._12_4_ * fVar264 + fVar264;
    fVar291 = auVar28._16_4_ * fVar291 + fVar291;
    fVar294 = auVar28._20_4_ * fVar294 + fVar294;
    fVar297 = auVar28._24_4_ * fVar297 + fVar297;
    auVar157 = vperm2f128_avx(auVar30,auVar30,1);
    auVar157 = vshufps_avx(auVar157,auVar30,0x30);
    auVar157 = vshufps_avx(auVar30,auVar157,0x29);
    auVar13 = vperm2f128_avx(auVar31,auVar31,1);
    auVar13 = vshufps_avx(auVar13,auVar31,0x30);
    local_780 = vshufps_avx(auVar31,auVar13,0x29);
    fVar389 = local_780._0_4_;
    fVar396 = local_780._4_4_;
    auVar40._4_4_ = fVar396 * fVar231;
    auVar40._0_4_ = fVar389 * fVar212;
    fVar397 = local_780._8_4_;
    auVar40._8_4_ = fVar397 * fVar259;
    fVar398 = local_780._12_4_;
    auVar40._12_4_ = fVar398 * fVar237;
    fVar399 = local_780._16_4_;
    auVar40._16_4_ = fVar399 * fVar266;
    fVar400 = local_780._20_4_;
    auVar40._20_4_ = fVar400 * fVar300;
    fVar401 = local_780._24_4_;
    auVar40._24_4_ = fVar401 * fVar20;
    auVar40._28_4_ = auVar13._28_4_;
    fVar214 = auVar157._0_4_;
    fVar234 = auVar157._4_4_;
    auVar41._4_4_ = fVar371 * fVar234;
    auVar41._0_4_ = fVar365 * fVar214;
    fVar263 = auVar157._8_4_;
    auVar41._8_4_ = fVar372 * fVar263;
    fVar241 = auVar157._12_4_;
    auVar41._12_4_ = fVar373 * fVar241;
    fVar269 = auVar157._16_4_;
    auVar41._16_4_ = fVar374 * fVar269;
    fVar377 = auVar157._20_4_;
    auVar41._20_4_ = fVar375 * fVar377;
    fVar22 = auVar157._24_4_;
    auVar41._24_4_ = fVar376 * fVar22;
    auVar41._28_4_ = fVar388;
    auVar13 = vsubps_avx(auVar41,auVar40);
    auVar157 = vperm2f128_avx(_local_ae0,_local_ae0,1);
    auVar157 = vshufps_avx(auVar157,_local_ae0,0x30);
    local_960 = vshufps_avx(_local_ae0,auVar157,0x29);
    fVar215 = local_960._0_4_;
    fVar236 = local_960._4_4_;
    auVar42._4_4_ = fVar371 * fVar236;
    auVar42._0_4_ = fVar365 * fVar215;
    fVar265 = local_960._8_4_;
    auVar42._8_4_ = fVar372 * fVar265;
    fVar258 = local_960._12_4_;
    auVar42._12_4_ = fVar373 * fVar258;
    fVar288 = local_960._16_4_;
    auVar42._16_4_ = fVar374 * fVar288;
    fVar388 = local_960._20_4_;
    auVar42._20_4_ = fVar375 * fVar388;
    fVar23 = local_960._24_4_;
    auVar42._24_4_ = fVar376 * fVar23;
    auVar42._28_4_ = auVar157._28_4_;
    auVar43._4_4_ = fVar396 * fVar232;
    auVar43._0_4_ = fVar389 * fVar213;
    auVar43._8_4_ = fVar397 * fVar261;
    auVar43._12_4_ = fVar398 * fVar239;
    auVar43._16_4_ = fVar399 * fVar268;
    auVar43._20_4_ = fVar400 * fVar303;
    uVar83 = local_780._28_4_;
    auVar43._24_4_ = fVar401 * fVar21;
    auVar43._28_4_ = uVar83;
    auVar157 = vsubps_avx(auVar43,auVar42);
    auVar44._4_4_ = fVar232 * fVar234;
    auVar44._0_4_ = fVar213 * fVar214;
    auVar44._8_4_ = fVar261 * fVar263;
    auVar44._12_4_ = fVar239 * fVar241;
    auVar44._16_4_ = fVar268 * fVar269;
    auVar44._20_4_ = fVar303 * fVar377;
    auVar44._24_4_ = fVar21 * fVar22;
    auVar44._28_4_ = uVar83;
    auVar45._4_4_ = fVar236 * fVar231;
    auVar45._0_4_ = fVar215 * fVar212;
    auVar45._8_4_ = fVar265 * fVar259;
    auVar45._12_4_ = fVar258 * fVar237;
    auVar45._16_4_ = fVar288 * fVar266;
    auVar45._20_4_ = fVar388 * fVar300;
    auVar45._24_4_ = fVar23 * fVar20;
    auVar45._28_4_ = auVar404._28_4_;
    auVar29 = vsubps_avx(auVar45,auVar44);
    auVar46._4_4_ =
         (auVar395._4_4_ * auVar395._4_4_ +
         auVar332._4_4_ * auVar332._4_4_ + auVar17._4_4_ * auVar17._4_4_) * fVar260;
    auVar46._0_4_ =
         (auVar395._0_4_ * auVar395._0_4_ +
         auVar332._0_4_ * auVar332._0_4_ + auVar17._0_4_ * auVar17._0_4_) * fVar235;
    auVar46._8_4_ =
         (auVar395._8_4_ * auVar395._8_4_ +
         auVar332._8_4_ * auVar332._8_4_ + auVar17._8_4_ * auVar17._8_4_) * fVar262;
    auVar46._12_4_ =
         (auVar395._12_4_ * auVar395._12_4_ +
         auVar332._12_4_ * auVar332._12_4_ + auVar17._12_4_ * auVar17._12_4_) * fVar264;
    auVar46._16_4_ =
         (auVar395._16_4_ * auVar395._16_4_ +
         auVar332._16_4_ * auVar332._16_4_ + auVar17._16_4_ * auVar17._16_4_) * fVar291;
    auVar46._20_4_ =
         (auVar395._20_4_ * auVar395._20_4_ +
         auVar332._20_4_ * auVar332._20_4_ + auVar17._20_4_ * auVar17._20_4_) * fVar294;
    auVar46._24_4_ =
         (auVar395._24_4_ * auVar395._24_4_ +
         auVar332._24_4_ * auVar332._24_4_ + auVar17._24_4_ * auVar17._24_4_) * fVar297;
    auVar46._28_4_ = auVar395._28_4_ + auVar332._28_4_ + fVar211;
    auVar47._4_4_ =
         (auVar13._4_4_ * auVar13._4_4_ +
         auVar157._4_4_ * auVar157._4_4_ + auVar29._4_4_ * auVar29._4_4_) * fVar260;
    auVar47._0_4_ =
         (auVar13._0_4_ * auVar13._0_4_ +
         auVar157._0_4_ * auVar157._0_4_ + auVar29._0_4_ * auVar29._0_4_) * fVar235;
    auVar47._8_4_ =
         (auVar13._8_4_ * auVar13._8_4_ +
         auVar157._8_4_ * auVar157._8_4_ + auVar29._8_4_ * auVar29._8_4_) * fVar262;
    auVar47._12_4_ =
         (auVar13._12_4_ * auVar13._12_4_ +
         auVar157._12_4_ * auVar157._12_4_ + auVar29._12_4_ * auVar29._12_4_) * fVar264;
    auVar47._16_4_ =
         (auVar13._16_4_ * auVar13._16_4_ +
         auVar157._16_4_ * auVar157._16_4_ + auVar29._16_4_ * auVar29._16_4_) * fVar291;
    auVar47._20_4_ =
         (auVar13._20_4_ * auVar13._20_4_ +
         auVar157._20_4_ * auVar157._20_4_ + auVar29._20_4_ * auVar29._20_4_) * fVar294;
    auVar47._24_4_ =
         (auVar13._24_4_ * auVar13._24_4_ +
         auVar157._24_4_ * auVar157._24_4_ + auVar29._24_4_ * auVar29._24_4_) * fVar297;
    auVar47._28_4_ = auVar28._28_4_ + auVar105._28_4_;
    auVar105 = vmaxps_avx(auVar46,auVar47);
    auVar157 = vperm2f128_avx(local_7e0,local_7e0,1);
    auVar157 = vshufps_avx(auVar157,local_7e0,0x30);
    auVar395 = vshufps_avx(local_7e0,auVar157,0x29);
    auVar110._0_4_ = (float)local_7e0._0_4_ + fVar217;
    auVar110._4_4_ = local_7e0._4_4_ + fVar238;
    auVar110._8_4_ = local_7e0._8_4_ + fVar257;
    auVar110._12_4_ = local_7e0._12_4_ + fVar233;
    auVar110._16_4_ = local_7e0._16_4_ + fVar216;
    auVar110._20_4_ = local_7e0._20_4_ + fVar230;
    auVar110._24_4_ = local_7e0._24_4_ + fVar240;
    auVar110._28_4_ = local_7e0._28_4_ + fVar267;
    auVar157 = vmaxps_avx(local_7e0,auVar110);
    auVar13 = vmaxps_avx(auVar14,auVar395);
    auVar157 = vmaxps_avx(auVar157,auVar13);
    auVar13 = vrsqrtps_avx(auVar175);
    fVar211 = auVar13._0_4_;
    fVar216 = auVar13._4_4_;
    fVar217 = auVar13._8_4_;
    fVar230 = auVar13._12_4_;
    fVar238 = auVar13._16_4_;
    fVar240 = auVar13._20_4_;
    fVar257 = auVar13._24_4_;
    local_3a0 = fVar211 * 1.5 + fVar211 * fVar211 * fVar211 * auVar175._0_4_ * -0.5;
    fStack_39c = fVar216 * 1.5 + fVar216 * fVar216 * fVar216 * auVar175._4_4_ * -0.5;
    fStack_398 = fVar217 * 1.5 + fVar217 * fVar217 * fVar217 * auVar175._8_4_ * -0.5;
    fStack_394 = fVar230 * 1.5 + fVar230 * fVar230 * fVar230 * auVar175._12_4_ * -0.5;
    fStack_390 = fVar238 * 1.5 + fVar238 * fVar238 * fVar238 * auVar175._16_4_ * -0.5;
    fStack_38c = fVar240 * 1.5 + fVar240 * fVar240 * fVar240 * auVar175._20_4_ * -0.5;
    fStack_388 = fVar257 * 1.5 + fVar257 * fVar257 * fVar257 * auVar175._24_4_ * -0.5;
    auVar332 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar17 = vsubps_avx(auVar332,auVar404);
    auVar28 = vsubps_avx(auVar332,auVar410);
    fVar216 = auVar28._0_4_;
    fVar238 = auVar28._4_4_;
    fVar267 = auVar28._8_4_;
    fVar260 = auVar28._12_4_;
    fVar291 = auVar28._16_4_;
    fVar408 = auVar28._20_4_;
    fVar24 = auVar28._24_4_;
    fVar217 = auVar17._0_4_;
    fVar240 = auVar17._4_4_;
    fVar233 = auVar17._8_4_;
    fVar262 = auVar17._12_4_;
    fVar294 = auVar17._16_4_;
    fVar409 = auVar17._20_4_;
    fVar25 = auVar17._24_4_;
    auVar111 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar106 = vsubps_avx(auVar111,auVar391);
    fVar230 = auVar106._0_4_;
    fVar257 = auVar106._4_4_;
    fVar235 = auVar106._8_4_;
    fVar264 = auVar106._12_4_;
    fVar297 = auVar106._16_4_;
    fVar19 = auVar106._20_4_;
    fVar26 = auVar106._24_4_;
    auVar393._0_4_ =
         (float)local_a40._0_4_ * fVar230 +
         (float)local_800._0_4_ * fVar217 + (float)local_900._0_4_ * fVar216;
    auVar393._4_4_ =
         (float)local_a40._4_4_ * fVar257 +
         (float)local_800._4_4_ * fVar240 + (float)local_900._4_4_ * fVar238;
    auVar393._8_4_ = fStack_a38 * fVar235 + fStack_7f8 * fVar233 + fStack_8f8 * fVar267;
    auVar393._12_4_ = fStack_a34 * fVar264 + fStack_7f4 * fVar262 + fStack_8f4 * fVar260;
    auVar393._16_4_ = fStack_a30 * fVar297 + fStack_7f0 * fVar294 + fStack_8f0 * fVar291;
    auVar393._20_4_ = fStack_a2c * fVar19 + fStack_7ec * fVar409 + fStack_8ec * fVar408;
    auVar393._24_4_ = fStack_a28 * fVar26 + fStack_7e8 * fVar25 + fStack_8e8 * fVar24;
    auVar393._28_4_ = auVar404._28_4_ + auVar29._28_4_ + 1.5;
    auVar405._0_4_ = fVar230 * fVar230 + fVar217 * fVar217 + fVar216 * fVar216;
    auVar405._4_4_ = fVar257 * fVar257 + fVar240 * fVar240 + fVar238 * fVar238;
    auVar405._8_4_ = fVar235 * fVar235 + fVar233 * fVar233 + fVar267 * fVar267;
    auVar405._12_4_ = fVar264 * fVar264 + fVar262 * fVar262 + fVar260 * fVar260;
    auVar405._16_4_ = fVar297 * fVar297 + fVar294 * fVar294 + fVar291 * fVar291;
    auVar405._20_4_ = fVar19 * fVar19 + fVar409 * fVar409 + fVar408 * fVar408;
    auVar405._24_4_ = fVar26 * fVar26 + fVar25 * fVar25 + fVar24 * fVar24;
    auVar405._28_4_ = auVar410._28_4_ + auVar410._28_4_ + auVar404._28_4_;
    fVar337 = (float)local_a40._0_4_ * fVar213 * local_3a0 +
              local_3a0 * fVar212 * (float)local_800._0_4_ +
              fVar365 * local_3a0 * (float)local_900._0_4_;
    fVar342 = (float)local_a40._4_4_ * fVar232 * fStack_39c +
              fStack_39c * fVar231 * (float)local_800._4_4_ +
              fVar371 * fStack_39c * (float)local_900._4_4_;
    fVar343 = fStack_a38 * fVar261 * fStack_398 +
              fStack_398 * fVar259 * fStack_7f8 + fVar372 * fStack_398 * fStack_8f8;
    fVar344 = fStack_a34 * fVar239 * fStack_394 +
              fStack_394 * fVar237 * fStack_7f4 + fVar373 * fStack_394 * fStack_8f4;
    fVar345 = fStack_a30 * fVar268 * fStack_390 +
              fStack_390 * fVar266 * fStack_7f0 + fVar374 * fStack_390 * fStack_8f0;
    fVar347 = fStack_a2c * fVar303 * fStack_38c +
              fStack_38c * fVar300 * fStack_7ec + fVar375 * fStack_38c * fStack_8ec;
    fVar349 = fStack_a28 * fVar21 * fStack_388 +
              fStack_388 * fVar20 * fStack_7e8 + fVar376 * fStack_388 * fStack_8e8;
    fVar211 = fStack_a24 + fStack_7e4 + fStack_8e4;
    fVar351 = fVar230 * fVar213 * local_3a0 +
              local_3a0 * fVar212 * fVar217 + fVar365 * local_3a0 * fVar216;
    fVar358 = fVar257 * fVar232 * fStack_39c +
              fStack_39c * fVar231 * fVar240 + fVar371 * fStack_39c * fVar238;
    fVar359 = fVar235 * fVar261 * fStack_398 +
              fStack_398 * fVar259 * fVar233 + fVar372 * fStack_398 * fVar267;
    fVar360 = fVar264 * fVar239 * fStack_394 +
              fStack_394 * fVar237 * fVar262 + fVar373 * fStack_394 * fVar260;
    fVar361 = fVar297 * fVar268 * fStack_390 +
              fStack_390 * fVar266 * fVar294 + fVar374 * fStack_390 * fVar291;
    fVar362 = fVar19 * fVar303 * fStack_38c +
              fStack_38c * fVar300 * fVar409 + fVar375 * fStack_38c * fVar408;
    fVar363 = fVar26 * fVar21 * fStack_388 +
              fStack_388 * fVar20 * fVar25 + fVar376 * fStack_388 * fVar24;
    fVar364 = fStack_7e4 + fVar211;
    auVar48._4_4_ = fVar342 * fVar358;
    auVar48._0_4_ = fVar337 * fVar351;
    auVar48._8_4_ = fVar343 * fVar359;
    auVar48._12_4_ = fVar344 * fVar360;
    auVar48._16_4_ = fVar345 * fVar361;
    auVar48._20_4_ = fVar347 * fVar362;
    auVar48._24_4_ = fVar349 * fVar363;
    auVar48._28_4_ = fVar211;
    auVar29 = vsubps_avx(auVar393,auVar48);
    auVar49._4_4_ = fVar358 * fVar358;
    auVar49._0_4_ = fVar351 * fVar351;
    auVar49._8_4_ = fVar359 * fVar359;
    auVar49._12_4_ = fVar360 * fVar360;
    auVar49._16_4_ = fVar361 * fVar361;
    auVar49._20_4_ = fVar362 * fVar362;
    auVar49._24_4_ = fVar363 * fVar363;
    auVar49._28_4_ = fStack_7e4;
    auVar107 = vsubps_avx(auVar405,auVar49);
    auVar332 = vsqrtps_avx(auVar105);
    fVar211 = (auVar332._0_4_ + auVar157._0_4_) * 1.0000002;
    fVar124 = (auVar332._4_4_ + auVar157._4_4_) * 1.0000002;
    fVar126 = (auVar332._8_4_ + auVar157._8_4_) * 1.0000002;
    fVar128 = (auVar332._12_4_ + auVar157._12_4_) * 1.0000002;
    fVar129 = (auVar332._16_4_ + auVar157._16_4_) * 1.0000002;
    fVar130 = (auVar332._20_4_ + auVar157._20_4_) * 1.0000002;
    fVar131 = (auVar332._24_4_ + auVar157._24_4_) * 1.0000002;
    auVar50._4_4_ = fVar124 * fVar124;
    auVar50._0_4_ = fVar211 * fVar211;
    auVar50._8_4_ = fVar126 * fVar126;
    auVar50._12_4_ = fVar128 * fVar128;
    auVar50._16_4_ = fVar129 * fVar129;
    auVar50._20_4_ = fVar130 * fVar130;
    auVar50._24_4_ = fVar131 * fVar131;
    auVar50._28_4_ = auVar332._28_4_ + auVar157._28_4_;
    fVar124 = auVar29._0_4_ + auVar29._0_4_;
    fVar126 = auVar29._4_4_ + auVar29._4_4_;
    local_920._0_8_ = CONCAT44(fVar126,fVar124);
    local_920._8_4_ = auVar29._8_4_ + auVar29._8_4_;
    local_920._12_4_ = auVar29._12_4_ + auVar29._12_4_;
    local_920._16_4_ = auVar29._16_4_ + auVar29._16_4_;
    local_920._20_4_ = auVar29._20_4_ + auVar29._20_4_;
    local_920._24_4_ = auVar29._24_4_ + auVar29._24_4_;
    fVar211 = auVar29._28_4_;
    local_920._28_4_ = fVar211 + fVar211;
    auVar157 = vsubps_avx(auVar107,auVar50);
    local_3c0._4_4_ = fVar342 * fVar342;
    local_3c0._0_4_ = fVar337 * fVar337;
    local_3c0._8_4_ = fVar343 * fVar343;
    local_3c0._12_4_ = fVar344 * fVar344;
    local_3c0._16_4_ = fVar345 * fVar345;
    local_3c0._20_4_ = fVar347 * fVar347;
    local_3c0._24_4_ = fVar349 * fVar349;
    local_3c0._28_4_ = auVar107._28_4_;
    local_500 = vsubps_avx(local_2a0,local_3c0);
    auVar51._4_4_ = fVar126 * fVar126;
    auVar51._0_4_ = fVar124 * fVar124;
    auVar51._8_4_ = local_920._8_4_ * local_920._8_4_;
    auVar51._12_4_ = local_920._12_4_ * local_920._12_4_;
    auVar51._16_4_ = local_920._16_4_ * local_920._16_4_;
    auVar51._20_4_ = local_920._20_4_ * local_920._20_4_;
    auVar51._24_4_ = local_920._24_4_ * local_920._24_4_;
    auVar51._28_4_ = fVar211;
    fVar128 = local_500._0_4_;
    fVar129 = local_500._4_4_;
    fVar130 = local_500._8_4_;
    fVar131 = local_500._12_4_;
    fVar346 = local_500._16_4_;
    fVar348 = local_500._20_4_;
    fVar350 = local_500._24_4_;
    auVar52._4_4_ = auVar157._4_4_ * fVar129 * 4.0;
    auVar52._0_4_ = auVar157._0_4_ * fVar128 * 4.0;
    auVar52._8_4_ = auVar157._8_4_ * fVar130 * 4.0;
    auVar52._12_4_ = auVar157._12_4_ * fVar131 * 4.0;
    auVar52._16_4_ = auVar157._16_4_ * fVar346 * 4.0;
    auVar52._20_4_ = auVar157._20_4_ * fVar348 * 4.0;
    auVar52._24_4_ = auVar157._24_4_ * fVar350 * 4.0;
    auVar52._28_4_ = 0x40800000;
    auVar29 = vsubps_avx(auVar51,auVar52);
    auVar105 = vcmpps_avx(auVar29,auVar111,5);
    fVar211 = local_500._28_4_;
    if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar105 >> 0x7f,0) == '\0') &&
          (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar105 >> 0xbf,0) == '\0') &&
        (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar105[0x1f])
    {
      auVar333._8_4_ = 0x7f800000;
      auVar333._0_8_ = 0x7f8000007f800000;
      auVar333._12_4_ = 0x7f800000;
      auVar333._16_4_ = 0x7f800000;
      auVar333._20_4_ = 0x7f800000;
      auVar333._24_4_ = 0x7f800000;
      auVar333._28_4_ = 0x7f800000;
      auVar406._8_4_ = 0xff800000;
      auVar406._0_8_ = 0xff800000ff800000;
      auVar406._12_4_ = 0xff800000;
      auVar406._16_4_ = 0xff800000;
      auVar406._20_4_ = 0xff800000;
      auVar406._24_4_ = 0xff800000;
      auVar406._28_4_ = 0xff800000;
    }
    else {
      auVar111 = vcmpps_avx(auVar29,auVar111,5);
      auVar145 = vsqrtps_avx(auVar29);
      auVar280._0_4_ = fVar128 + fVar128;
      auVar280._4_4_ = fVar129 + fVar129;
      auVar280._8_4_ = fVar130 + fVar130;
      auVar280._12_4_ = fVar131 + fVar131;
      auVar280._16_4_ = fVar346 + fVar346;
      auVar280._20_4_ = fVar348 + fVar348;
      auVar280._24_4_ = fVar350 + fVar350;
      auVar280._28_4_ = fVar211 + fVar211;
      auVar29 = vrcpps_avx(auVar280);
      fVar271 = auVar29._0_4_;
      fVar290 = auVar29._4_4_;
      auVar53._4_4_ = auVar280._4_4_ * fVar290;
      auVar53._0_4_ = auVar280._0_4_ * fVar271;
      fVar293 = auVar29._8_4_;
      auVar53._8_4_ = auVar280._8_4_ * fVar293;
      fVar296 = auVar29._12_4_;
      auVar53._12_4_ = auVar280._12_4_ * fVar296;
      fVar299 = auVar29._16_4_;
      auVar53._16_4_ = auVar280._16_4_ * fVar299;
      fVar302 = auVar29._20_4_;
      auVar53._20_4_ = auVar280._20_4_ * fVar302;
      fVar305 = auVar29._24_4_;
      auVar53._24_4_ = auVar280._24_4_ * fVar305;
      auVar53._28_4_ = auVar280._28_4_;
      auVar334._8_4_ = 0x3f800000;
      auVar334._0_8_ = 0x3f8000003f800000;
      auVar334._12_4_ = 0x3f800000;
      auVar334._16_4_ = 0x3f800000;
      auVar334._20_4_ = 0x3f800000;
      auVar334._24_4_ = 0x3f800000;
      auVar334._28_4_ = 0x3f800000;
      auVar146 = vsubps_avx(auVar334,auVar53);
      fVar271 = fVar271 + fVar271 * auVar146._0_4_;
      fVar290 = fVar290 + fVar290 * auVar146._4_4_;
      fVar293 = fVar293 + fVar293 * auVar146._8_4_;
      fVar296 = fVar296 + fVar296 * auVar146._12_4_;
      fVar299 = fVar299 + fVar299 * auVar146._16_4_;
      fVar302 = fVar302 + fVar302 * auVar146._20_4_;
      fVar305 = fVar305 + fVar305 * auVar146._24_4_;
      auVar314._0_8_ = CONCAT44(fVar126,fVar124) ^ 0x8000000080000000;
      auVar314._8_4_ = -local_920._8_4_;
      auVar314._12_4_ = -local_920._12_4_;
      auVar314._16_4_ = -local_920._16_4_;
      auVar314._20_4_ = -local_920._20_4_;
      auVar314._24_4_ = -local_920._24_4_;
      auVar314._28_4_ = -local_920._28_4_;
      auVar147 = vsubps_avx(auVar314,auVar145);
      fVar124 = auVar147._0_4_ * fVar271;
      fVar126 = auVar147._4_4_ * fVar290;
      auVar54._4_4_ = fVar126;
      auVar54._0_4_ = fVar124;
      fVar319 = auVar147._8_4_ * fVar293;
      auVar54._8_4_ = fVar319;
      fVar321 = auVar147._12_4_ * fVar296;
      auVar54._12_4_ = fVar321;
      fVar323 = auVar147._16_4_ * fVar299;
      auVar54._16_4_ = fVar323;
      fVar325 = auVar147._20_4_ * fVar302;
      auVar54._20_4_ = fVar325;
      fVar327 = auVar147._24_4_ * fVar305;
      auVar54._24_4_ = fVar327;
      auVar54._28_4_ = auVar147._28_4_;
      auVar145 = vsubps_avx(auVar145,local_920);
      fVar271 = auVar145._0_4_ * fVar271;
      fVar290 = auVar145._4_4_ * fVar290;
      auVar55._4_4_ = fVar290;
      auVar55._0_4_ = fVar271;
      fVar293 = auVar145._8_4_ * fVar293;
      auVar55._8_4_ = fVar293;
      fVar296 = auVar145._12_4_ * fVar296;
      auVar55._12_4_ = fVar296;
      fVar299 = auVar145._16_4_ * fVar299;
      auVar55._16_4_ = fVar299;
      fVar302 = auVar145._20_4_ * fVar302;
      auVar55._20_4_ = fVar302;
      fVar305 = auVar145._24_4_ * fVar305;
      auVar55._24_4_ = fVar305;
      auVar55._28_4_ = auVar145._28_4_;
      local_360 = local_3a0 * (fVar351 + fVar337 * fVar124);
      fStack_35c = fStack_39c * (fVar358 + fVar342 * fVar126);
      fStack_358 = fStack_398 * (fVar359 + fVar343 * fVar319);
      fStack_354 = fStack_394 * (fVar360 + fVar344 * fVar321);
      fStack_350 = fStack_390 * (fVar361 + fVar345 * fVar323);
      fStack_34c = fStack_38c * (fVar362 + fVar347 * fVar325);
      fStack_348 = fStack_388 * (fVar363 + fVar349 * fVar327);
      fStack_344 = fVar364 + auVar29._28_4_ + auVar146._28_4_;
      auVar281._8_4_ = 0x7fffffff;
      auVar281._0_8_ = 0x7fffffff7fffffff;
      auVar281._12_4_ = 0x7fffffff;
      auVar281._16_4_ = 0x7fffffff;
      auVar281._20_4_ = 0x7fffffff;
      auVar281._24_4_ = 0x7fffffff;
      auVar281._28_4_ = 0x7fffffff;
      auVar29 = vandps_avx(local_3c0,auVar281);
      auVar145 = vmaxps_avx(local_4a0,auVar29);
      auVar56._4_4_ = auVar145._4_4_ * 1.9073486e-06;
      auVar56._0_4_ = auVar145._0_4_ * 1.9073486e-06;
      auVar56._8_4_ = auVar145._8_4_ * 1.9073486e-06;
      auVar56._12_4_ = auVar145._12_4_ * 1.9073486e-06;
      auVar56._16_4_ = auVar145._16_4_ * 1.9073486e-06;
      auVar56._20_4_ = auVar145._20_4_ * 1.9073486e-06;
      auVar56._24_4_ = auVar145._24_4_ * 1.9073486e-06;
      auVar56._28_4_ = auVar145._28_4_;
      auVar29 = vandps_avx(local_500,auVar281);
      auVar29 = vcmpps_avx(auVar29,auVar56,1);
      auVar335._8_4_ = 0x7f800000;
      auVar335._0_8_ = 0x7f8000007f800000;
      auVar335._12_4_ = 0x7f800000;
      auVar335._16_4_ = 0x7f800000;
      auVar335._20_4_ = 0x7f800000;
      auVar335._24_4_ = 0x7f800000;
      auVar335._28_4_ = 0x7f800000;
      auVar333 = vblendvps_avx(auVar335,auVar54,auVar111);
      local_380 = local_3a0 * (fVar351 + fVar337 * fVar271);
      fStack_37c = fStack_39c * (fVar358 + fVar342 * fVar290);
      fStack_378 = fStack_398 * (fVar359 + fVar343 * fVar293);
      fStack_374 = fStack_394 * (fVar360 + fVar344 * fVar296);
      fStack_370 = fStack_390 * (fVar361 + fVar345 * fVar299);
      fStack_36c = fStack_38c * (fVar362 + fVar347 * fVar302);
      fStack_368 = fStack_388 * (fVar363 + fVar349 * fVar305);
      fStack_364 = fVar364 + auVar145._28_4_;
      auVar282._8_4_ = 0xff800000;
      auVar282._0_8_ = 0xff800000ff800000;
      auVar282._12_4_ = 0xff800000;
      auVar282._16_4_ = 0xff800000;
      auVar282._20_4_ = 0xff800000;
      auVar282._24_4_ = 0xff800000;
      auVar282._28_4_ = 0xff800000;
      auVar406 = vblendvps_avx(auVar282,auVar55,auVar111);
      auVar145 = auVar111 & auVar29;
      if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar145 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar145 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar145 >> 0x7f,0) != '\0') ||
            (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar145 >> 0xbf,0) != '\0') ||
          (auVar145 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar145[0x1f] < '\0') {
        auVar105 = vandps_avx(auVar29,auVar111);
        auVar97 = vpackssdw_avx(auVar105._0_16_,auVar105._16_16_);
        auVar29 = vcmpps_avx(auVar157,ZEXT832(0) << 0x20,2);
        auVar394._8_4_ = 0xff800000;
        auVar394._0_8_ = 0xff800000ff800000;
        auVar394._12_4_ = 0xff800000;
        auVar394._16_4_ = 0xff800000;
        auVar394._20_4_ = 0xff800000;
        auVar394._24_4_ = 0xff800000;
        auVar394._28_4_ = 0xff800000;
        auVar412._8_4_ = 0x7f800000;
        auVar412._0_8_ = 0x7f8000007f800000;
        auVar412._12_4_ = 0x7f800000;
        auVar412._16_4_ = 0x7f800000;
        auVar412._20_4_ = 0x7f800000;
        auVar412._24_4_ = 0x7f800000;
        auVar412._28_4_ = 0x7f800000;
        auVar157 = vblendvps_avx(auVar412,auVar394,auVar29);
        auVar169 = vpmovsxwd_avx(auVar97);
        auVar97 = vpunpckhwd_avx(auVar97,auVar97);
        auVar256._16_16_ = auVar97;
        auVar256._0_16_ = auVar169;
        auVar333 = vblendvps_avx(auVar333,auVar157,auVar256);
        auVar157 = vblendvps_avx(auVar394,auVar412,auVar29);
        auVar406 = vblendvps_avx(auVar406,auVar157,auVar256);
        auVar157 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar120._0_4_ = auVar105._0_4_ ^ auVar157._0_4_;
        auVar120._4_4_ = auVar105._4_4_ ^ auVar157._4_4_;
        auVar120._8_4_ = auVar105._8_4_ ^ auVar157._8_4_;
        auVar120._12_4_ = auVar105._12_4_ ^ auVar157._12_4_;
        auVar120._16_4_ = auVar105._16_4_ ^ auVar157._16_4_;
        auVar120._20_4_ = auVar105._20_4_ ^ auVar157._20_4_;
        auVar120._24_4_ = auVar105._24_4_ ^ auVar157._24_4_;
        auVar120._28_4_ = auVar105._28_4_ ^ auVar157._28_4_;
        auVar105 = vorps_avx(auVar29,auVar120);
        auVar105 = vandps_avx(auVar111,auVar105);
      }
    }
    auVar414 = ZEXT3264(local_a20);
    auVar157 = local_460 & auVar105;
    auVar287 = ZEXT3264(local_a80);
    if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar157 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar157 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar157 >> 0x7f,0) == '\0') &&
          (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar157 >> 0xbf,0) == '\0') &&
        (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar157[0x1f])
    {
      auVar370 = ZEXT3264(local_a00);
    }
    else {
      fStack_384 = auVar13._28_4_ + auVar175._28_4_;
      fVar124 = *(float *)(ray + k * 4 + 0x100);
      auVar97 = vshufps_avx(ZEXT416((uint)(fVar124 - (float)local_8a0._0_4_)),
                            ZEXT416((uint)(fVar124 - (float)local_8a0._0_4_)),0);
      auVar251._16_16_ = auVar97;
      auVar251._0_16_ = auVar97;
      auVar29 = vminps_avx(auVar251,auVar406);
      fVar305 = auVar28._28_4_;
      auVar149._0_4_ =
           (float)local_a40._0_4_ * fVar270 +
           (float)local_800._0_4_ * fVar306 + (float)local_900._0_4_ * fVar378;
      auVar149._4_4_ =
           (float)local_a40._4_4_ * fVar289 +
           (float)local_800._4_4_ * fVar317 + (float)local_900._4_4_ * fVar381;
      auVar149._8_4_ = fStack_a38 * fVar292 + fStack_7f8 * fVar318 + fStack_8f8 * fVar382;
      auVar149._12_4_ = fStack_a34 * fVar295 + fStack_7f4 * fVar320 + fStack_8f4 * fVar384;
      auVar149._16_4_ = fStack_a30 * fVar298 + fStack_7f0 * fVar322 + fStack_8f0 * fVar385;
      auVar149._20_4_ = fStack_a2c * fVar301 + fStack_7ec * fVar324 + fStack_8ec * fVar386;
      auVar149._24_4_ = fStack_a28 * fVar304 + fStack_7e8 * fVar326 + fStack_8e8 * fVar387;
      auVar149._28_4_ = fVar305 + auVar313._28_4_ + fVar305;
      auVar157 = vrcpps_avx(auVar149);
      fVar126 = auVar157._0_4_;
      fVar271 = auVar157._4_4_;
      auVar57._4_4_ = auVar149._4_4_ * fVar271;
      auVar57._0_4_ = auVar149._0_4_ * fVar126;
      fVar290 = auVar157._8_4_;
      auVar57._8_4_ = auVar149._8_4_ * fVar290;
      fVar293 = auVar157._12_4_;
      auVar57._12_4_ = auVar149._12_4_ * fVar293;
      fVar296 = auVar157._16_4_;
      auVar57._16_4_ = auVar149._16_4_ * fVar296;
      fVar299 = auVar157._20_4_;
      auVar57._20_4_ = auVar149._20_4_ * fVar299;
      fVar302 = auVar157._24_4_;
      auVar57._24_4_ = auVar149._24_4_ * fVar302;
      auVar57._28_4_ = auVar106._28_4_;
      auVar355._8_4_ = 0x3f800000;
      auVar355._0_8_ = 0x3f8000003f800000;
      auVar355._12_4_ = 0x3f800000;
      auVar355._16_4_ = 0x3f800000;
      auVar355._20_4_ = 0x3f800000;
      auVar355._24_4_ = 0x3f800000;
      auVar355._28_4_ = 0x3f800000;
      auVar28 = vsubps_avx(auVar355,auVar57);
      auVar315._8_4_ = 0x7fffffff;
      auVar315._0_8_ = 0x7fffffff7fffffff;
      auVar315._12_4_ = 0x7fffffff;
      auVar315._16_4_ = 0x7fffffff;
      auVar315._20_4_ = 0x7fffffff;
      auVar315._24_4_ = 0x7fffffff;
      auVar315._28_4_ = 0x7fffffff;
      auVar157 = vandps_avx(auVar149,auVar315);
      auVar341._8_4_ = 0x219392ef;
      auVar341._0_8_ = 0x219392ef219392ef;
      auVar341._12_4_ = 0x219392ef;
      auVar341._16_4_ = 0x219392ef;
      auVar341._20_4_ = 0x219392ef;
      auVar341._24_4_ = 0x219392ef;
      auVar341._28_4_ = 0x219392ef;
      auVar13 = vcmpps_avx(auVar157,auVar341,1);
      auVar58._4_4_ =
           (fVar271 + fVar271 * auVar28._4_4_) *
           -(fVar257 * fVar289 + fVar240 * fVar317 + fVar238 * fVar381);
      auVar58._0_4_ =
           (fVar126 + fVar126 * auVar28._0_4_) *
           -(fVar230 * fVar270 + fVar217 * fVar306 + fVar216 * fVar378);
      auVar58._8_4_ =
           (fVar290 + fVar290 * auVar28._8_4_) *
           -(fVar235 * fVar292 + fVar233 * fVar318 + fVar267 * fVar382);
      auVar58._12_4_ =
           (fVar293 + fVar293 * auVar28._12_4_) *
           -(fVar264 * fVar295 + fVar262 * fVar320 + fVar260 * fVar384);
      auVar58._16_4_ =
           (fVar296 + fVar296 * auVar28._16_4_) *
           -(fVar297 * fVar298 + fVar294 * fVar322 + fVar291 * fVar385);
      auVar58._20_4_ =
           (fVar299 + fVar299 * auVar28._20_4_) *
           -(fVar19 * fVar301 + fVar409 * fVar324 + fVar408 * fVar386);
      auVar58._24_4_ =
           (fVar302 + fVar302 * auVar28._24_4_) *
           -(fVar26 * fVar304 + fVar25 * fVar326 + fVar24 * fVar387);
      auVar58._28_4_ = -(fVar305 + auVar17._28_4_ + fVar305);
      auVar97 = ZEXT816(0) << 0x40;
      auVar157 = vcmpps_avx(auVar149,ZEXT1632(auVar97),1);
      auVar157 = vorps_avx(auVar13,auVar157);
      auVar336._8_4_ = 0xff800000;
      auVar336._0_8_ = 0xff800000ff800000;
      auVar336._12_4_ = 0xff800000;
      auVar336._16_4_ = 0xff800000;
      auVar336._20_4_ = 0xff800000;
      auVar336._24_4_ = 0xff800000;
      auVar336._28_4_ = 0xff800000;
      auVar157 = vblendvps_avx(auVar58,auVar336,auVar157);
      auVar17 = vcmpps_avx(auVar149,ZEXT1632(auVar97),6);
      auVar13 = vorps_avx(auVar13,auVar17);
      auVar369._8_4_ = 0x7f800000;
      auVar369._0_8_ = 0x7f8000007f800000;
      auVar369._12_4_ = 0x7f800000;
      auVar369._16_4_ = 0x7f800000;
      auVar369._20_4_ = 0x7f800000;
      auVar369._24_4_ = 0x7f800000;
      auVar369._28_4_ = 0x7f800000;
      auVar13 = vblendvps_avx(auVar58,auVar369,auVar13);
      auVar17 = vmaxps_avx(local_320,auVar333);
      auVar17 = vmaxps_avx(auVar17,auVar157);
      auVar28 = vminps_avx(auVar29,auVar13);
      auVar111 = ZEXT1632(auVar97);
      auVar157 = vsubps_avx(auVar111,local_aa0);
      auVar13 = vsubps_avx(auVar111,local_ac0);
      auVar59._4_4_ = auVar13._4_4_ * -fVar396;
      auVar59._0_4_ = auVar13._0_4_ * -fVar389;
      auVar59._8_4_ = auVar13._8_4_ * -fVar397;
      auVar59._12_4_ = auVar13._12_4_ * -fVar398;
      auVar59._16_4_ = auVar13._16_4_ * -fVar399;
      auVar59._20_4_ = auVar13._20_4_ * -fVar400;
      auVar59._24_4_ = auVar13._24_4_ * -fVar401;
      auVar59._28_4_ = auVar13._28_4_;
      auVar60._4_4_ = fVar234 * auVar157._4_4_;
      auVar60._0_4_ = fVar214 * auVar157._0_4_;
      auVar60._8_4_ = fVar263 * auVar157._8_4_;
      auVar60._12_4_ = fVar241 * auVar157._12_4_;
      auVar60._16_4_ = fVar269 * auVar157._16_4_;
      auVar60._20_4_ = fVar377 * auVar157._20_4_;
      auVar60._24_4_ = fVar22 * auVar157._24_4_;
      auVar60._28_4_ = auVar157._28_4_;
      auVar157 = vsubps_avx(auVar59,auVar60);
      auVar13 = vsubps_avx(auVar111,auVar15);
      auVar61._4_4_ = fVar236 * auVar13._4_4_;
      auVar61._0_4_ = fVar215 * auVar13._0_4_;
      auVar61._8_4_ = fVar265 * auVar13._8_4_;
      auVar61._12_4_ = fVar258 * auVar13._12_4_;
      auVar61._16_4_ = fVar288 * auVar13._16_4_;
      auVar61._20_4_ = fVar388 * auVar13._20_4_;
      uVar2 = auVar13._28_4_;
      auVar61._24_4_ = fVar23 * auVar13._24_4_;
      auVar61._28_4_ = uVar2;
      auVar15 = vsubps_avx(auVar157,auVar61);
      auVar62._4_4_ = (float)local_900._4_4_ * -fVar396;
      auVar62._0_4_ = (float)local_900._0_4_ * -fVar389;
      auVar62._8_4_ = fStack_8f8 * -fVar397;
      auVar62._12_4_ = fStack_8f4 * -fVar398;
      auVar62._16_4_ = fStack_8f0 * -fVar399;
      auVar62._20_4_ = fStack_8ec * -fVar400;
      auVar62._24_4_ = fStack_8e8 * -fVar401;
      auVar62._28_4_ = uVar83 ^ 0x80000000;
      auVar63._4_4_ = (float)local_800._4_4_ * fVar234;
      auVar63._0_4_ = (float)local_800._0_4_ * fVar214;
      auVar63._8_4_ = fStack_7f8 * fVar263;
      auVar63._12_4_ = fStack_7f4 * fVar241;
      auVar63._16_4_ = fStack_7f0 * fVar269;
      auVar63._20_4_ = fStack_7ec * fVar377;
      auVar63._24_4_ = fStack_7e8 * fVar22;
      auVar63._28_4_ = uVar2;
      auVar411._8_4_ = 0x3f800000;
      auVar411._0_8_ = 0x3f8000003f800000;
      auVar411._12_4_ = 0x3f800000;
      auVar411._16_4_ = 0x3f800000;
      auVar411._20_4_ = 0x3f800000;
      auVar411._24_4_ = 0x3f800000;
      auVar411._28_4_ = 0x3f800000;
      auVar157 = vsubps_avx(auVar62,auVar63);
      auVar64._4_4_ = fVar236 * (float)local_a40._4_4_;
      auVar64._0_4_ = fVar215 * (float)local_a40._0_4_;
      auVar64._8_4_ = fVar265 * fStack_a38;
      auVar64._12_4_ = fVar258 * fStack_a34;
      auVar64._16_4_ = fVar288 * fStack_a30;
      auVar64._20_4_ = fVar388 * fStack_a2c;
      auVar64._24_4_ = fVar23 * fStack_a28;
      auVar64._28_4_ = uVar2;
      auVar29 = vsubps_avx(auVar157,auVar64);
      auVar157 = vrcpps_avx(auVar29);
      fVar214 = auVar157._0_4_;
      fVar215 = auVar157._4_4_;
      auVar65._4_4_ = auVar29._4_4_ * fVar215;
      auVar65._0_4_ = auVar29._0_4_ * fVar214;
      fVar216 = auVar157._8_4_;
      auVar65._8_4_ = auVar29._8_4_ * fVar216;
      fVar217 = auVar157._12_4_;
      auVar65._12_4_ = auVar29._12_4_ * fVar217;
      fVar230 = auVar157._16_4_;
      auVar65._16_4_ = auVar29._16_4_ * fVar230;
      fVar234 = auVar157._20_4_;
      auVar65._20_4_ = auVar29._20_4_ * fVar234;
      fVar236 = auVar157._24_4_;
      auVar65._24_4_ = auVar29._24_4_ * fVar236;
      auVar65._28_4_ = fStack_a24;
      auVar106 = vsubps_avx(auVar411,auVar65);
      auVar157 = vandps_avx(auVar29,auVar315);
      auVar316._8_4_ = 0x219392ef;
      auVar316._0_8_ = 0x219392ef219392ef;
      auVar316._12_4_ = 0x219392ef;
      auVar316._16_4_ = 0x219392ef;
      auVar316._20_4_ = 0x219392ef;
      auVar316._24_4_ = 0x219392ef;
      auVar316._28_4_ = 0x219392ef;
      auVar13 = vcmpps_avx(auVar157,auVar316,1);
      auVar66._4_4_ = (fVar215 + fVar215 * auVar106._4_4_) * -auVar15._4_4_;
      auVar66._0_4_ = (fVar214 + fVar214 * auVar106._0_4_) * -auVar15._0_4_;
      auVar66._8_4_ = (fVar216 + fVar216 * auVar106._8_4_) * -auVar15._8_4_;
      auVar66._12_4_ = (fVar217 + fVar217 * auVar106._12_4_) * -auVar15._12_4_;
      auVar66._16_4_ = (fVar230 + fVar230 * auVar106._16_4_) * -auVar15._16_4_;
      auVar66._20_4_ = (fVar234 + fVar234 * auVar106._20_4_) * -auVar15._20_4_;
      auVar66._24_4_ = (fVar236 + fVar236 * auVar106._24_4_) * -auVar15._24_4_;
      auVar66._28_4_ = auVar15._28_4_ ^ 0x80000000;
      auVar157 = vcmpps_avx(auVar29,auVar111,1);
      auVar157 = vorps_avx(auVar13,auVar157);
      auVar157 = vblendvps_avx(auVar66,auVar336,auVar157);
      _local_a60 = vmaxps_avx(auVar17,auVar157);
      auVar157 = vcmpps_avx(auVar29,ZEXT832(0) << 0x20,6);
      auVar157 = vorps_avx(auVar13,auVar157);
      auVar157 = vblendvps_avx(auVar66,auVar369,auVar157);
      auVar105 = vandps_avx(auVar105,local_460);
      local_3e0 = vminps_avx(auVar28,auVar157);
      auVar157 = vcmpps_avx(_local_a60,local_3e0,2);
      auVar13 = auVar105 & auVar157;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0x7f,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0xbf,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar13[0x1f] < '\0') {
        auVar13 = vminps_avx(local_7e0,auVar110);
        auVar14 = vminps_avx(auVar14,auVar395);
        auVar13 = vminps_avx(auVar13,auVar14);
        auVar13 = vsubps_avx(auVar13,auVar332);
        auVar105 = vandps_avx(auVar157,auVar105);
        auVar81._4_4_ = fStack_35c;
        auVar81._0_4_ = local_360;
        auVar81._8_4_ = fStack_358;
        auVar81._12_4_ = fStack_354;
        auVar81._16_4_ = fStack_350;
        auVar81._20_4_ = fStack_34c;
        auVar81._24_4_ = fStack_348;
        auVar81._28_4_ = fStack_344;
        auVar157 = vminps_avx(auVar81,auVar411);
        auVar157 = vmaxps_avx(auVar157,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar93 + fVar132 * (auVar157._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar123 + fVar160 * (auVar157._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar125 + fVar161 * (auVar157._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar127 + fVar162 * (auVar157._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar93 + fVar132 * (auVar157._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar123 + fVar160 * (auVar157._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar125 + fVar161 * (auVar157._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar127 + auVar157._28_4_ + 7.0;
        auVar80._4_4_ = fStack_37c;
        auVar80._0_4_ = local_380;
        auVar80._8_4_ = fStack_378;
        auVar80._12_4_ = fStack_374;
        auVar80._16_4_ = fStack_370;
        auVar80._20_4_ = fStack_36c;
        auVar80._24_4_ = fStack_368;
        auVar80._28_4_ = fStack_364;
        auVar157 = vminps_avx(auVar80,auVar411);
        auVar157 = vmaxps_avx(auVar157,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar93 + fVar132 * (auVar157._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar123 + fVar160 * (auVar157._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar125 + fVar161 * (auVar157._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar127 + fVar162 * (auVar157._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar93 + fVar132 * (auVar157._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar123 + fVar160 * (auVar157._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar125 + fVar161 * (auVar157._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar127 + auVar157._28_4_ + 7.0;
        auVar67._4_4_ = auVar13._4_4_ * 0.99999976;
        auVar67._0_4_ = auVar13._0_4_ * 0.99999976;
        auVar67._8_4_ = auVar13._8_4_ * 0.99999976;
        auVar67._12_4_ = auVar13._12_4_ * 0.99999976;
        auVar67._16_4_ = auVar13._16_4_ * 0.99999976;
        auVar67._20_4_ = auVar13._20_4_ * 0.99999976;
        auVar67._24_4_ = auVar13._24_4_ * 0.99999976;
        auVar67._28_4_ = 0x3f7ffffc;
        auVar157 = vmaxps_avx(ZEXT832(0) << 0x20,auVar67);
        auVar68._4_4_ = auVar157._4_4_ * auVar157._4_4_;
        auVar68._0_4_ = auVar157._0_4_ * auVar157._0_4_;
        auVar68._8_4_ = auVar157._8_4_ * auVar157._8_4_;
        auVar68._12_4_ = auVar157._12_4_ * auVar157._12_4_;
        auVar68._16_4_ = auVar157._16_4_ * auVar157._16_4_;
        auVar68._20_4_ = auVar157._20_4_ * auVar157._20_4_;
        auVar68._24_4_ = auVar157._24_4_ * auVar157._24_4_;
        auVar68._28_4_ = auVar157._28_4_;
        local_8c0 = vsubps_avx(auVar107,auVar68);
        auVar69._4_4_ = local_8c0._4_4_ * fVar129 * 4.0;
        auVar69._0_4_ = local_8c0._0_4_ * fVar128 * 4.0;
        auVar69._8_4_ = local_8c0._8_4_ * fVar130 * 4.0;
        auVar69._12_4_ = local_8c0._12_4_ * fVar131 * 4.0;
        auVar69._16_4_ = local_8c0._16_4_ * fVar346 * 4.0;
        auVar69._20_4_ = local_8c0._20_4_ * fVar348 * 4.0;
        auVar69._24_4_ = local_8c0._24_4_ * fVar350 * 4.0;
        auVar69._28_4_ = auVar157._28_4_;
        auVar13 = vsubps_avx(auVar51,auVar69);
        auVar157 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,5);
        if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar157 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar157 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar157 >> 0x7f,0) == '\0') &&
              (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar157 >> 0xbf,0) == '\0') &&
            (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar157[0x1f]) {
          auVar172 = SUB6428(ZEXT864(0),0) << 0x20;
          _local_880 = ZEXT832(0) << 0x20;
          _local_760 = ZEXT832(0) << 0x20;
          auVar202 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar224 = ZEXT828(0) << 0x20;
          auVar252._8_4_ = 0x7f800000;
          auVar252._0_8_ = 0x7f8000007f800000;
          auVar252._12_4_ = 0x7f800000;
          auVar252._16_4_ = 0x7f800000;
          auVar252._20_4_ = 0x7f800000;
          auVar252._24_4_ = 0x7f800000;
          auVar252._28_4_ = 0x7f800000;
          auVar283._8_4_ = 0xff800000;
          auVar283._0_8_ = 0xff800000ff800000;
          auVar283._12_4_ = 0xff800000;
          auVar283._16_4_ = 0xff800000;
          auVar283._20_4_ = 0xff800000;
          auVar283._24_4_ = 0xff800000;
          auVar283._28_4_ = 0xff800000;
          local_8c0 = auVar31;
          _local_860 = _local_880;
        }
        else {
          auVar15 = vsqrtps_avx(auVar13);
          auVar208._0_4_ = fVar128 + fVar128;
          auVar208._4_4_ = fVar129 + fVar129;
          auVar208._8_4_ = fVar130 + fVar130;
          auVar208._12_4_ = fVar131 + fVar131;
          auVar208._16_4_ = fVar346 + fVar346;
          auVar208._20_4_ = fVar348 + fVar348;
          auVar208._24_4_ = fVar350 + fVar350;
          auVar208._28_4_ = fVar211 + fVar211;
          auVar14 = vrcpps_avx(auVar208);
          fVar211 = auVar14._0_4_;
          fVar214 = auVar14._4_4_;
          auVar70._4_4_ = auVar208._4_4_ * fVar214;
          auVar70._0_4_ = auVar208._0_4_ * fVar211;
          fVar215 = auVar14._8_4_;
          auVar70._8_4_ = auVar208._8_4_ * fVar215;
          fVar216 = auVar14._12_4_;
          auVar70._12_4_ = auVar208._12_4_ * fVar216;
          fVar217 = auVar14._16_4_;
          auVar70._16_4_ = auVar208._16_4_ * fVar217;
          fVar230 = auVar14._20_4_;
          auVar70._20_4_ = auVar208._20_4_ * fVar230;
          fVar234 = auVar14._24_4_;
          auVar70._24_4_ = auVar208._24_4_ * fVar234;
          auVar70._28_4_ = auVar208._28_4_;
          auVar395 = vsubps_avx(auVar411,auVar70);
          fVar211 = fVar211 + fVar211 * auVar395._0_4_;
          fVar214 = fVar214 + fVar214 * auVar395._4_4_;
          fVar215 = fVar215 + fVar215 * auVar395._8_4_;
          fVar216 = fVar216 + fVar216 * auVar395._12_4_;
          fVar217 = fVar217 + fVar217 * auVar395._16_4_;
          fVar230 = fVar230 + fVar230 * auVar395._20_4_;
          fVar234 = fVar234 + fVar234 * auVar395._24_4_;
          fVar236 = auVar14._28_4_ + auVar395._28_4_;
          auVar226._0_8_ = local_920._0_8_ ^ 0x8000000080000000;
          auVar226._8_4_ = -local_920._8_4_;
          auVar226._12_4_ = -local_920._12_4_;
          auVar226._16_4_ = -local_920._16_4_;
          auVar226._20_4_ = -local_920._20_4_;
          auVar226._24_4_ = -local_920._24_4_;
          auVar226._28_4_ = -local_920._28_4_;
          auVar14 = vsubps_avx(auVar226,auVar15);
          fVar235 = auVar14._0_4_ * fVar211;
          fVar241 = auVar14._4_4_ * fVar214;
          auVar71._4_4_ = fVar241;
          auVar71._0_4_ = fVar235;
          fVar258 = auVar14._8_4_ * fVar215;
          auVar71._8_4_ = fVar258;
          fVar260 = auVar14._12_4_ * fVar216;
          auVar71._12_4_ = fVar260;
          fVar262 = auVar14._16_4_ * fVar217;
          auVar71._16_4_ = fVar262;
          fVar264 = auVar14._20_4_ * fVar230;
          auVar71._20_4_ = fVar264;
          fVar269 = auVar14._24_4_ * fVar234;
          auVar71._24_4_ = fVar269;
          auVar71._28_4_ = 0x80000000;
          auVar15 = vsubps_avx(auVar15,local_920);
          fVar211 = auVar15._0_4_ * fVar211;
          fVar214 = auVar15._4_4_ * fVar214;
          auVar72._4_4_ = fVar214;
          auVar72._0_4_ = fVar211;
          fVar215 = auVar15._8_4_ * fVar215;
          auVar72._8_4_ = fVar215;
          fVar216 = auVar15._12_4_ * fVar216;
          auVar72._12_4_ = fVar216;
          fVar217 = auVar15._16_4_ * fVar217;
          auVar72._16_4_ = fVar217;
          fVar230 = auVar15._20_4_ * fVar230;
          auVar72._20_4_ = fVar230;
          fVar234 = auVar15._24_4_ * fVar234;
          auVar72._24_4_ = fVar234;
          auVar72._28_4_ = fVar383;
          fVar238 = local_3a0 * (fVar235 * fVar337 + fVar351);
          fVar240 = fStack_39c * (fVar241 * fVar342 + fVar358);
          fVar257 = fStack_398 * (fVar258 * fVar343 + fVar359);
          fVar263 = fStack_394 * (fVar260 * fVar344 + fVar360);
          fVar265 = fStack_390 * (fVar262 * fVar345 + fVar361);
          fVar267 = fStack_38c * (fVar264 * fVar347 + fVar362);
          fVar233 = fStack_388 * (fVar269 * fVar349 + fVar363);
          auStack_730._12_4_ = auVar16._28_4_;
          auVar176._0_4_ = auVar391._0_4_ + fVar213 * fVar238;
          auVar176._4_4_ = auVar391._4_4_ + fVar232 * fVar240;
          auVar176._8_4_ = auVar391._8_4_ + fVar261 * fVar257;
          auVar176._12_4_ = auVar391._12_4_ + fVar239 * fVar263;
          auVar176._16_4_ = auVar391._16_4_ + fVar268 * fVar265;
          auVar176._20_4_ = auVar391._20_4_ + fVar303 * fVar267;
          auVar176._24_4_ = auVar391._24_4_ + fVar21 * fVar233;
          auVar176._28_4_ = auVar391._28_4_ + auVar15._28_4_ + fVar364;
          auVar73._4_4_ = fVar241 * (float)local_a40._4_4_;
          auVar73._0_4_ = fVar235 * (float)local_a40._0_4_;
          auVar73._8_4_ = fVar258 * fStack_a38;
          auVar73._12_4_ = fVar260 * fStack_a34;
          auVar73._16_4_ = fVar262 * fStack_a30;
          auVar73._20_4_ = fVar264 * fStack_a2c;
          auVar73._24_4_ = fVar269 * fStack_a28;
          auVar73._28_4_ = fVar236;
          local_ac0 = vsubps_avx(auVar73,auVar176);
          auVar209._0_4_ = auVar404._0_4_ + fVar212 * fVar238;
          auVar209._4_4_ = auVar404._4_4_ + fVar231 * fVar240;
          auVar209._8_4_ = auVar404._8_4_ + fVar259 * fVar257;
          auVar209._12_4_ = auVar404._12_4_ + fVar237 * fVar263;
          auVar209._16_4_ = auVar404._16_4_ + fVar266 * fVar265;
          auVar209._20_4_ = auVar404._20_4_ + fVar300 * fVar267;
          auVar209._24_4_ = auVar404._24_4_ + fVar20 * fVar233;
          auVar209._28_4_ = auVar404._28_4_ + fVar236;
          auVar253._0_4_ = (float)local_800._0_4_ * fVar235;
          auVar253._4_4_ = (float)local_800._4_4_ * fVar241;
          auVar253._8_4_ = fStack_7f8 * fVar258;
          auVar253._12_4_ = fStack_7f4 * fVar260;
          auVar253._16_4_ = fStack_7f0 * fVar262;
          auVar253._20_4_ = fStack_7ec * fVar264;
          auVar253._24_4_ = fStack_7e8 * fVar269;
          auVar253._28_4_ = 0;
          _local_ae0 = vsubps_avx(auVar253,auVar209);
          auVar227._0_4_ = auVar410._0_4_ + fVar365 * fVar238;
          auVar227._4_4_ = auVar410._4_4_ + fVar371 * fVar240;
          auVar227._8_4_ = auVar410._8_4_ + fVar372 * fVar257;
          auVar227._12_4_ = auVar410._12_4_ + fVar373 * fVar263;
          auVar227._16_4_ = auVar410._16_4_ + fVar374 * fVar265;
          auVar227._20_4_ = auVar410._20_4_ + fVar375 * fVar267;
          auVar227._24_4_ = auVar410._24_4_ + fVar376 * fVar233;
          auVar227._28_4_ = auVar410._28_4_ + auVar14._28_4_;
          auVar74._4_4_ = (float)local_900._4_4_ * fVar241;
          auVar74._0_4_ = (float)local_900._0_4_ * fVar235;
          auVar74._8_4_ = fStack_8f8 * fVar258;
          auVar74._12_4_ = fStack_8f4 * fVar260;
          auVar74._16_4_ = fStack_8f0 * fVar262;
          auVar74._20_4_ = fStack_8ec * fVar264;
          auVar74._24_4_ = fStack_8e8 * fVar269;
          auVar74._28_4_ = 0;
          auVar14 = vsubps_avx(auVar74,auVar227);
          auVar224 = auVar14._0_28_;
          fVar236 = local_3a0 * (fVar211 * fVar337 + fVar351);
          fVar238 = fStack_39c * (fVar214 * fVar342 + fVar358);
          fVar240 = fStack_398 * (fVar215 * fVar343 + fVar359);
          fVar257 = fStack_394 * (fVar216 * fVar344 + fVar360);
          fVar263 = fStack_390 * (fVar217 * fVar345 + fVar361);
          fVar265 = fStack_38c * (fVar230 * fVar347 + fVar362);
          fVar267 = fStack_388 * (fVar234 * fVar349 + fVar363);
          auVar284._0_4_ = auVar391._0_4_ + fVar213 * fVar236;
          auVar284._4_4_ = auVar391._4_4_ + fVar232 * fVar238;
          auVar284._8_4_ = auVar391._8_4_ + fVar261 * fVar240;
          auVar284._12_4_ = auVar391._12_4_ + fVar239 * fVar257;
          auVar284._16_4_ = auVar391._16_4_ + fVar268 * fVar263;
          auVar284._20_4_ = auVar391._20_4_ + fVar303 * fVar265;
          auVar284._24_4_ = auVar391._24_4_ + fVar21 * fVar267;
          auVar284._28_4_ = auVar391._28_4_ + (float)auStack_730._12_4_;
          auVar75._4_4_ = fVar214 * (float)local_a40._4_4_;
          auVar75._0_4_ = fVar211 * (float)local_a40._0_4_;
          auVar75._8_4_ = fVar215 * fStack_a38;
          auVar75._12_4_ = fVar216 * fStack_a34;
          auVar75._16_4_ = fVar217 * fStack_a30;
          auVar75._20_4_ = fVar230 * fStack_a2c;
          auVar75._24_4_ = fVar234 * fStack_a28;
          auVar75._28_4_ = fStack_a24;
          _local_860 = vsubps_avx(auVar75,auVar284);
          auVar285._0_4_ = auVar404._0_4_ + fVar212 * fVar236;
          auVar285._4_4_ = auVar404._4_4_ + fVar231 * fVar238;
          auVar285._8_4_ = auVar404._8_4_ + fVar259 * fVar240;
          auVar285._12_4_ = auVar404._12_4_ + fVar237 * fVar257;
          auVar285._16_4_ = auVar404._16_4_ + fVar266 * fVar263;
          auVar285._20_4_ = auVar404._20_4_ + fVar300 * fVar265;
          auVar285._24_4_ = auVar404._24_4_ + fVar20 * fVar267;
          auVar285._28_4_ = auVar404._28_4_ + local_860._28_4_;
          auVar76._4_4_ = (float)local_800._4_4_ * fVar214;
          auVar76._0_4_ = (float)local_800._0_4_ * fVar211;
          auVar76._8_4_ = fStack_7f8 * fVar215;
          auVar76._12_4_ = fStack_7f4 * fVar216;
          auVar76._16_4_ = fStack_7f0 * fVar217;
          auVar76._20_4_ = fStack_7ec * fVar230;
          auVar76._24_4_ = fStack_7e8 * fVar234;
          auVar76._28_4_ = fStack_a24;
          _local_880 = vsubps_avx(auVar76,auVar285);
          auVar254._0_4_ = auVar410._0_4_ + fVar365 * fVar236;
          auVar254._4_4_ = auVar410._4_4_ + fVar371 * fVar238;
          auVar254._8_4_ = auVar410._8_4_ + fVar372 * fVar240;
          auVar254._12_4_ = auVar410._12_4_ + fVar373 * fVar257;
          auVar254._16_4_ = auVar410._16_4_ + fVar374 * fVar263;
          auVar254._20_4_ = auVar410._20_4_ + fVar375 * fVar265;
          auVar254._24_4_ = auVar410._24_4_ + fVar376 * fVar267;
          auVar254._28_4_ = auVar410._28_4_ + fVar364 + 0.0;
          auVar77._4_4_ = (float)local_900._4_4_ * fVar214;
          auVar77._0_4_ = (float)local_900._0_4_ * fVar211;
          auVar77._8_4_ = fStack_8f8 * fVar215;
          auVar77._12_4_ = fStack_8f4 * fVar216;
          auVar77._16_4_ = fStack_8f0 * fVar217;
          auVar77._20_4_ = fStack_8ec * fVar230;
          auVar77._24_4_ = fStack_8e8 * fVar234;
          auVar77._28_4_ = local_880._28_4_;
          _local_760 = vsubps_avx(auVar77,auVar254);
          auVar14 = vcmpps_avx(auVar13,_DAT_01faff00,5);
          auVar255._8_4_ = 0x7f800000;
          auVar255._0_8_ = 0x7f8000007f800000;
          auVar255._12_4_ = 0x7f800000;
          auVar255._16_4_ = 0x7f800000;
          auVar255._20_4_ = 0x7f800000;
          auVar255._24_4_ = 0x7f800000;
          auVar255._28_4_ = 0x7f800000;
          auVar252 = vblendvps_avx(auVar255,auVar71,auVar14);
          auVar356._8_4_ = 0x7fffffff;
          auVar356._0_8_ = 0x7fffffff7fffffff;
          auVar356._12_4_ = 0x7fffffff;
          auVar356._16_4_ = 0x7fffffff;
          auVar356._20_4_ = 0x7fffffff;
          auVar356._24_4_ = 0x7fffffff;
          auVar356._28_4_ = 0x7fffffff;
          auVar13 = vandps_avx(auVar356,local_3c0);
          auVar13 = vmaxps_avx(local_4a0,auVar13);
          auVar78._4_4_ = auVar13._4_4_ * 1.9073486e-06;
          auVar78._0_4_ = auVar13._0_4_ * 1.9073486e-06;
          auVar78._8_4_ = auVar13._8_4_ * 1.9073486e-06;
          auVar78._12_4_ = auVar13._12_4_ * 1.9073486e-06;
          auVar78._16_4_ = auVar13._16_4_ * 1.9073486e-06;
          auVar78._20_4_ = auVar13._20_4_ * 1.9073486e-06;
          auVar78._24_4_ = auVar13._24_4_ * 1.9073486e-06;
          auVar78._28_4_ = auVar13._28_4_;
          auVar13 = vandps_avx(auVar356,local_500);
          auVar13 = vcmpps_avx(auVar13,auVar78,1);
          auVar286._8_4_ = 0xff800000;
          auVar286._0_8_ = 0xff800000ff800000;
          auVar286._12_4_ = 0xff800000;
          auVar286._16_4_ = 0xff800000;
          auVar286._20_4_ = 0xff800000;
          auVar286._24_4_ = 0xff800000;
          auVar286._28_4_ = 0xff800000;
          auVar283 = vblendvps_avx(auVar286,auVar72,auVar14);
          auVar15 = auVar14 & auVar13;
          if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar15 >> 0x7f,0) != '\0') ||
                (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar15 >> 0xbf,0) != '\0') ||
              (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar15[0x1f] < '\0') {
            auVar157 = vandps_avx(auVar13,auVar14);
            auVar97 = vpackssdw_avx(auVar157._0_16_,auVar157._16_16_);
            auVar395 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar15 = vcmpps_avx(local_8c0,auVar395,2);
            auVar407._8_4_ = 0xff800000;
            auVar407._0_8_ = 0xff800000ff800000;
            auVar407._12_4_ = 0xff800000;
            auVar407._16_4_ = 0xff800000;
            auVar407._20_4_ = 0xff800000;
            auVar407._24_4_ = 0xff800000;
            auVar407._28_4_ = 0xff800000;
            auVar413._8_4_ = 0x7f800000;
            auVar413._0_8_ = 0x7f8000007f800000;
            auVar413._12_4_ = 0x7f800000;
            auVar413._16_4_ = 0x7f800000;
            auVar413._20_4_ = 0x7f800000;
            auVar413._24_4_ = 0x7f800000;
            auVar413._28_4_ = 0x7f800000;
            auVar13 = vblendvps_avx(auVar413,auVar407,auVar15);
            auVar169 = vpmovsxwd_avx(auVar97);
            auVar97 = vpunpckhwd_avx(auVar97,auVar97);
            auVar357._16_16_ = auVar97;
            auVar357._0_16_ = auVar169;
            auVar252 = vblendvps_avx(auVar252,auVar13,auVar357);
            auVar13 = vblendvps_avx(auVar407,auVar413,auVar15);
            auVar283 = vblendvps_avx(auVar283,auVar13,auVar357);
            auVar13 = vcmpps_avx(auVar395,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar121._0_4_ = auVar13._0_4_ ^ auVar157._0_4_;
            auVar121._4_4_ = auVar13._4_4_ ^ auVar157._4_4_;
            auVar121._8_4_ = auVar13._8_4_ ^ auVar157._8_4_;
            auVar121._12_4_ = auVar13._12_4_ ^ auVar157._12_4_;
            auVar121._16_4_ = auVar13._16_4_ ^ auVar157._16_4_;
            auVar121._20_4_ = auVar13._20_4_ ^ auVar157._20_4_;
            auVar121._24_4_ = auVar13._24_4_ ^ auVar157._24_4_;
            auVar121._28_4_ = auVar13._28_4_ ^ auVar157._28_4_;
            auVar157 = vorps_avx(auVar15,auVar121);
            auVar157 = vandps_avx(auVar14,auVar157);
          }
          auVar172 = local_ac0._0_28_;
          auVar202 = local_ae0._0_28_;
          local_aa0 = auVar105;
        }
        _local_440 = _local_a60;
        local_420 = vminps_avx(local_3e0,auVar252);
        _local_840 = vmaxps_avx(_local_a60,auVar283);
        local_400 = _local_840;
        auVar13 = vcmpps_avx(_local_a60,local_420,2);
        local_6a0 = vandps_avx(auVar105,auVar13);
        auVar13 = vcmpps_avx(_local_840,local_3e0,2);
        local_6e0 = vandps_avx(auVar105,auVar13);
        auVar105 = vorps_avx(local_6e0,local_6a0);
        auVar370 = ZEXT3264(local_a00);
        if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar105 >> 0x7f,0) != '\0') ||
              (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar105 >> 0xbf,0) != '\0') ||
            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar105[0x1f] < '\0') {
          local_980 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_700._0_4_ = auVar157._0_4_ ^ local_980._0_4_;
          local_700._4_4_ = auVar157._4_4_ ^ local_980._4_4_;
          local_700._8_4_ = auVar157._8_4_ ^ local_980._8_4_;
          local_700._12_4_ = auVar157._12_4_ ^ local_980._12_4_;
          local_700._16_4_ = auVar157._16_4_ ^ local_980._16_4_;
          local_700._20_4_ = auVar157._20_4_ ^ local_980._20_4_;
          local_700._24_4_ = auVar157._24_4_ ^ local_980._24_4_;
          local_700._28_4_ = (uint)auVar157._28_4_ ^ (uint)local_980._28_4_;
          auVar114._0_4_ =
               auVar172._0_4_ * (float)local_a40._0_4_ +
               (float)local_800._0_4_ * auVar202._0_4_ + (float)local_900._0_4_ * auVar224._0_4_;
          auVar114._4_4_ =
               auVar172._4_4_ * (float)local_a40._4_4_ +
               (float)local_800._4_4_ * auVar202._4_4_ + (float)local_900._4_4_ * auVar224._4_4_;
          auVar114._8_4_ =
               auVar172._8_4_ * fStack_a38 +
               fStack_7f8 * auVar202._8_4_ + fStack_8f8 * auVar224._8_4_;
          auVar114._12_4_ =
               auVar172._12_4_ * fStack_a34 +
               fStack_7f4 * auVar202._12_4_ + fStack_8f4 * auVar224._12_4_;
          auVar114._16_4_ =
               auVar172._16_4_ * fStack_a30 +
               fStack_7f0 * auVar202._16_4_ + fStack_8f0 * auVar224._16_4_;
          auVar114._20_4_ =
               auVar172._20_4_ * fStack_a2c +
               fStack_7ec * auVar202._20_4_ + fStack_8ec * auVar224._20_4_;
          auVar114._24_4_ =
               auVar172._24_4_ * fStack_a28 +
               fStack_7e8 * auVar202._24_4_ + fStack_8e8 * auVar224._24_4_;
          auVar114._28_4_ = auVar157._28_4_ + local_980._28_4_ + fStack_7e4;
          auVar151._8_4_ = 0x7fffffff;
          auVar151._0_8_ = 0x7fffffff7fffffff;
          auVar151._12_4_ = 0x7fffffff;
          auVar151._16_4_ = 0x7fffffff;
          auVar151._20_4_ = 0x7fffffff;
          auVar151._24_4_ = 0x7fffffff;
          auVar151._28_4_ = 0x7fffffff;
          auVar105 = vandps_avx(auVar114,auVar151);
          auVar152._8_4_ = 0x3e99999a;
          auVar152._0_8_ = 0x3e99999a3e99999a;
          auVar152._12_4_ = 0x3e99999a;
          auVar152._16_4_ = 0x3e99999a;
          auVar152._20_4_ = 0x3e99999a;
          auVar152._24_4_ = 0x3e99999a;
          auVar152._28_4_ = 0x3e99999a;
          auVar105 = vcmpps_avx(auVar105,auVar152,1);
          auVar105 = vorps_avx(auVar105,local_700);
          auVar153._8_4_ = 3;
          auVar153._0_8_ = 0x300000003;
          auVar153._12_4_ = 3;
          auVar153._16_4_ = 3;
          auVar153._20_4_ = 3;
          auVar153._24_4_ = 3;
          auVar153._28_4_ = 3;
          auVar177._8_4_ = 2;
          auVar177._0_8_ = 0x200000002;
          auVar177._12_4_ = 2;
          auVar177._16_4_ = 2;
          auVar177._20_4_ = 2;
          auVar177._24_4_ = 2;
          auVar177._28_4_ = 2;
          auVar105 = vblendvps_avx(auVar177,auVar153,auVar105);
          local_720 = ZEXT432(local_ca4);
          local_740 = vpshufd_avx(ZEXT416(local_ca4),0);
          fVar211 = 0.0;
          auVar97 = vpcmpgtd_avx(auVar105._16_16_,local_740);
          auStack_730 = auVar16._16_16_;
          auVar169 = vpcmpgtd_avx(auVar105._0_16_,local_740);
          auVar154._16_16_ = auVar97;
          auVar154._0_16_ = auVar169;
          local_6c0 = vblendps_avx(ZEXT1632(auVar169),auVar154,0xf0);
          local_660 = vandnps_avx(local_6c0,local_6a0);
          auVar159 = ZEXT3264(local_660);
          auVar105 = local_6a0 & ~local_6c0;
          auVar287 = ZEXT3264(local_a80);
          if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar105 >> 0x7f,0) == '\0') &&
                (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar105 >> 0xbf,0) == '\0') &&
              (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar105[0x1f]) {
            auVar97 = vshufps_avx(ZEXT416((uint)fVar124),ZEXT416((uint)fVar124),0);
            auVar115._16_16_ = auVar97;
            auVar115._0_16_ = auVar97;
            auVar224 = local_a40._0_28_;
            auVar414 = ZEXT3264(local_a20);
            fVar213 = (float)local_900._0_4_;
            fVar214 = (float)local_900._4_4_;
            fVar215 = fStack_8f8;
            fVar216 = fStack_8f4;
            fVar217 = fStack_8f0;
            fVar230 = fStack_8ec;
            fVar231 = fStack_8e8;
          }
          else {
            local_820._4_4_ = (float)local_a60._4_4_ + local_8e0._4_4_;
            local_820._0_4_ = (float)local_a60._0_4_ + (float)local_8e0;
            fStack_818 = fStack_a58 + (float)uStack_8d8;
            fStack_814 = fStack_a54 + uStack_8d8._4_4_;
            fStack_810 = fStack_a50 + (float)uStack_8d0;
            fStack_80c = fStack_a4c + uStack_8d0._4_4_;
            fStack_808 = fStack_a48 + (float)uStack_8c8;
            fStack_804 = fStack_a44 + uStack_8c8._4_4_;
            do {
              auVar116._8_4_ = 0x7f800000;
              auVar116._0_8_ = 0x7f8000007f800000;
              auVar116._12_4_ = 0x7f800000;
              auVar116._16_4_ = 0x7f800000;
              auVar116._20_4_ = 0x7f800000;
              auVar116._24_4_ = 0x7f800000;
              auVar116._28_4_ = 0x7f800000;
              auVar105 = auVar159._0_32_;
              auVar157 = vblendvps_avx(auVar116,_local_a60,auVar105);
              auVar13 = vshufps_avx(auVar157,auVar157,0xb1);
              auVar13 = vminps_avx(auVar157,auVar13);
              auVar14 = vshufpd_avx(auVar13,auVar13,5);
              auVar13 = vminps_avx(auVar13,auVar14);
              auVar14 = vperm2f128_avx(auVar13,auVar13,1);
              auVar13 = vminps_avx(auVar13,auVar14);
              auVar157 = vcmpps_avx(auVar157,auVar13,0);
              auVar13 = auVar105 & auVar157;
              if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar13 >> 0x7f,0) != '\0') ||
                    (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0xbf,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar13[0x1f] < '\0') {
                auVar105 = vandps_avx(auVar157,auVar105);
              }
              uVar84 = vmovmskps_avx(auVar105);
              uVar83 = 0;
              if (uVar84 != 0) {
                for (; (uVar84 >> uVar83 & 1) == 0; uVar83 = uVar83 + 1) {
                }
              }
              uVar86 = (ulong)uVar83;
              *(undefined4 *)(local_660 + uVar86 * 4) = 0;
              fVar211 = local_1a0[uVar86];
              uVar83 = *(uint *)(local_440 + uVar86 * 4);
              fVar212 = auVar134._0_4_;
              if ((float)local_940._0_4_ < 0.0) {
                fVar212 = sqrtf((float)local_940._0_4_);
              }
              auVar169 = vminps_avx(_local_af0,_local_b10);
              auVar97 = vmaxps_avx(_local_af0,_local_b10);
              auVar102 = vminps_avx(_local_b00,_local_b20);
              auVar166 = vminps_avx(auVar169,auVar102);
              auVar169 = vmaxps_avx(_local_b00,_local_b20);
              auVar102 = vmaxps_avx(auVar97,auVar169);
              auVar188._8_4_ = 0x7fffffff;
              auVar188._0_8_ = 0x7fffffff7fffffff;
              auVar188._12_4_ = 0x7fffffff;
              auVar97 = vandps_avx(auVar166,auVar188);
              auVar169 = vandps_avx(auVar102,auVar188);
              auVar97 = vmaxps_avx(auVar97,auVar169);
              auVar169 = vmovshdup_avx(auVar97);
              auVar169 = vmaxss_avx(auVar169,auVar97);
              auVar97 = vshufpd_avx(auVar97,auVar97,1);
              auVar97 = vmaxss_avx(auVar97,auVar169);
              local_aa0._0_4_ = auVar97._0_4_ * 1.9073486e-06;
              local_780._0_4_ = fVar212 * 1.9073486e-06;
              local_7e0._0_16_ = vshufps_avx(auVar102,auVar102,0xff);
              auVar97 = vinsertps_avx(ZEXT416(uVar83),ZEXT416((uint)fVar211),0x10);
              bVar92 = true;
              uVar86 = 0;
              do {
                auVar169 = vmovshdup_avx(auVar97);
                fVar240 = auVar169._0_4_;
                fVar215 = 1.0 - fVar240;
                auVar169 = vshufps_avx(auVar97,auVar97,0x55);
                fVar211 = auVar169._0_4_;
                fVar212 = auVar169._4_4_;
                fVar213 = auVar169._8_4_;
                fVar214 = auVar169._12_4_;
                auVar169 = vshufps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar215),0);
                fVar216 = auVar169._0_4_;
                fVar217 = auVar169._4_4_;
                fVar230 = auVar169._8_4_;
                fVar231 = auVar169._12_4_;
                fVar232 = (float)local_b00._0_4_ * fVar211 + (float)local_b10._0_4_ * fVar216;
                fVar234 = (float)local_b00._4_4_ * fVar212 + (float)local_b10._4_4_ * fVar217;
                fVar236 = fStack_af8 * fVar213 + fStack_b08 * fVar230;
                fVar238 = fStack_af4 * fVar214 + fStack_b04 * fVar231;
                auVar244._0_4_ =
                     fVar216 * ((float)local_b10._0_4_ * fVar211 + fVar216 * (float)local_af0._0_4_)
                     + fVar211 * fVar232;
                auVar244._4_4_ =
                     fVar217 * ((float)local_b10._4_4_ * fVar212 + fVar217 * (float)local_af0._4_4_)
                     + fVar212 * fVar234;
                auVar244._8_4_ =
                     fVar230 * (fStack_b08 * fVar213 + fVar230 * fStack_ae8) + fVar213 * fVar236;
                auVar244._12_4_ =
                     fVar231 * (fStack_b04 * fVar214 + fVar231 * fStack_ae4) + fVar214 * fVar238;
                auVar189._0_4_ =
                     fVar216 * fVar232 +
                     fVar211 * (fVar211 * (float)local_b20._0_4_ + (float)local_b00._0_4_ * fVar216)
                ;
                auVar189._4_4_ =
                     fVar217 * fVar234 +
                     fVar212 * (fVar212 * (float)local_b20._4_4_ + (float)local_b00._4_4_ * fVar217)
                ;
                auVar189._8_4_ =
                     fVar230 * fVar236 + fVar213 * (fVar213 * fStack_b18 + fStack_af8 * fVar230);
                auVar189._12_4_ =
                     fVar231 * fVar238 + fVar214 * (fVar214 * fStack_b14 + fStack_af4 * fVar231);
                auVar169 = vshufps_avx(auVar97,auVar97,0);
                auVar135._0_4_ = auVar169._0_4_ * (float)local_930._0_4_ + 0.0;
                auVar135._4_4_ = auVar169._4_4_ * (float)local_930._4_4_ + 0.0;
                auVar135._8_4_ = auVar169._8_4_ * fStack_928 + 0.0;
                auVar135._12_4_ = auVar169._12_4_ * fStack_924 + 0.0;
                auVar99._0_4_ = fVar216 * auVar244._0_4_ + fVar211 * auVar189._0_4_;
                auVar99._4_4_ = fVar217 * auVar244._4_4_ + fVar212 * auVar189._4_4_;
                auVar99._8_4_ = fVar230 * auVar244._8_4_ + fVar213 * auVar189._8_4_;
                auVar99._12_4_ = fVar231 * auVar244._12_4_ + fVar214 * auVar189._12_4_;
                local_8c0._0_16_ = auVar99;
                auVar169 = vsubps_avx(auVar135,auVar99);
                _local_ae0 = auVar169;
                auVar169 = vdpps_avx(auVar169,auVar169,0x7f);
                local_ac0._0_16_ = auVar169;
                if (auVar169._0_4_ < 0.0) {
                  fVar211 = sqrtf(auVar169._0_4_);
                }
                else {
                  auVar169 = vsqrtss_avx(auVar169,auVar169);
                  fVar211 = auVar169._0_4_;
                }
                auVar169 = vsubps_avx(auVar189,auVar244);
                auVar273._0_4_ = auVar169._0_4_ * 3.0;
                auVar273._4_4_ = auVar169._4_4_ * 3.0;
                auVar273._8_4_ = auVar169._8_4_ * 3.0;
                auVar273._12_4_ = auVar169._12_4_ * 3.0;
                auVar169 = vshufps_avx(ZEXT416((uint)(fVar240 * 6.0)),ZEXT416((uint)(fVar240 * 6.0))
                                       ,0);
                auVar102 = ZEXT416((uint)((fVar215 - (fVar240 + fVar240)) * 6.0));
                auVar166 = vshufps_avx(auVar102,auVar102,0);
                auVar102 = ZEXT416((uint)((fVar240 - (fVar215 + fVar215)) * 6.0));
                auVar197 = vshufps_avx(auVar102,auVar102,0);
                auVar6 = vshufps_avx(ZEXT416((uint)(fVar215 * 6.0)),ZEXT416((uint)(fVar215 * 6.0)),0
                                    );
                auVar102 = vdpps_avx(auVar273,auVar273,0x7f);
                auVar136._0_4_ =
                     auVar6._0_4_ * (float)local_af0._0_4_ +
                     auVar197._0_4_ * (float)local_b10._0_4_ +
                     auVar169._0_4_ * (float)local_b20._0_4_ +
                     auVar166._0_4_ * (float)local_b00._0_4_;
                auVar136._4_4_ =
                     auVar6._4_4_ * (float)local_af0._4_4_ +
                     auVar197._4_4_ * (float)local_b10._4_4_ +
                     auVar169._4_4_ * (float)local_b20._4_4_ +
                     auVar166._4_4_ * (float)local_b00._4_4_;
                auVar136._8_4_ =
                     auVar6._8_4_ * fStack_ae8 +
                     auVar197._8_4_ * fStack_b08 +
                     auVar169._8_4_ * fStack_b18 + auVar166._8_4_ * fStack_af8;
                auVar136._12_4_ =
                     auVar6._12_4_ * fStack_ae4 +
                     auVar197._12_4_ * fStack_b04 +
                     auVar169._12_4_ * fStack_b14 + auVar166._12_4_ * fStack_af4;
                auVar169 = vblendps_avx(auVar102,_DAT_01f7aa10,0xe);
                auVar166 = vrsqrtss_avx(auVar169,auVar169);
                fVar213 = auVar166._0_4_;
                fVar212 = auVar102._0_4_;
                auVar166 = vdpps_avx(auVar273,auVar136,0x7f);
                auVar197 = vshufps_avx(auVar102,auVar102,0);
                auVar137._0_4_ = auVar136._0_4_ * auVar197._0_4_;
                auVar137._4_4_ = auVar136._4_4_ * auVar197._4_4_;
                auVar137._8_4_ = auVar136._8_4_ * auVar197._8_4_;
                auVar137._12_4_ = auVar136._12_4_ * auVar197._12_4_;
                auVar166 = vshufps_avx(auVar166,auVar166,0);
                auVar219._0_4_ = auVar273._0_4_ * auVar166._0_4_;
                auVar219._4_4_ = auVar273._4_4_ * auVar166._4_4_;
                auVar219._8_4_ = auVar273._8_4_ * auVar166._8_4_;
                auVar219._12_4_ = auVar273._12_4_ * auVar166._12_4_;
                auVar6 = vsubps_avx(auVar137,auVar219);
                auVar166 = vrcpss_avx(auVar169,auVar169);
                auVar169 = vmaxss_avx(ZEXT416((uint)local_aa0._0_4_),
                                      ZEXT416((uint)(auVar97._0_4_ * (float)local_780._0_4_)));
                auVar166 = ZEXT416((uint)(auVar166._0_4_ * (2.0 - fVar212 * auVar166._0_4_)));
                auVar166 = vshufps_avx(auVar166,auVar166,0);
                uVar79 = CONCAT44(auVar273._4_4_,auVar273._0_4_);
                auVar328._0_8_ = uVar79 ^ 0x8000000080000000;
                auVar328._8_4_ = -auVar273._8_4_;
                auVar328._12_4_ = -auVar273._12_4_;
                auVar197 = ZEXT416((uint)(fVar213 * 1.5 +
                                         fVar212 * -0.5 * fVar213 * fVar213 * fVar213));
                auVar197 = vshufps_avx(auVar197,auVar197,0);
                auVar190._0_4_ = auVar197._0_4_ * auVar6._0_4_ * auVar166._0_4_;
                auVar190._4_4_ = auVar197._4_4_ * auVar6._4_4_ * auVar166._4_4_;
                auVar190._8_4_ = auVar197._8_4_ * auVar6._8_4_ * auVar166._8_4_;
                auVar190._12_4_ = auVar197._12_4_ * auVar6._12_4_ * auVar166._12_4_;
                local_960._0_4_ = auVar273._0_4_ * auVar197._0_4_;
                local_960._4_4_ = auVar273._4_4_ * auVar197._4_4_;
                local_960._8_4_ = auVar273._8_4_ * auVar197._8_4_;
                local_960._12_4_ = auVar273._12_4_ * auVar197._12_4_;
                if (fVar212 < 0.0) {
                  fVar212 = sqrtf(fVar212);
                }
                else {
                  auVar102 = vsqrtss_avx(auVar102,auVar102);
                  fVar212 = auVar102._0_4_;
                }
                auVar102 = vdpps_avx(_local_ae0,local_960._0_16_,0x7f);
                fVar211 = ((float)local_aa0._0_4_ / fVar212) * (fVar211 + 1.0) +
                          fVar211 * (float)local_aa0._0_4_ + auVar169._0_4_;
                auVar166 = vdpps_avx(auVar328,local_960._0_16_,0x7f);
                auVar197 = vdpps_avx(_local_ae0,auVar190,0x7f);
                auVar6 = vdpps_avx(_local_930,local_960._0_16_,0x7f);
                auVar7 = vdpps_avx(_local_ae0,auVar328,0x7f);
                fVar212 = auVar166._0_4_ + auVar197._0_4_;
                fVar213 = auVar102._0_4_;
                auVar100._0_4_ = fVar213 * fVar213;
                auVar100._4_4_ = auVar102._4_4_ * auVar102._4_4_;
                auVar100._8_4_ = auVar102._8_4_ * auVar102._8_4_;
                auVar100._12_4_ = auVar102._12_4_ * auVar102._12_4_;
                auVar197 = vsubps_avx(local_ac0._0_16_,auVar100);
                local_960._0_16_ = ZEXT416((uint)fVar212);
                auVar166 = vdpps_avx(_local_ae0,_local_930,0x7f);
                fVar214 = auVar7._0_4_ - fVar213 * fVar212;
                fVar213 = auVar166._0_4_ - fVar213 * auVar6._0_4_;
                auVar166 = vrsqrtss_avx(auVar197,auVar197);
                fVar215 = auVar197._0_4_;
                fVar212 = auVar166._0_4_;
                fVar212 = fVar212 * 1.5 + fVar215 * -0.5 * fVar212 * fVar212 * fVar212;
                if (fVar215 < 0.0) {
                  local_920._0_4_ = fVar214;
                  local_7a0._0_4_ = fVar213;
                  local_7c0._0_4_ = fVar212;
                  fVar215 = sqrtf(fVar215);
                  fVar212 = (float)local_7c0._0_4_;
                  fVar214 = (float)local_920._0_4_;
                  fVar213 = (float)local_7a0._0_4_;
                }
                else {
                  auVar166 = vsqrtss_avx(auVar197,auVar197);
                  fVar215 = auVar166._0_4_;
                }
                auVar7 = vpermilps_avx(local_8c0._0_16_,0xff);
                auVar94 = vpermilps_avx(auVar273,0xff);
                fVar214 = fVar214 * fVar212 - auVar94._0_4_;
                auVar220._0_8_ = auVar6._0_8_ ^ 0x8000000080000000;
                auVar220._8_4_ = auVar6._8_4_ ^ 0x80000000;
                auVar220._12_4_ = auVar6._12_4_ ^ 0x80000000;
                auVar245._0_4_ = -fVar214;
                auVar245._4_4_ = 0x80000000;
                auVar245._8_4_ = 0x80000000;
                auVar245._12_4_ = 0x80000000;
                auVar166 = vinsertps_avx(auVar245,ZEXT416((uint)(fVar213 * fVar212)),0x1c);
                auVar6 = vmovsldup_avx(ZEXT416((uint)(local_960._0_4_ * fVar213 * fVar212 -
                                                     auVar6._0_4_ * fVar214)));
                auVar166 = vdivps_avx(auVar166,auVar6);
                auVar197 = vinsertps_avx(local_960._0_16_,auVar220,0x10);
                auVar197 = vdivps_avx(auVar197,auVar6);
                auVar6 = vmovsldup_avx(auVar102);
                auVar104 = ZEXT416((uint)(fVar215 - auVar7._0_4_));
                auVar7 = vmovsldup_avx(auVar104);
                auVar164._0_4_ = auVar6._0_4_ * auVar166._0_4_ + auVar7._0_4_ * auVar197._0_4_;
                auVar164._4_4_ = auVar6._4_4_ * auVar166._4_4_ + auVar7._4_4_ * auVar197._4_4_;
                auVar164._8_4_ = auVar6._8_4_ * auVar166._8_4_ + auVar7._8_4_ * auVar197._8_4_;
                auVar164._12_4_ = auVar6._12_4_ * auVar166._12_4_ + auVar7._12_4_ * auVar197._12_4_;
                auVar97 = vsubps_avx(auVar97,auVar164);
                auVar165._8_4_ = 0x7fffffff;
                auVar165._0_8_ = 0x7fffffff7fffffff;
                auVar165._12_4_ = 0x7fffffff;
                auVar102 = vandps_avx(auVar102,auVar165);
                if (auVar102._0_4_ < fVar211) {
                  auVar191._8_4_ = 0x7fffffff;
                  auVar191._0_8_ = 0x7fffffff7fffffff;
                  auVar191._12_4_ = 0x7fffffff;
                  auVar102 = vandps_avx(auVar104,auVar191);
                  if (auVar102._0_4_ <
                      (float)local_7e0._0_4_ * 1.9073486e-06 + fVar211 + auVar169._0_4_) {
                    fVar211 = auVar97._0_4_ + (float)local_8a0._0_4_;
                    if (fVar211 < fVar185) {
                      bVar82 = 0;
                      goto LAB_0104fdfa;
                    }
                    fVar212 = *(float *)(ray + k * 4 + 0x100);
                    if (fVar212 < fVar211) {
                      bVar82 = 0;
                      goto LAB_0104fdfa;
                    }
                    auVar169 = vmovshdup_avx(auVar97);
                    bVar82 = 0;
                    if ((auVar169._0_4_ < 0.0) || (bVar82 = 0, 1.0 < auVar169._0_4_))
                    goto LAB_0104fdfa;
                    auVar169 = vrsqrtss_avx(local_ac0._0_16_,local_ac0._0_16_);
                    fVar213 = auVar169._0_4_;
                    pGVar9 = (context->scene->geometries).items[local_9b8].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                      bVar82 = 0;
                      goto LAB_0104fdfa;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar82 = 1, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_0104fdfa;
                    auVar169 = ZEXT416((uint)(fVar213 * 1.5 +
                                             local_ac0._0_4_ * -0.5 * fVar213 * fVar213 * fVar213));
                    auVar169 = vshufps_avx(auVar169,auVar169,0);
                    auVar192._0_4_ = auVar169._0_4_ * (float)local_ae0._0_4_;
                    auVar192._4_4_ = auVar169._4_4_ * (float)local_ae0._4_4_;
                    auVar192._8_4_ = auVar169._8_4_ * fStack_ad8;
                    auVar192._12_4_ = auVar169._12_4_ * fStack_ad4;
                    auVar138._0_4_ = auVar273._0_4_ + auVar94._0_4_ * auVar192._0_4_;
                    auVar138._4_4_ = auVar273._4_4_ + auVar94._4_4_ * auVar192._4_4_;
                    auVar138._8_4_ = auVar273._8_4_ + auVar94._8_4_ * auVar192._8_4_;
                    auVar138._12_4_ = auVar273._12_4_ + auVar94._12_4_ * auVar192._12_4_;
                    auVar169 = vshufps_avx(auVar192,auVar192,0xc9);
                    auVar102 = vshufps_avx(auVar273,auVar273,0xc9);
                    auVar221._0_4_ = auVar102._0_4_ * auVar192._0_4_;
                    auVar221._4_4_ = auVar102._4_4_ * auVar192._4_4_;
                    auVar221._8_4_ = auVar102._8_4_ * auVar192._8_4_;
                    auVar221._12_4_ = auVar102._12_4_ * auVar192._12_4_;
                    auVar193._0_4_ = auVar169._0_4_ * auVar273._0_4_;
                    auVar193._4_4_ = auVar169._4_4_ * auVar273._4_4_;
                    auVar193._8_4_ = auVar169._8_4_ * auVar273._8_4_;
                    auVar193._12_4_ = auVar169._12_4_ * auVar273._12_4_;
                    auVar166 = vsubps_avx(auVar193,auVar221);
                    auVar169 = vshufps_avx(auVar166,auVar166,0xc9);
                    auVar102 = vshufps_avx(auVar138,auVar138,0xc9);
                    auVar194._0_4_ = auVar102._0_4_ * auVar169._0_4_;
                    auVar194._4_4_ = auVar102._4_4_ * auVar169._4_4_;
                    auVar194._8_4_ = auVar102._8_4_ * auVar169._8_4_;
                    auVar194._12_4_ = auVar102._12_4_ * auVar169._12_4_;
                    auVar169 = vshufps_avx(auVar166,auVar166,0xd2);
                    auVar139._0_4_ = auVar138._0_4_ * auVar169._0_4_;
                    auVar139._4_4_ = auVar138._4_4_ * auVar169._4_4_;
                    auVar139._8_4_ = auVar138._8_4_ * auVar169._8_4_;
                    auVar139._12_4_ = auVar138._12_4_ * auVar169._12_4_;
                    auVar169 = vsubps_avx(auVar194,auVar139);
                    pRVar11 = context->user;
                    local_5c0 = vshufps_avx(auVar97,auVar97,0x55);
                    auStack_610 = vshufps_avx(auVar169,auVar169,0x55);
                    local_600 = vshufps_avx(auVar169,auVar169,0xaa);
                    local_5e0 = vshufps_avx(auVar169,auVar169,0);
                    local_620 = (RTCHitN  [16])auStack_610;
                    local_5a0 = ZEXT832(0) << 0x20;
                    local_580 = local_4e0._0_8_;
                    uStack_578 = local_4e0._8_8_;
                    uStack_570 = local_4e0._16_8_;
                    uStack_568 = local_4e0._24_8_;
                    local_560 = local_4c0._0_8_;
                    uStack_558 = local_4c0._8_8_;
                    uStack_550 = local_4c0._16_8_;
                    uStack_548 = local_4c0._24_8_;
                    *(undefined8 *)(local_9c0 + 8) = local_980._0_8_;
                    *(undefined8 *)(local_9c0 + 10) = local_980._8_8_;
                    *(undefined8 *)(local_9c0 + 0xc) = local_980._16_8_;
                    *(undefined8 *)(local_9c0 + 0xe) = local_980._24_8_;
                    *(undefined8 *)local_9c0 = local_980._0_8_;
                    *(undefined8 *)(local_9c0 + 2) = local_980._8_8_;
                    *(undefined8 *)(local_9c0 + 4) = local_980._16_8_;
                    *(undefined8 *)(local_9c0 + 6) = local_980._24_8_;
                    local_540 = pRVar11->instID[0];
                    local_520 = pRVar11->instPrimID[0];
                    *(float *)(ray + k * 4 + 0x100) = fVar211;
                    local_b40 = *local_9c8;
                    local_b30 = *local_9d0;
                    local_9b0.valid = (int *)local_b40;
                    local_9b0.geometryUserPtr = pGVar9->userPtr;
                    local_9b0.context = context->user;
                    local_9b0.hit = local_620;
                    local_9b0.N = 8;
                    local_9b0.ray = (RTCRayN *)ray;
                    local_5f0 = local_600;
                    local_5d0 = local_5e0;
                    local_5b0 = local_5c0;
                    uStack_53c = local_540;
                    uStack_538 = local_540;
                    uStack_534 = local_540;
                    uStack_530 = local_540;
                    uStack_52c = local_540;
                    uStack_528 = local_540;
                    uStack_524 = local_540;
                    uStack_51c = local_520;
                    uStack_518 = local_520;
                    uStack_514 = local_520;
                    uStack_510 = local_520;
                    uStack_50c = local_520;
                    uStack_508 = local_520;
                    uStack_504 = local_520;
                    if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar9->occlusionFilterN)(&local_9b0);
                    }
                    auVar287 = ZEXT3264(local_a80);
                    auVar370 = ZEXT3264(local_a00);
                    auVar414 = ZEXT3264(local_a20);
                    auVar97 = vpcmpeqd_avx(local_b40,ZEXT816(0) << 0x40);
                    auVar169 = vpcmpeqd_avx(local_b30,ZEXT816(0) << 0x40);
                    auVar178._16_16_ = auVar169;
                    auVar178._0_16_ = auVar97;
                    auVar105 = local_980 & ~auVar178;
                    fVar213 = (float)local_900._0_4_;
                    fVar214 = (float)local_900._4_4_;
                    fVar215 = fStack_8f8;
                    fVar216 = fStack_8f4;
                    fVar217 = fStack_8f0;
                    fVar230 = fStack_8ec;
                    fVar231 = fStack_8e8;
                    if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar105 >> 0x7f,0) == '\0') &&
                          (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar105 >> 0xbf,0) == '\0') &&
                        (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar105[0x1f]) {
                      auVar224 = local_a40._0_28_;
                    }
                    else {
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var12)(&local_9b0);
                        auVar287 = ZEXT3264(local_a80);
                        auVar414 = ZEXT3264(local_a20);
                        auVar370 = ZEXT3264(local_a00);
                        fVar213 = (float)local_900._0_4_;
                        fVar214 = (float)local_900._4_4_;
                        fVar215 = fStack_8f8;
                        fVar216 = fStack_8f4;
                        fVar217 = fStack_8f0;
                        fVar230 = fStack_8ec;
                        fVar231 = fStack_8e8;
                      }
                      auVar97 = vpcmpeqd_avx(local_b40,ZEXT816(0) << 0x40);
                      auVar169 = vpcmpeqd_avx(local_b30,ZEXT816(0) << 0x40);
                      auVar117._16_16_ = auVar169;
                      auVar117._0_16_ = auVar97;
                      auVar155._8_4_ = 0xff800000;
                      auVar155._0_8_ = 0xff800000ff800000;
                      auVar155._12_4_ = 0xff800000;
                      auVar155._16_4_ = 0xff800000;
                      auVar155._20_4_ = 0xff800000;
                      auVar155._24_4_ = 0xff800000;
                      auVar155._28_4_ = 0xff800000;
                      auVar105 = vblendvps_avx(auVar155,*(undefined1 (*) [32])
                                                         (local_9b0.ray + 0x100),auVar117);
                      *(undefined1 (*) [32])(local_9b0.ray + 0x100) = auVar105;
                      auVar105 = local_980 & ~auVar117;
                      auVar224 = local_a40._0_28_;
                      if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar105 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar105 >> 0x7f,0) != '\0') ||
                            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar105 >> 0xbf,0) != '\0') ||
                          (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar105[0x1f] < '\0') {
                        bVar82 = 1;
                        goto LAB_0104fdff;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar212;
                    bVar82 = 0;
                    goto LAB_0104fdff;
                  }
                }
                bVar92 = uVar86 < 4;
                uVar86 = uVar86 + 1;
              } while (uVar86 != 5);
              bVar92 = false;
              bVar82 = 5;
LAB_0104fdfa:
              auVar224 = local_a40._0_28_;
              auVar287 = ZEXT3264(local_a80);
              auVar370 = ZEXT3264(local_a00);
              auVar414 = ZEXT3264(local_a20);
              fVar213 = (float)local_900._0_4_;
              fVar214 = (float)local_900._4_4_;
              fVar215 = fStack_8f8;
              fVar216 = fStack_8f4;
              fVar217 = fStack_8f0;
              fVar230 = fStack_8ec;
              fVar231 = fStack_8e8;
LAB_0104fdff:
              bVar91 = (bool)(bVar91 | bVar92 & bVar82);
              uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar115._4_4_ = uVar2;
              auVar115._0_4_ = uVar2;
              auVar115._8_4_ = uVar2;
              auVar115._12_4_ = uVar2;
              auVar115._16_4_ = uVar2;
              auVar115._20_4_ = uVar2;
              auVar115._24_4_ = uVar2;
              auVar115._28_4_ = uVar2;
              auVar157 = vcmpps_avx(_local_820,auVar115,2);
              fVar211 = auVar157._28_4_;
              auVar105 = vandps_avx(auVar157,local_660);
              auVar159 = ZEXT3264(auVar105);
              auVar157 = local_660 & auVar157;
              local_660 = auVar105;
            } while ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar157 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar157 >> 0x7f,0) != '\0') ||
                       (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar157 >> 0xbf,0) != '\0') ||
                     (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar157[0x1f] < '\0');
            auVar159 = ZEXT3264(local_400);
          }
          auVar156._0_4_ =
               auVar224._0_4_ * (float)local_860._0_4_ +
               (float)local_800._0_4_ * (float)local_880._0_4_ + fVar213 * (float)local_760._0_4_;
          auVar156._4_4_ =
               auVar224._4_4_ * (float)local_860._4_4_ +
               (float)local_800._4_4_ * (float)local_880._4_4_ + fVar214 * (float)local_760._4_4_;
          auVar156._8_4_ =
               auVar224._8_4_ * fStack_858 + fStack_7f8 * fStack_878 + fVar215 * fStack_758;
          auVar156._12_4_ =
               auVar224._12_4_ * fStack_854 + fStack_7f4 * fStack_874 + fVar216 * fStack_754;
          auVar156._16_4_ =
               auVar224._16_4_ * fStack_850 + fStack_7f0 * fStack_870 + fVar217 * fStack_750;
          auVar156._20_4_ =
               auVar224._20_4_ * fStack_84c + fStack_7ec * fStack_86c + fVar230 * fStack_74c;
          auVar156._24_4_ =
               auVar224._24_4_ * fStack_848 + fStack_7e8 * fStack_868 + fVar231 * fStack_748;
          auVar156._28_4_ = fVar211 + fVar211 + auVar159._28_4_;
          auVar179._8_4_ = 0x7fffffff;
          auVar179._0_8_ = 0x7fffffff7fffffff;
          auVar179._12_4_ = 0x7fffffff;
          auVar179._16_4_ = 0x7fffffff;
          auVar179._20_4_ = 0x7fffffff;
          auVar179._24_4_ = 0x7fffffff;
          auVar179._28_4_ = 0x7fffffff;
          auVar105 = vandps_avx(auVar156,auVar179);
          auVar180._8_4_ = 0x3e99999a;
          auVar180._0_8_ = 0x3e99999a3e99999a;
          auVar180._12_4_ = 0x3e99999a;
          auVar180._16_4_ = 0x3e99999a;
          auVar180._20_4_ = 0x3e99999a;
          auVar180._24_4_ = 0x3e99999a;
          auVar180._28_4_ = 0x3e99999a;
          auVar105 = vcmpps_avx(auVar105,auVar180,1);
          auVar157 = vorps_avx(auVar105,local_700);
          auVar181._0_4_ = (float)local_840._0_4_ + (float)local_8e0;
          auVar181._4_4_ = (float)local_840._4_4_ + local_8e0._4_4_;
          auVar181._8_4_ = fStack_838 + (float)uStack_8d8;
          auVar181._12_4_ = fStack_834 + uStack_8d8._4_4_;
          auVar181._16_4_ = fStack_830 + (float)uStack_8d0;
          auVar181._20_4_ = fStack_82c + uStack_8d0._4_4_;
          auVar181._24_4_ = fStack_828 + (float)uStack_8c8;
          auVar181._28_4_ = fStack_824 + uStack_8c8._4_4_;
          auVar105 = vcmpps_avx(auVar181,auVar115,2);
          _local_880 = vandps_avx(auVar105,local_6e0);
          auVar182._8_4_ = 3;
          auVar182._0_8_ = 0x300000003;
          auVar182._12_4_ = 3;
          auVar182._16_4_ = 3;
          auVar182._20_4_ = 3;
          auVar182._24_4_ = 3;
          auVar182._28_4_ = 3;
          auVar210._8_4_ = 2;
          auVar210._0_8_ = 0x200000002;
          auVar210._12_4_ = 2;
          auVar210._16_4_ = 2;
          auVar210._20_4_ = 2;
          auVar210._24_4_ = 2;
          auVar210._28_4_ = 2;
          auVar105 = vblendvps_avx(auVar210,auVar182,auVar157);
          auVar97 = vpcmpgtd_avx(auVar105._16_16_,local_740);
          auVar169 = vpshufd_avx(local_720._0_16_,0);
          auVar169 = vpcmpgtd_avx(auVar105._0_16_,auVar169);
          auVar183._16_16_ = auVar97;
          auVar183._0_16_ = auVar115._0_16_;
          _local_860 = vblendps_avx(ZEXT1632(auVar169),auVar183,0xf0);
          auVar105 = vandnps_avx(_local_860,_local_880);
          auVar157 = _local_880 & ~_local_860;
          local_680 = auVar105;
          if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar157 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar157 >> 0x7f,0) != '\0') ||
                (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar157 >> 0xbf,0) != '\0') ||
              (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar157[0x1f] < '\0') {
            local_820._4_4_ = local_8e0._4_4_ + local_400._4_4_;
            local_820._0_4_ = (float)local_8e0 + local_400._0_4_;
            fStack_818 = (float)uStack_8d8 + local_400._8_4_;
            fStack_814 = uStack_8d8._4_4_ + local_400._12_4_;
            fStack_810 = (float)uStack_8d0 + local_400._16_4_;
            fStack_80c = uStack_8d0._4_4_ + local_400._20_4_;
            fStack_808 = (float)uStack_8c8 + local_400._24_4_;
            fStack_804 = uStack_8c8._4_4_ + local_400._28_4_;
            _local_a60 = local_400;
            do {
              auVar118._8_4_ = 0x7f800000;
              auVar118._0_8_ = 0x7f8000007f800000;
              auVar118._12_4_ = 0x7f800000;
              auVar118._16_4_ = 0x7f800000;
              auVar118._20_4_ = 0x7f800000;
              auVar118._24_4_ = 0x7f800000;
              auVar118._28_4_ = 0x7f800000;
              auVar157 = vblendvps_avx(auVar118,_local_a60,auVar105);
              auVar13 = vshufps_avx(auVar157,auVar157,0xb1);
              auVar13 = vminps_avx(auVar157,auVar13);
              auVar14 = vshufpd_avx(auVar13,auVar13,5);
              auVar13 = vminps_avx(auVar13,auVar14);
              auVar14 = vperm2f128_avx(auVar13,auVar13,1);
              auVar13 = vminps_avx(auVar13,auVar14);
              auVar13 = vcmpps_avx(auVar157,auVar13,0);
              auVar14 = auVar105 & auVar13;
              auVar157 = auVar105;
              if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar14 >> 0x7f,0) != '\0') ||
                    (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar14 >> 0xbf,0) != '\0') ||
                  (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar14[0x1f] < '\0') {
                auVar157 = vandps_avx(auVar13,auVar105);
              }
              uVar84 = vmovmskps_avx(auVar157);
              uVar83 = 0;
              if (uVar84 != 0) {
                for (; (uVar84 >> uVar83 & 1) == 0; uVar83 = uVar83 + 1) {
                }
              }
              uVar86 = (ulong)uVar83;
              local_680 = auVar105;
              *(undefined4 *)(local_680 + uVar86 * 4) = 0;
              fVar211 = local_1c0[uVar86];
              uVar83 = *(uint *)(local_3e0 + uVar86 * 4);
              fVar212 = auVar5._0_4_;
              if ((float)local_940._0_4_ < 0.0) {
                fVar212 = sqrtf((float)local_940._0_4_);
              }
              auVar169 = vminps_avx(_local_af0,_local_b10);
              auVar97 = vmaxps_avx(_local_af0,_local_b10);
              auVar102 = vminps_avx(_local_b00,_local_b20);
              auVar166 = vminps_avx(auVar169,auVar102);
              auVar169 = vmaxps_avx(_local_b00,_local_b20);
              auVar102 = vmaxps_avx(auVar97,auVar169);
              auVar195._8_4_ = 0x7fffffff;
              auVar195._0_8_ = 0x7fffffff7fffffff;
              auVar195._12_4_ = 0x7fffffff;
              auVar97 = vandps_avx(auVar166,auVar195);
              auVar169 = vandps_avx(auVar102,auVar195);
              auVar97 = vmaxps_avx(auVar97,auVar169);
              auVar169 = vmovshdup_avx(auVar97);
              auVar169 = vmaxss_avx(auVar169,auVar97);
              auVar97 = vshufpd_avx(auVar97,auVar97,1);
              auVar97 = vmaxss_avx(auVar97,auVar169);
              local_aa0._0_4_ = auVar97._0_4_ * 1.9073486e-06;
              local_780._0_4_ = fVar212 * 1.9073486e-06;
              local_7e0._0_16_ = vshufps_avx(auVar102,auVar102,0xff);
              auVar97 = vinsertps_avx(ZEXT416(uVar83),ZEXT416((uint)fVar211),0x10);
              bVar92 = true;
              uVar86 = 0;
              do {
                auVar169 = vmovshdup_avx(auVar97);
                fVar240 = auVar169._0_4_;
                fVar215 = 1.0 - fVar240;
                auVar169 = vshufps_avx(auVar97,auVar97,0x55);
                fVar211 = auVar169._0_4_;
                fVar212 = auVar169._4_4_;
                fVar213 = auVar169._8_4_;
                fVar214 = auVar169._12_4_;
                auVar169 = vshufps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar215),0);
                fVar216 = auVar169._0_4_;
                fVar217 = auVar169._4_4_;
                fVar230 = auVar169._8_4_;
                fVar231 = auVar169._12_4_;
                fVar232 = (float)local_b00._0_4_ * fVar211 + (float)local_b10._0_4_ * fVar216;
                fVar234 = (float)local_b00._4_4_ * fVar212 + (float)local_b10._4_4_ * fVar217;
                fVar236 = fStack_af8 * fVar213 + fStack_b08 * fVar230;
                fVar238 = fStack_af4 * fVar214 + fStack_b04 * fVar231;
                auVar246._0_4_ =
                     fVar216 * ((float)local_b10._0_4_ * fVar211 + fVar216 * (float)local_af0._0_4_)
                     + fVar211 * fVar232;
                auVar246._4_4_ =
                     fVar217 * ((float)local_b10._4_4_ * fVar212 + fVar217 * (float)local_af0._4_4_)
                     + fVar212 * fVar234;
                auVar246._8_4_ =
                     fVar230 * (fStack_b08 * fVar213 + fVar230 * fStack_ae8) + fVar213 * fVar236;
                auVar246._12_4_ =
                     fVar231 * (fStack_b04 * fVar214 + fVar231 * fStack_ae4) + fVar214 * fVar238;
                auVar196._0_4_ =
                     fVar216 * fVar232 +
                     fVar211 * (fVar211 * (float)local_b20._0_4_ + (float)local_b00._0_4_ * fVar216)
                ;
                auVar196._4_4_ =
                     fVar217 * fVar234 +
                     fVar212 * (fVar212 * (float)local_b20._4_4_ + (float)local_b00._4_4_ * fVar217)
                ;
                auVar196._8_4_ =
                     fVar230 * fVar236 + fVar213 * (fVar213 * fStack_b18 + fStack_af8 * fVar230);
                auVar196._12_4_ =
                     fVar231 * fVar238 + fVar214 * (fVar214 * fStack_b14 + fStack_af4 * fVar231);
                auVar169 = vshufps_avx(auVar97,auVar97,0);
                auVar140._0_4_ = auVar169._0_4_ * (float)local_930._0_4_ + 0.0;
                auVar140._4_4_ = auVar169._4_4_ * (float)local_930._4_4_ + 0.0;
                auVar140._8_4_ = auVar169._8_4_ * fStack_928 + 0.0;
                auVar140._12_4_ = auVar169._12_4_ * fStack_924 + 0.0;
                auVar101._0_4_ = fVar216 * auVar246._0_4_ + fVar211 * auVar196._0_4_;
                auVar101._4_4_ = fVar217 * auVar246._4_4_ + fVar212 * auVar196._4_4_;
                auVar101._8_4_ = fVar230 * auVar246._8_4_ + fVar213 * auVar196._8_4_;
                auVar101._12_4_ = fVar231 * auVar246._12_4_ + fVar214 * auVar196._12_4_;
                local_8c0._0_16_ = auVar101;
                auVar169 = vsubps_avx(auVar140,auVar101);
                _local_ae0 = auVar169;
                auVar169 = vdpps_avx(auVar169,auVar169,0x7f);
                local_ac0._0_16_ = auVar169;
                if (auVar169._0_4_ < 0.0) {
                  fVar211 = sqrtf(auVar169._0_4_);
                }
                else {
                  auVar169 = vsqrtss_avx(auVar169,auVar169);
                  fVar211 = auVar169._0_4_;
                }
                auVar169 = vsubps_avx(auVar196,auVar246);
                auVar274._0_4_ = auVar169._0_4_ * 3.0;
                auVar274._4_4_ = auVar169._4_4_ * 3.0;
                auVar274._8_4_ = auVar169._8_4_ * 3.0;
                auVar274._12_4_ = auVar169._12_4_ * 3.0;
                auVar169 = vshufps_avx(ZEXT416((uint)(fVar240 * 6.0)),ZEXT416((uint)(fVar240 * 6.0))
                                       ,0);
                auVar102 = ZEXT416((uint)((fVar215 - (fVar240 + fVar240)) * 6.0));
                auVar166 = vshufps_avx(auVar102,auVar102,0);
                auVar102 = ZEXT416((uint)((fVar240 - (fVar215 + fVar215)) * 6.0));
                auVar197 = vshufps_avx(auVar102,auVar102,0);
                auVar6 = vshufps_avx(ZEXT416((uint)(fVar215 * 6.0)),ZEXT416((uint)(fVar215 * 6.0)),0
                                    );
                auVar102 = vdpps_avx(auVar274,auVar274,0x7f);
                auVar141._0_4_ =
                     auVar6._0_4_ * (float)local_af0._0_4_ +
                     auVar197._0_4_ * (float)local_b10._0_4_ +
                     auVar169._0_4_ * (float)local_b20._0_4_ +
                     auVar166._0_4_ * (float)local_b00._0_4_;
                auVar141._4_4_ =
                     auVar6._4_4_ * (float)local_af0._4_4_ +
                     auVar197._4_4_ * (float)local_b10._4_4_ +
                     auVar169._4_4_ * (float)local_b20._4_4_ +
                     auVar166._4_4_ * (float)local_b00._4_4_;
                auVar141._8_4_ =
                     auVar6._8_4_ * fStack_ae8 +
                     auVar197._8_4_ * fStack_b08 +
                     auVar169._8_4_ * fStack_b18 + auVar166._8_4_ * fStack_af8;
                auVar141._12_4_ =
                     auVar6._12_4_ * fStack_ae4 +
                     auVar197._12_4_ * fStack_b04 +
                     auVar169._12_4_ * fStack_b14 + auVar166._12_4_ * fStack_af4;
                auVar169 = vblendps_avx(auVar102,_DAT_01f7aa10,0xe);
                auVar166 = vrsqrtss_avx(auVar169,auVar169);
                fVar213 = auVar166._0_4_;
                fVar212 = auVar102._0_4_;
                auVar166 = vdpps_avx(auVar274,auVar141,0x7f);
                auVar197 = vshufps_avx(auVar102,auVar102,0);
                auVar142._0_4_ = auVar141._0_4_ * auVar197._0_4_;
                auVar142._4_4_ = auVar141._4_4_ * auVar197._4_4_;
                auVar142._8_4_ = auVar141._8_4_ * auVar197._8_4_;
                auVar142._12_4_ = auVar141._12_4_ * auVar197._12_4_;
                auVar166 = vshufps_avx(auVar166,auVar166,0);
                auVar222._0_4_ = auVar274._0_4_ * auVar166._0_4_;
                auVar222._4_4_ = auVar274._4_4_ * auVar166._4_4_;
                auVar222._8_4_ = auVar274._8_4_ * auVar166._8_4_;
                auVar222._12_4_ = auVar274._12_4_ * auVar166._12_4_;
                auVar6 = vsubps_avx(auVar142,auVar222);
                auVar166 = vrcpss_avx(auVar169,auVar169);
                auVar169 = vmaxss_avx(ZEXT416((uint)local_aa0._0_4_),
                                      ZEXT416((uint)(auVar97._0_4_ * (float)local_780._0_4_)));
                auVar166 = ZEXT416((uint)(auVar166._0_4_ * (2.0 - fVar212 * auVar166._0_4_)));
                auVar166 = vshufps_avx(auVar166,auVar166,0);
                uVar79 = CONCAT44(auVar274._4_4_,auVar274._0_4_);
                auVar329._0_8_ = uVar79 ^ 0x8000000080000000;
                auVar329._8_4_ = -auVar274._8_4_;
                auVar329._12_4_ = -auVar274._12_4_;
                auVar197 = ZEXT416((uint)(fVar213 * 1.5 +
                                         fVar212 * -0.5 * fVar213 * fVar213 * fVar213));
                auVar197 = vshufps_avx(auVar197,auVar197,0);
                auVar198._0_4_ = auVar197._0_4_ * auVar6._0_4_ * auVar166._0_4_;
                auVar198._4_4_ = auVar197._4_4_ * auVar6._4_4_ * auVar166._4_4_;
                auVar198._8_4_ = auVar197._8_4_ * auVar6._8_4_ * auVar166._8_4_;
                auVar198._12_4_ = auVar197._12_4_ * auVar6._12_4_ * auVar166._12_4_;
                local_960._0_4_ = auVar274._0_4_ * auVar197._0_4_;
                local_960._4_4_ = auVar274._4_4_ * auVar197._4_4_;
                local_960._8_4_ = auVar274._8_4_ * auVar197._8_4_;
                local_960._12_4_ = auVar274._12_4_ * auVar197._12_4_;
                if (fVar212 < 0.0) {
                  fVar212 = sqrtf(fVar212);
                }
                else {
                  auVar102 = vsqrtss_avx(auVar102,auVar102);
                  fVar212 = auVar102._0_4_;
                }
                auVar102 = vdpps_avx(_local_ae0,local_960._0_16_,0x7f);
                fVar211 = ((float)local_aa0._0_4_ / fVar212) * (fVar211 + 1.0) +
                          fVar211 * (float)local_aa0._0_4_ + auVar169._0_4_;
                auVar166 = vdpps_avx(auVar329,local_960._0_16_,0x7f);
                auVar197 = vdpps_avx(_local_ae0,auVar198,0x7f);
                auVar6 = vdpps_avx(_local_930,local_960._0_16_,0x7f);
                auVar7 = vdpps_avx(_local_ae0,auVar329,0x7f);
                fVar212 = auVar166._0_4_ + auVar197._0_4_;
                fVar213 = auVar102._0_4_;
                auVar103._0_4_ = fVar213 * fVar213;
                auVar103._4_4_ = auVar102._4_4_ * auVar102._4_4_;
                auVar103._8_4_ = auVar102._8_4_ * auVar102._8_4_;
                auVar103._12_4_ = auVar102._12_4_ * auVar102._12_4_;
                auVar197 = vsubps_avx(local_ac0._0_16_,auVar103);
                local_960._0_16_ = ZEXT416((uint)fVar212);
                auVar166 = vdpps_avx(_local_ae0,_local_930,0x7f);
                fVar214 = auVar7._0_4_ - fVar213 * fVar212;
                fVar213 = auVar166._0_4_ - fVar213 * auVar6._0_4_;
                auVar166 = vrsqrtss_avx(auVar197,auVar197);
                fVar215 = auVar197._0_4_;
                fVar212 = auVar166._0_4_;
                fVar212 = fVar212 * 1.5 + fVar215 * -0.5 * fVar212 * fVar212 * fVar212;
                if (fVar215 < 0.0) {
                  local_920._0_4_ = fVar214;
                  local_7a0._0_4_ = fVar213;
                  local_7c0._0_4_ = fVar212;
                  fVar215 = sqrtf(fVar215);
                  fVar212 = (float)local_7c0._0_4_;
                  fVar214 = (float)local_920._0_4_;
                  fVar213 = (float)local_7a0._0_4_;
                }
                else {
                  auVar166 = vsqrtss_avx(auVar197,auVar197);
                  fVar215 = auVar166._0_4_;
                }
                auVar7 = vpermilps_avx(local_8c0._0_16_,0xff);
                auVar94 = vshufps_avx(auVar274,auVar274,0xff);
                fVar214 = fVar214 * fVar212 - auVar94._0_4_;
                auVar223._0_8_ = auVar6._0_8_ ^ 0x8000000080000000;
                auVar223._8_4_ = auVar6._8_4_ ^ 0x80000000;
                auVar223._12_4_ = auVar6._12_4_ ^ 0x80000000;
                auVar247._0_4_ = -fVar214;
                auVar247._4_4_ = 0x80000000;
                auVar247._8_4_ = 0x80000000;
                auVar247._12_4_ = 0x80000000;
                auVar166 = vinsertps_avx(auVar247,ZEXT416((uint)(fVar213 * fVar212)),0x1c);
                auVar6 = vmovsldup_avx(ZEXT416((uint)(local_960._0_4_ * fVar213 * fVar212 -
                                                     auVar6._0_4_ * fVar214)));
                auVar166 = vdivps_avx(auVar166,auVar6);
                auVar197 = vinsertps_avx(local_960._0_16_,auVar223,0x10);
                auVar197 = vdivps_avx(auVar197,auVar6);
                auVar6 = vmovsldup_avx(auVar102);
                auVar104 = ZEXT416((uint)(fVar215 - auVar7._0_4_));
                auVar7 = vmovsldup_avx(auVar104);
                auVar167._0_4_ = auVar6._0_4_ * auVar166._0_4_ + auVar7._0_4_ * auVar197._0_4_;
                auVar167._4_4_ = auVar6._4_4_ * auVar166._4_4_ + auVar7._4_4_ * auVar197._4_4_;
                auVar167._8_4_ = auVar6._8_4_ * auVar166._8_4_ + auVar7._8_4_ * auVar197._8_4_;
                auVar167._12_4_ = auVar6._12_4_ * auVar166._12_4_ + auVar7._12_4_ * auVar197._12_4_;
                auVar97 = vsubps_avx(auVar97,auVar167);
                auVar168._8_4_ = 0x7fffffff;
                auVar168._0_8_ = 0x7fffffff7fffffff;
                auVar168._12_4_ = 0x7fffffff;
                auVar102 = vandps_avx(auVar102,auVar168);
                if (auVar102._0_4_ < fVar211) {
                  auVar199._8_4_ = 0x7fffffff;
                  auVar199._0_8_ = 0x7fffffff7fffffff;
                  auVar199._12_4_ = 0x7fffffff;
                  auVar102 = vandps_avx(auVar104,auVar199);
                  if (auVar102._0_4_ <
                      (float)local_7e0._0_4_ * 1.9073486e-06 + fVar211 + auVar169._0_4_) {
                    fVar211 = auVar97._0_4_ + (float)local_8a0._0_4_;
                    auVar287 = ZEXT3264(local_a80);
                    if (fVar211 < fVar185) {
                      bVar82 = 0;
                      goto LAB_010509f1;
                    }
                    fVar212 = *(float *)(ray + k * 4 + 0x100);
                    auVar370 = ZEXT3264(local_a00);
                    if (fVar212 < fVar211) {
                      bVar82 = 0;
                      goto LAB_010509f1;
                    }
                    auVar169 = vmovshdup_avx(auVar97);
                    bVar82 = 0;
                    if ((auVar169._0_4_ < 0.0) || (bVar82 = 0, 1.0 < auVar169._0_4_))
                    goto LAB_010509f1;
                    auVar169 = vrsqrtss_avx(local_ac0._0_16_,local_ac0._0_16_);
                    fVar213 = auVar169._0_4_;
                    pGVar9 = (context->scene->geometries).items[local_9b8].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                      bVar82 = 0;
                      goto LAB_010509f1;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01050af8:
                      bVar82 = 1;
                    }
                    else {
                      auVar169 = ZEXT416((uint)(fVar213 * 1.5 +
                                               local_ac0._0_4_ * -0.5 * fVar213 * fVar213 * fVar213)
                                        );
                      auVar169 = vshufps_avx(auVar169,auVar169,0);
                      auVar170._0_4_ = auVar169._0_4_ * (float)local_ae0._0_4_;
                      auVar170._4_4_ = auVar169._4_4_ * (float)local_ae0._4_4_;
                      auVar170._8_4_ = auVar169._8_4_ * fStack_ad8;
                      auVar170._12_4_ = auVar169._12_4_ * fStack_ad4;
                      auVar143._0_4_ = auVar274._0_4_ + auVar94._0_4_ * auVar170._0_4_;
                      auVar143._4_4_ = auVar274._4_4_ + auVar94._4_4_ * auVar170._4_4_;
                      auVar143._8_4_ = auVar274._8_4_ + auVar94._8_4_ * auVar170._8_4_;
                      auVar143._12_4_ = auVar274._12_4_ + auVar94._12_4_ * auVar170._12_4_;
                      auVar169 = vshufps_avx(auVar170,auVar170,0xc9);
                      auVar102 = vshufps_avx(auVar274,auVar274,0xc9);
                      auVar171._0_4_ = auVar102._0_4_ * auVar170._0_4_;
                      auVar171._4_4_ = auVar102._4_4_ * auVar170._4_4_;
                      auVar171._8_4_ = auVar102._8_4_ * auVar170._8_4_;
                      auVar171._12_4_ = auVar102._12_4_ * auVar170._12_4_;
                      auVar200._0_4_ = auVar274._0_4_ * auVar169._0_4_;
                      auVar200._4_4_ = auVar274._4_4_ * auVar169._4_4_;
                      auVar200._8_4_ = auVar274._8_4_ * auVar169._8_4_;
                      auVar200._12_4_ = auVar274._12_4_ * auVar169._12_4_;
                      auVar166 = vsubps_avx(auVar200,auVar171);
                      auVar169 = vshufps_avx(auVar166,auVar166,0xc9);
                      auVar102 = vshufps_avx(auVar143,auVar143,0xc9);
                      auVar201._0_4_ = auVar102._0_4_ * auVar169._0_4_;
                      auVar201._4_4_ = auVar102._4_4_ * auVar169._4_4_;
                      auVar201._8_4_ = auVar102._8_4_ * auVar169._8_4_;
                      auVar201._12_4_ = auVar102._12_4_ * auVar169._12_4_;
                      auVar169 = vshufps_avx(auVar166,auVar166,0xd2);
                      auVar144._0_4_ = auVar143._0_4_ * auVar169._0_4_;
                      auVar144._4_4_ = auVar143._4_4_ * auVar169._4_4_;
                      auVar144._8_4_ = auVar143._8_4_ * auVar169._8_4_;
                      auVar144._12_4_ = auVar143._12_4_ * auVar169._12_4_;
                      auVar169 = vsubps_avx(auVar201,auVar144);
                      pRVar11 = context->user;
                      local_5c0 = vshufps_avx(auVar97,auVar97,0x55);
                      auStack_610 = vshufps_avx(auVar169,auVar169,0x55);
                      local_600 = vshufps_avx(auVar169,auVar169,0xaa);
                      local_5e0 = vshufps_avx(auVar169,auVar169,0);
                      local_620 = (RTCHitN  [16])auStack_610;
                      local_5a0 = ZEXT832(0) << 0x20;
                      local_580 = local_4e0._0_8_;
                      uStack_578 = local_4e0._8_8_;
                      uStack_570 = local_4e0._16_8_;
                      uStack_568 = local_4e0._24_8_;
                      local_560 = local_4c0._0_8_;
                      uStack_558 = local_4c0._8_8_;
                      uStack_550 = local_4c0._16_8_;
                      uStack_548 = local_4c0._24_8_;
                      *(undefined8 *)(local_9c0 + 8) = local_980._0_8_;
                      *(undefined8 *)(local_9c0 + 10) = local_980._8_8_;
                      *(undefined8 *)(local_9c0 + 0xc) = local_980._16_8_;
                      *(undefined8 *)(local_9c0 + 0xe) = local_980._24_8_;
                      *(undefined8 *)local_9c0 = local_980._0_8_;
                      *(undefined8 *)(local_9c0 + 2) = local_980._8_8_;
                      *(undefined8 *)(local_9c0 + 4) = local_980._16_8_;
                      *(undefined8 *)(local_9c0 + 6) = local_980._24_8_;
                      local_540 = pRVar11->instID[0];
                      local_520 = pRVar11->instPrimID[0];
                      *(float *)(ray + k * 4 + 0x100) = fVar211;
                      local_b40 = *local_9c8;
                      local_b30 = *local_9d0;
                      local_9b0.valid = (int *)local_b40;
                      local_9b0.geometryUserPtr = pGVar9->userPtr;
                      local_9b0.context = context->user;
                      local_9b0.hit = local_620;
                      local_9b0.N = 8;
                      local_9b0.ray = (RTCRayN *)ray;
                      local_5f0 = local_600;
                      local_5d0 = local_5e0;
                      local_5b0 = local_5c0;
                      uStack_53c = local_540;
                      uStack_538 = local_540;
                      uStack_534 = local_540;
                      uStack_530 = local_540;
                      uStack_52c = local_540;
                      uStack_528 = local_540;
                      uStack_524 = local_540;
                      uStack_51c = local_520;
                      uStack_518 = local_520;
                      uStack_514 = local_520;
                      uStack_510 = local_520;
                      uStack_50c = local_520;
                      uStack_508 = local_520;
                      uStack_504 = local_520;
                      if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar9->occlusionFilterN)(&local_9b0);
                        auVar287 = ZEXT3264(local_a80);
                        auVar370 = ZEXT3264(local_a00);
                      }
                      auVar97 = vpcmpeqd_avx(local_b40,ZEXT816(0) << 0x40);
                      auVar169 = vpcmpeqd_avx(local_b30,ZEXT816(0) << 0x40);
                      auVar184._16_16_ = auVar169;
                      auVar184._0_16_ = auVar97;
                      auVar105 = local_980 & ~auVar184;
                      if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar105 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar105 >> 0x7f,0) != '\0') ||
                            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar105 >> 0xbf,0) != '\0') ||
                          (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar105[0x1f] < '\0') {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var12)(&local_9b0);
                          auVar287 = ZEXT3264(local_a80);
                          auVar370 = ZEXT3264(local_a00);
                        }
                        auVar97 = vpcmpeqd_avx(local_b40,ZEXT816(0) << 0x40);
                        auVar169 = vpcmpeqd_avx(local_b30,ZEXT816(0) << 0x40);
                        auVar119._16_16_ = auVar169;
                        auVar119._0_16_ = auVar97;
                        auVar158._8_4_ = 0xff800000;
                        auVar158._0_8_ = 0xff800000ff800000;
                        auVar158._12_4_ = 0xff800000;
                        auVar158._16_4_ = 0xff800000;
                        auVar158._20_4_ = 0xff800000;
                        auVar158._24_4_ = 0xff800000;
                        auVar158._28_4_ = 0xff800000;
                        auVar105 = vblendvps_avx(auVar158,*(undefined1 (*) [32])
                                                           (local_9b0.ray + 0x100),auVar119);
                        *(undefined1 (*) [32])(local_9b0.ray + 0x100) = auVar105;
                        auVar105 = local_980 & ~auVar119;
                        if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar105 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar105 >> 0x7f,0) != '\0')
                              || (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar105 >> 0xbf,0) != '\0') ||
                            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar105[0x1f] < '\0') goto LAB_01050af8;
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar212;
                      bVar82 = 0;
                    }
                    goto LAB_010509f6;
                  }
                }
                bVar92 = uVar86 < 4;
                uVar86 = uVar86 + 1;
              } while (uVar86 != 5);
              bVar92 = false;
              bVar82 = 5;
LAB_010509f1:
              auVar287 = ZEXT3264(local_a80);
              auVar370 = ZEXT3264(local_a00);
LAB_010509f6:
              bVar91 = (bool)(bVar91 | bVar92 & bVar82);
              uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar115._4_4_ = uVar2;
              auVar115._0_4_ = uVar2;
              auVar115._8_4_ = uVar2;
              auVar115._12_4_ = uVar2;
              auVar115._16_4_ = uVar2;
              auVar115._20_4_ = uVar2;
              auVar115._24_4_ = uVar2;
              auVar115._28_4_ = uVar2;
              auVar157 = vcmpps_avx(_local_820,auVar115,2);
              auVar105 = vandps_avx(auVar157,local_680);
              local_680 = local_680 & auVar157;
            } while ((((((((local_680 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_680 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_680 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_680 >> 0x7f,0) != '\0') ||
                       (local_680 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_680 >> 0xbf,0) != '\0') ||
                     (local_680 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_680[0x1f] < '\0');
            auVar414 = ZEXT3264(local_a20);
            local_680 = auVar105;
          }
          auVar105 = vandps_avx(local_6c0,local_6a0);
          auVar157 = vandps_avx(_local_880,_local_860);
          auVar228._0_4_ = (float)local_8e0 + local_440._0_4_;
          auVar228._4_4_ = local_8e0._4_4_ + local_440._4_4_;
          auVar228._8_4_ = (float)uStack_8d8 + local_440._8_4_;
          auVar228._12_4_ = uStack_8d8._4_4_ + local_440._12_4_;
          auVar228._16_4_ = (float)uStack_8d0 + local_440._16_4_;
          auVar228._20_4_ = uStack_8d0._4_4_ + local_440._20_4_;
          auVar228._24_4_ = (float)uStack_8c8 + local_440._24_4_;
          auVar228._28_4_ = uStack_8c8._4_4_ + local_440._28_4_;
          auVar13 = vcmpps_avx(auVar228,auVar115,2);
          auVar105 = vandps_avx(auVar13,auVar105);
          auVar229._0_4_ = (float)local_8e0 + local_400._0_4_;
          auVar229._4_4_ = local_8e0._4_4_ + local_400._4_4_;
          auVar229._8_4_ = (float)uStack_8d8 + local_400._8_4_;
          auVar229._12_4_ = uStack_8d8._4_4_ + local_400._12_4_;
          auVar229._16_4_ = (float)uStack_8d0 + local_400._16_4_;
          auVar229._20_4_ = uStack_8d0._4_4_ + local_400._20_4_;
          auVar229._24_4_ = (float)uStack_8c8 + local_400._24_4_;
          auVar229._28_4_ = uStack_8c8._4_4_ + local_400._28_4_;
          auVar13 = vcmpps_avx(auVar229,auVar115,2);
          auVar157 = vandps_avx(auVar13,auVar157);
          auVar157 = vorps_avx(auVar105,auVar157);
          if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar157 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar157 >> 0x7f,0) != '\0') ||
                (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar157 >> 0xbf,0) != '\0') ||
              (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar157[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar89 * 0x60) = auVar157;
            auVar105 = vblendvps_avx(local_400,_local_440,auVar105);
            *(undefined1 (*) [32])(auStack_160 + uVar89 * 0x60) = auVar105;
            uVar3 = vmovlps_avx(local_630);
            (&uStack_140)[uVar89 * 0xc] = uVar3;
            aiStack_138[uVar89 * 0x18] = local_ca4 + 1;
            iVar88 = iVar88 + 1;
          }
          goto LAB_0104f4b9;
        }
      }
      auVar370 = ZEXT3264(local_a00);
      auVar414 = ZEXT3264(local_a20);
      auVar287 = ZEXT3264(local_a80);
    }
LAB_0104f4b9:
    auVar278 = local_480;
    if (iVar88 == 0) break;
    uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar112._4_4_ = uVar2;
    auVar112._0_4_ = uVar2;
    auVar112._8_4_ = uVar2;
    auVar112._12_4_ = uVar2;
    auVar112._16_4_ = uVar2;
    auVar112._20_4_ = uVar2;
    auVar112._24_4_ = uVar2;
    auVar112._28_4_ = uVar2;
    uVar83 = -iVar88;
    pauVar85 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar88 - 1) * 0x60);
    while( true ) {
      auVar105 = pauVar85[1];
      auVar150._0_4_ = (float)local_8e0 + auVar105._0_4_;
      auVar150._4_4_ = local_8e0._4_4_ + auVar105._4_4_;
      auVar150._8_4_ = (float)uStack_8d8 + auVar105._8_4_;
      auVar150._12_4_ = uStack_8d8._4_4_ + auVar105._12_4_;
      auVar150._16_4_ = (float)uStack_8d0 + auVar105._16_4_;
      auVar150._20_4_ = uStack_8d0._4_4_ + auVar105._20_4_;
      auVar150._24_4_ = (float)uStack_8c8 + auVar105._24_4_;
      auVar150._28_4_ = uStack_8c8._4_4_ + auVar105._28_4_;
      auVar157 = vcmpps_avx(auVar150,auVar112,2);
      _local_620 = vandps_avx(auVar157,*pauVar85);
      auVar157 = *pauVar85 & auVar157;
      if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar157 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar157 >> 0x7f,0) != '\0') ||
            (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar157 >> 0xbf,0) != '\0') ||
          (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar157[0x1f] < '\0') break;
      pauVar85 = pauVar85 + -3;
      uVar83 = uVar83 + 1;
      if (uVar83 == 0) goto LAB_01050fea;
    }
    auVar113._8_4_ = 0x7f800000;
    auVar113._0_8_ = 0x7f8000007f800000;
    auVar113._12_4_ = 0x7f800000;
    auVar113._16_4_ = 0x7f800000;
    auVar113._20_4_ = 0x7f800000;
    auVar113._24_4_ = 0x7f800000;
    auVar113._28_4_ = 0x7f800000;
    auVar105 = vblendvps_avx(auVar113,auVar105,_local_620);
    auVar157 = vshufps_avx(auVar105,auVar105,0xb1);
    auVar157 = vminps_avx(auVar105,auVar157);
    auVar13 = vshufpd_avx(auVar157,auVar157,5);
    auVar157 = vminps_avx(auVar157,auVar13);
    auVar13 = vperm2f128_avx(auVar157,auVar157,1);
    auVar157 = vminps_avx(auVar157,auVar13);
    auVar157 = vcmpps_avx(auVar105,auVar157,0);
    auVar13 = _local_620 & auVar157;
    auVar105 = _local_620;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar105 = vandps_avx(auVar157,_local_620);
    }
    auVar98._8_8_ = 0;
    auVar98._0_8_ = *(ulong *)pauVar85[2];
    local_ca4 = *(uint *)(pauVar85[2] + 8);
    uVar87 = vmovmskps_avx(auVar105);
    uVar84 = 0;
    if (uVar87 != 0) {
      for (; (uVar87 >> uVar84 & 1) == 0; uVar84 = uVar84 + 1) {
      }
    }
    *(undefined4 *)(local_620 + (ulong)uVar84 * 4) = 0;
    *pauVar85 = _local_620;
    uVar87 = ~uVar83;
    if ((((((((_local_620 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_620 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_620 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_620 >> 0x7f,0) != '\0') ||
          (_local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_620 >> 0xbf,0) != '\0') ||
        (_local_620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_620[0x1f] < '\0') {
      uVar87 = -uVar83;
    }
    uVar89 = (ulong)uVar87;
    auVar97 = vshufps_avx(auVar98,auVar98,0);
    auVar169 = vshufps_avx(auVar98,auVar98,0x55);
    auVar169 = vsubps_avx(auVar169,auVar97);
    local_440._4_4_ = auVar97._4_4_ + auVar169._4_4_ * 0.14285715;
    local_440._0_4_ = auVar97._0_4_ + auVar169._0_4_ * 0.0;
    fStack_438 = auVar97._8_4_ + auVar169._8_4_ * 0.2857143;
    fStack_434 = auVar97._12_4_ + auVar169._12_4_ * 0.42857146;
    fStack_430 = auVar97._0_4_ + auVar169._0_4_ * 0.5714286;
    fStack_42c = auVar97._4_4_ + auVar169._4_4_ * 0.71428573;
    fStack_428 = auVar97._8_4_ + auVar169._8_4_ * 0.8571429;
    fStack_424 = auVar97._12_4_ + auVar169._12_4_;
    local_630._8_8_ = 0;
    local_630._0_8_ = *(ulong *)(local_440 + (ulong)uVar84 * 4);
  } while( true );
LAB_01050fea:
  if (bVar91 != false) {
    return bVar91;
  }
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar122._4_4_ = uVar2;
  auVar122._0_4_ = uVar2;
  auVar122._8_4_ = uVar2;
  auVar122._12_4_ = uVar2;
  auVar122._16_4_ = uVar2;
  auVar122._20_4_ = uVar2;
  auVar122._24_4_ = uVar2;
  auVar122._28_4_ = uVar2;
  auVar105 = vcmpps_avx(local_340,auVar122,2);
  uVar83 = vmovmskps_avx(auVar105);
  uVar83 = (uint)local_888 - 1 & (uint)local_888 & uVar83;
  if (uVar83 == 0) {
    return false;
  }
  goto LAB_0104e37c;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }